

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersectorK<8,8>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  uint uVar13;
  int iVar14;
  undefined4 uVar15;
  __int_type_conflict _Var16;
  long lVar17;
  RTCFilterFunctionN p_Var18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined8 uVar26;
  ulong uVar27;
  uint uVar28;
  long lVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  byte bVar93;
  byte bVar94;
  ulong uVar95;
  uint uVar96;
  ulong uVar97;
  long lVar98;
  long lVar99;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  Geometry *pGVar100;
  uint uVar101;
  byte bVar102;
  float fVar103;
  float fVar152;
  float fVar154;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar109 [16];
  float fVar153;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float fVar158;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  float fVar159;
  undefined4 uVar160;
  undefined8 uVar161;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  float fVar182;
  float fVar183;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar190;
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar191;
  float fVar192;
  float fVar199;
  float fVar200;
  float fVar201;
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  undefined8 local_770;
  undefined8 uStack_768;
  RTCFilterFunctionNArguments local_760;
  Geometry *local_730;
  undefined1 (*local_728) [32];
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  undefined1 local_6f0 [8];
  undefined8 uStack_6e8;
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined4 local_5a0;
  undefined4 uStack_59c;
  undefined8 uStack_598;
  LinearSpace3fa *local_590;
  Primitive *local_588;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined4 local_4a0;
  undefined4 uStack_49c;
  undefined4 uStack_498;
  undefined4 uStack_494;
  undefined4 uStack_490;
  undefined4 uStack_48c;
  undefined4 uStack_488;
  undefined4 uStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined4 local_400;
  int local_3fc;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  byte local_3b0;
  float local_3a0 [4];
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  int local_280;
  int iStack_27c;
  int iStack_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  int iStack_268;
  int iStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar12 = prim[1];
  uVar95 = (ulong)(byte)PVar12;
  lVar29 = uVar95 * 0x25;
  fVar192 = *(float *)(prim + lVar29 + 0x12);
  auVar104 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar104 = vinsertps_avx(auVar104,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar105 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar162 = vinsertps_avx(auVar105,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar107 = vsubps_avx(auVar104,*(undefined1 (*) [16])(prim + lVar29 + 6));
  fVar182 = fVar192 * auVar107._0_4_;
  fVar159 = fVar192 * auVar162._0_4_;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar95 * 4 + 6);
  auVar114 = vpmovsxbd_avx2(auVar104);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + uVar95 * 5 + 6);
  auVar113 = vpmovsxbd_avx2(auVar105);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar95 * 6 + 6);
  auVar125 = vpmovsxbd_avx2(auVar106);
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar95 * 0xf + 6);
  auVar124 = vpmovsxbd_avx2(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + 6);
  auVar118 = vpmovsxbd_avx2(auVar7);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar115 = vcvtdq2ps_avx(auVar118);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar95 + 6);
  auVar116 = vpmovsxbd_avx2(auVar8);
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar95 * 0x1a + 6);
  auVar123 = vpmovsxbd_avx2(auVar9);
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar95 * 0x1b + 6);
  auVar117 = vpmovsxbd_avx2(auVar10);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar95 * 0x1c + 6);
  auVar112 = vpmovsxbd_avx2(auVar11);
  auVar119 = vcvtdq2ps_avx(auVar112);
  auVar206._4_4_ = fVar159;
  auVar206._0_4_ = fVar159;
  auVar206._8_4_ = fVar159;
  auVar206._12_4_ = fVar159;
  auVar206._16_4_ = fVar159;
  auVar206._20_4_ = fVar159;
  auVar206._24_4_ = fVar159;
  auVar206._28_4_ = fVar159;
  auVar227._8_4_ = 1;
  auVar227._0_8_ = 0x100000001;
  auVar227._12_4_ = 1;
  auVar227._16_4_ = 1;
  auVar227._20_4_ = 1;
  auVar227._24_4_ = 1;
  auVar227._28_4_ = 1;
  auVar110 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar121 = ZEXT1632(CONCAT412(fVar192 * auVar162._12_4_,
                                CONCAT48(fVar192 * auVar162._8_4_,
                                         CONCAT44(fVar192 * auVar162._4_4_,fVar159))));
  auVar120 = vpermps_avx2(auVar227,auVar121);
  auVar111 = vpermps_avx512vl(auVar110,auVar121);
  fVar191 = auVar111._0_4_;
  fVar199 = auVar111._4_4_;
  auVar121._4_4_ = fVar199 * auVar125._4_4_;
  auVar121._0_4_ = fVar191 * auVar125._0_4_;
  fVar200 = auVar111._8_4_;
  auVar121._8_4_ = fVar200 * auVar125._8_4_;
  fVar201 = auVar111._12_4_;
  auVar121._12_4_ = fVar201 * auVar125._12_4_;
  fVar183 = auVar111._16_4_;
  auVar121._16_4_ = fVar183 * auVar125._16_4_;
  fVar190 = auVar111._20_4_;
  auVar121._20_4_ = fVar190 * auVar125._20_4_;
  fVar103 = auVar111._24_4_;
  auVar121._24_4_ = fVar103 * auVar125._24_4_;
  auVar121._28_4_ = auVar118._28_4_;
  auVar118._4_4_ = auVar116._4_4_ * fVar199;
  auVar118._0_4_ = auVar116._0_4_ * fVar191;
  auVar118._8_4_ = auVar116._8_4_ * fVar200;
  auVar118._12_4_ = auVar116._12_4_ * fVar201;
  auVar118._16_4_ = auVar116._16_4_ * fVar183;
  auVar118._20_4_ = auVar116._20_4_ * fVar190;
  auVar118._24_4_ = auVar116._24_4_ * fVar103;
  auVar118._28_4_ = auVar112._28_4_;
  auVar112._4_4_ = auVar119._4_4_ * fVar199;
  auVar112._0_4_ = auVar119._0_4_ * fVar191;
  auVar112._8_4_ = auVar119._8_4_ * fVar200;
  auVar112._12_4_ = auVar119._12_4_ * fVar201;
  auVar112._16_4_ = auVar119._16_4_ * fVar183;
  auVar112._20_4_ = auVar119._20_4_ * fVar190;
  auVar112._24_4_ = auVar119._24_4_ * fVar103;
  auVar112._28_4_ = auVar111._28_4_;
  auVar104 = vfmadd231ps_fma(auVar121,auVar120,auVar113);
  auVar105 = vfmadd231ps_fma(auVar118,auVar120,auVar115);
  auVar106 = vfmadd231ps_fma(auVar112,auVar117,auVar120);
  auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar206,auVar114);
  auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar206,auVar124);
  auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar123,auVar206);
  auVar224._4_4_ = fVar182;
  auVar224._0_4_ = fVar182;
  auVar224._8_4_ = fVar182;
  auVar224._12_4_ = fVar182;
  auVar224._16_4_ = fVar182;
  auVar224._20_4_ = fVar182;
  auVar224._24_4_ = fVar182;
  auVar224._28_4_ = fVar182;
  auVar112 = ZEXT1632(CONCAT412(fVar192 * auVar107._12_4_,
                                CONCAT48(fVar192 * auVar107._8_4_,
                                         CONCAT44(fVar192 * auVar107._4_4_,fVar182))));
  auVar118 = vpermps_avx2(auVar227,auVar112);
  auVar112 = vpermps_avx512vl(auVar110,auVar112);
  fVar192 = auVar112._0_4_;
  fVar191 = auVar112._4_4_;
  auVar120._4_4_ = fVar191 * auVar125._4_4_;
  auVar120._0_4_ = fVar192 * auVar125._0_4_;
  fVar199 = auVar112._8_4_;
  auVar120._8_4_ = fVar199 * auVar125._8_4_;
  fVar200 = auVar112._12_4_;
  auVar120._12_4_ = fVar200 * auVar125._12_4_;
  fVar201 = auVar112._16_4_;
  auVar120._16_4_ = fVar201 * auVar125._16_4_;
  fVar183 = auVar112._20_4_;
  auVar120._20_4_ = fVar183 * auVar125._20_4_;
  fVar190 = auVar112._24_4_;
  auVar120._24_4_ = fVar190 * auVar125._24_4_;
  auVar120._28_4_ = fVar159;
  auVar110._4_4_ = auVar116._4_4_ * fVar191;
  auVar110._0_4_ = auVar116._0_4_ * fVar192;
  auVar110._8_4_ = auVar116._8_4_ * fVar199;
  auVar110._12_4_ = auVar116._12_4_ * fVar200;
  auVar110._16_4_ = auVar116._16_4_ * fVar201;
  auVar110._20_4_ = auVar116._20_4_ * fVar183;
  auVar110._24_4_ = auVar116._24_4_ * fVar190;
  auVar110._28_4_ = auVar125._28_4_;
  auVar116._4_4_ = auVar119._4_4_ * fVar191;
  auVar116._0_4_ = auVar119._0_4_ * fVar192;
  auVar116._8_4_ = auVar119._8_4_ * fVar199;
  auVar116._12_4_ = auVar119._12_4_ * fVar200;
  auVar116._16_4_ = auVar119._16_4_ * fVar201;
  auVar116._20_4_ = auVar119._20_4_ * fVar183;
  auVar116._24_4_ = auVar119._24_4_ * fVar190;
  auVar116._28_4_ = auVar112._28_4_;
  auVar6 = vfmadd231ps_fma(auVar120,auVar118,auVar113);
  auVar7 = vfmadd231ps_fma(auVar110,auVar118,auVar115);
  auVar8 = vfmadd231ps_fma(auVar116,auVar118,auVar117);
  auVar162 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar224,auVar114);
  auVar107 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar224,auVar124);
  auVar216._8_4_ = 0x7fffffff;
  auVar216._0_8_ = 0x7fffffff7fffffff;
  auVar216._12_4_ = 0x7fffffff;
  auVar216._16_4_ = 0x7fffffff;
  auVar216._20_4_ = 0x7fffffff;
  auVar216._24_4_ = 0x7fffffff;
  auVar216._28_4_ = 0x7fffffff;
  auVar108 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar224,auVar123);
  auVar114 = vandps_avx(auVar216,ZEXT1632(auVar104));
  auVar212._8_4_ = 0x219392ef;
  auVar212._0_8_ = 0x219392ef219392ef;
  auVar212._12_4_ = 0x219392ef;
  auVar212._16_4_ = 0x219392ef;
  auVar212._20_4_ = 0x219392ef;
  auVar212._24_4_ = 0x219392ef;
  auVar212._28_4_ = 0x219392ef;
  uVar97 = vcmpps_avx512vl(auVar114,auVar212,1);
  bVar19 = (bool)((byte)uVar97 & 1);
  auVar111._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar104._0_4_;
  bVar19 = (bool)((byte)(uVar97 >> 1) & 1);
  auVar111._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar104._4_4_;
  bVar19 = (bool)((byte)(uVar97 >> 2) & 1);
  auVar111._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar104._8_4_;
  bVar19 = (bool)((byte)(uVar97 >> 3) & 1);
  auVar111._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar104._12_4_;
  auVar111._16_4_ = (uint)((byte)(uVar97 >> 4) & 1) * 0x219392ef;
  auVar111._20_4_ = (uint)((byte)(uVar97 >> 5) & 1) * 0x219392ef;
  auVar111._24_4_ = (uint)((byte)(uVar97 >> 6) & 1) * 0x219392ef;
  auVar111._28_4_ = (uint)(byte)(uVar97 >> 7) * 0x219392ef;
  auVar114 = vandps_avx(auVar216,ZEXT1632(auVar105));
  uVar97 = vcmpps_avx512vl(auVar114,auVar212,1);
  bVar19 = (bool)((byte)uVar97 & 1);
  auVar122._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar105._0_4_;
  bVar19 = (bool)((byte)(uVar97 >> 1) & 1);
  auVar122._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar105._4_4_;
  bVar19 = (bool)((byte)(uVar97 >> 2) & 1);
  auVar122._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar105._8_4_;
  bVar19 = (bool)((byte)(uVar97 >> 3) & 1);
  auVar122._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar105._12_4_;
  auVar122._16_4_ = (uint)((byte)(uVar97 >> 4) & 1) * 0x219392ef;
  auVar122._20_4_ = (uint)((byte)(uVar97 >> 5) & 1) * 0x219392ef;
  auVar122._24_4_ = (uint)((byte)(uVar97 >> 6) & 1) * 0x219392ef;
  auVar122._28_4_ = (uint)(byte)(uVar97 >> 7) * 0x219392ef;
  auVar114 = vandps_avx(auVar216,ZEXT1632(auVar106));
  uVar97 = vcmpps_avx512vl(auVar114,auVar212,1);
  bVar19 = (bool)((byte)uVar97 & 1);
  auVar114._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar106._0_4_;
  bVar19 = (bool)((byte)(uVar97 >> 1) & 1);
  auVar114._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar106._4_4_;
  bVar19 = (bool)((byte)(uVar97 >> 2) & 1);
  auVar114._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar106._8_4_;
  bVar19 = (bool)((byte)(uVar97 >> 3) & 1);
  auVar114._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar106._12_4_;
  auVar114._16_4_ = (uint)((byte)(uVar97 >> 4) & 1) * 0x219392ef;
  auVar114._20_4_ = (uint)((byte)(uVar97 >> 5) & 1) * 0x219392ef;
  auVar114._24_4_ = (uint)((byte)(uVar97 >> 6) & 1) * 0x219392ef;
  auVar114._28_4_ = (uint)(byte)(uVar97 >> 7) * 0x219392ef;
  auVar113 = vrcp14ps_avx512vl(auVar111);
  auVar213._8_4_ = 0x3f800000;
  auVar213._0_8_ = &DAT_3f8000003f800000;
  auVar213._12_4_ = 0x3f800000;
  auVar213._16_4_ = 0x3f800000;
  auVar213._20_4_ = 0x3f800000;
  auVar213._24_4_ = 0x3f800000;
  auVar213._28_4_ = 0x3f800000;
  auVar104 = vfnmadd213ps_fma(auVar111,auVar113,auVar213);
  auVar104 = vfmadd132ps_fma(ZEXT1632(auVar104),auVar113,auVar113);
  auVar113 = vrcp14ps_avx512vl(auVar122);
  auVar105 = vfnmadd213ps_fma(auVar122,auVar113,auVar213);
  auVar105 = vfmadd132ps_fma(ZEXT1632(auVar105),auVar113,auVar113);
  auVar113 = vrcp14ps_avx512vl(auVar114);
  auVar106 = vfnmadd213ps_fma(auVar114,auVar113,auVar213);
  auVar106 = vfmadd132ps_fma(ZEXT1632(auVar106),auVar113,auVar113);
  fVar192 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar29 + 0x16)) *
            *(float *)(prim + lVar29 + 0x1a);
  auVar209._4_4_ = fVar192;
  auVar209._0_4_ = fVar192;
  auVar209._8_4_ = fVar192;
  auVar209._12_4_ = fVar192;
  auVar209._16_4_ = fVar192;
  auVar209._20_4_ = fVar192;
  auVar209._24_4_ = fVar192;
  auVar209._28_4_ = fVar192;
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 * 7 + 6));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 * 0xb + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,auVar114);
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 * 9 + 6));
  auVar6 = vfmadd213ps_fma(auVar113,auVar209,auVar114);
  auVar114 = vcvtdq2ps_avx(auVar125);
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 * 0xd + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,auVar114);
  auVar7 = vfmadd213ps_fma(auVar113,auVar209,auVar114);
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 * 0x12 + 6));
  auVar114 = vcvtdq2ps_avx(auVar114);
  uVar97 = (ulong)(uint)((int)(uVar95 * 5) << 2);
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 * 2 + uVar97 + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,auVar114);
  auVar8 = vfmadd213ps_fma(auVar113,auVar209,auVar114);
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 + 6));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 * 0x18 + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,auVar114);
  auVar9 = vfmadd213ps_fma(auVar113,auVar209,auVar114);
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 * 0x1d + 6));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 + (ulong)(byte)PVar12 * 0x20 + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,auVar114);
  auVar10 = vfmadd213ps_fma(auVar113,auVar209,auVar114);
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar12 * 0x20 - uVar95) + 6)
                           );
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 * 0x23 + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,auVar114);
  auVar11 = vfmadd213ps_fma(auVar113,auVar209,auVar114);
  auVar114 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar162));
  auVar123._4_4_ = auVar104._4_4_ * auVar114._4_4_;
  auVar123._0_4_ = auVar104._0_4_ * auVar114._0_4_;
  auVar123._8_4_ = auVar104._8_4_ * auVar114._8_4_;
  auVar123._12_4_ = auVar104._12_4_ * auVar114._12_4_;
  auVar123._16_4_ = auVar114._16_4_ * 0.0;
  auVar123._20_4_ = auVar114._20_4_ * 0.0;
  auVar123._24_4_ = auVar114._24_4_ * 0.0;
  auVar123._28_4_ = auVar114._28_4_;
  auVar114 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar162));
  auVar181._0_4_ = auVar104._0_4_ * auVar114._0_4_;
  auVar181._4_4_ = auVar104._4_4_ * auVar114._4_4_;
  auVar181._8_4_ = auVar104._8_4_ * auVar114._8_4_;
  auVar181._12_4_ = auVar104._12_4_ * auVar114._12_4_;
  auVar181._16_4_ = auVar114._16_4_ * 0.0;
  auVar181._20_4_ = auVar114._20_4_ * 0.0;
  auVar181._24_4_ = auVar114._24_4_ * 0.0;
  auVar181._28_4_ = 0;
  auVar114 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar107));
  auVar117._4_4_ = auVar105._4_4_ * auVar114._4_4_;
  auVar117._0_4_ = auVar105._0_4_ * auVar114._0_4_;
  auVar117._8_4_ = auVar105._8_4_ * auVar114._8_4_;
  auVar117._12_4_ = auVar105._12_4_ * auVar114._12_4_;
  auVar117._16_4_ = auVar114._16_4_ * 0.0;
  auVar117._20_4_ = auVar114._20_4_ * 0.0;
  auVar117._24_4_ = auVar114._24_4_ * 0.0;
  auVar117._28_4_ = auVar114._28_4_;
  auVar114 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar107));
  auVar174._0_4_ = auVar105._0_4_ * auVar114._0_4_;
  auVar174._4_4_ = auVar105._4_4_ * auVar114._4_4_;
  auVar174._8_4_ = auVar105._8_4_ * auVar114._8_4_;
  auVar174._12_4_ = auVar105._12_4_ * auVar114._12_4_;
  auVar174._16_4_ = auVar114._16_4_ * 0.0;
  auVar174._20_4_ = auVar114._20_4_ * 0.0;
  auVar174._24_4_ = auVar114._24_4_ * 0.0;
  auVar174._28_4_ = 0;
  auVar114 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar108));
  auVar119._4_4_ = auVar106._4_4_ * auVar114._4_4_;
  auVar119._0_4_ = auVar106._0_4_ * auVar114._0_4_;
  auVar119._8_4_ = auVar106._8_4_ * auVar114._8_4_;
  auVar119._12_4_ = auVar106._12_4_ * auVar114._12_4_;
  auVar119._16_4_ = auVar114._16_4_ * 0.0;
  auVar119._20_4_ = auVar114._20_4_ * 0.0;
  auVar119._24_4_ = auVar114._24_4_ * 0.0;
  auVar119._28_4_ = auVar114._28_4_;
  auVar114 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar108));
  auVar137._0_4_ = auVar106._0_4_ * auVar114._0_4_;
  auVar137._4_4_ = auVar106._4_4_ * auVar114._4_4_;
  auVar137._8_4_ = auVar106._8_4_ * auVar114._8_4_;
  auVar137._12_4_ = auVar106._12_4_ * auVar114._12_4_;
  auVar137._16_4_ = auVar114._16_4_ * 0.0;
  auVar137._20_4_ = auVar114._20_4_ * 0.0;
  auVar137._24_4_ = auVar114._24_4_ * 0.0;
  auVar137._28_4_ = 0;
  auVar114 = vpminsd_avx2(auVar123,auVar181);
  auVar113 = vpminsd_avx2(auVar117,auVar174);
  auVar114 = vmaxps_avx(auVar114,auVar113);
  auVar113 = vpminsd_avx2(auVar119,auVar137);
  uVar160 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar125._4_4_ = uVar160;
  auVar125._0_4_ = uVar160;
  auVar125._8_4_ = uVar160;
  auVar125._12_4_ = uVar160;
  auVar125._16_4_ = uVar160;
  auVar125._20_4_ = uVar160;
  auVar125._24_4_ = uVar160;
  auVar125._28_4_ = uVar160;
  auVar113 = vmaxps_avx512vl(auVar113,auVar125);
  auVar114 = vmaxps_avx(auVar114,auVar113);
  auVar113._8_4_ = 0x3f7ffffa;
  auVar113._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar113._12_4_ = 0x3f7ffffa;
  auVar113._16_4_ = 0x3f7ffffa;
  auVar113._20_4_ = 0x3f7ffffa;
  auVar113._24_4_ = 0x3f7ffffa;
  auVar113._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar114,auVar113);
  auVar114 = vpmaxsd_avx2(auVar123,auVar181);
  auVar113 = vpmaxsd_avx2(auVar117,auVar174);
  auVar114 = vminps_avx(auVar114,auVar113);
  auVar113 = vpmaxsd_avx2(auVar119,auVar137);
  uVar160 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar124._4_4_ = uVar160;
  auVar124._0_4_ = uVar160;
  auVar124._8_4_ = uVar160;
  auVar124._12_4_ = uVar160;
  auVar124._16_4_ = uVar160;
  auVar124._20_4_ = uVar160;
  auVar124._24_4_ = uVar160;
  auVar124._28_4_ = uVar160;
  auVar113 = vminps_avx512vl(auVar113,auVar124);
  auVar114 = vminps_avx(auVar114,auVar113);
  auVar115._8_4_ = 0x3f800003;
  auVar115._0_8_ = 0x3f8000033f800003;
  auVar115._12_4_ = 0x3f800003;
  auVar115._16_4_ = 0x3f800003;
  auVar115._20_4_ = 0x3f800003;
  auVar115._24_4_ = 0x3f800003;
  auVar115._28_4_ = 0x3f800003;
  auVar114 = vmulps_avx512vl(auVar114,auVar115);
  auVar113 = vpbroadcastd_avx512vl();
  uVar26 = vpcmpgtd_avx512vl(auVar113,_DAT_0205a920);
  uVar161 = vcmpps_avx512vl(local_80,auVar114,2);
  if ((byte)((byte)uVar161 & (byte)uVar26) != 0) {
    uVar97 = (ulong)(byte)((byte)uVar161 & (byte)uVar26);
    local_590 = pre->ray_space + k;
    local_728 = (undefined1 (*) [32])&local_1a0;
    local_2a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_588 = prim;
    do {
      lVar29 = 0;
      for (uVar95 = uVar97; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x8000000000000000) {
        lVar29 = lVar29 + 1;
      }
      uVar101 = *(uint *)(local_588 + 2);
      uVar13 = *(uint *)(local_588 + lVar29 * 4 + 6);
      pGVar100 = (context->scene->geometries).items[uVar101].ptr;
      uVar95 = (ulong)*(uint *)(*(long *)&pGVar100->field_0x58 +
                               (ulong)uVar13 *
                               pGVar100[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar192 = (pGVar100->time_range).lower;
      fVar192 = pGVar100->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar192) /
                ((pGVar100->time_range).upper - fVar192));
      auVar104 = vroundss_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192),9);
      auVar104 = vminss_avx(auVar104,ZEXT416((uint)(pGVar100->fnumTimeSegments + -1.0)));
      auVar104 = vmaxss_avx(ZEXT816(0) << 0x20,auVar104);
      fVar192 = fVar192 - auVar104._0_4_;
      _Var16 = pGVar100[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar99 = (long)(int)auVar104._0_4_ * 0x38;
      lVar29 = *(long *)(_Var16 + 0x10 + lVar99);
      lVar98 = *(long *)(_Var16 + 0x38 + lVar99);
      lVar17 = *(long *)(_Var16 + 0x48 + lVar99);
      auVar107._4_4_ = fVar192;
      auVar107._0_4_ = fVar192;
      auVar107._8_4_ = fVar192;
      auVar107._12_4_ = fVar192;
      pfVar3 = (float *)(lVar98 + uVar95 * lVar17);
      auVar215._0_4_ = fVar192 * *pfVar3;
      auVar215._4_4_ = fVar192 * pfVar3[1];
      auVar215._8_4_ = fVar192 * pfVar3[2];
      auVar215._12_4_ = fVar192 * pfVar3[3];
      pfVar3 = (float *)(lVar98 + (uVar95 + 1) * lVar17);
      auVar218._0_4_ = fVar192 * *pfVar3;
      auVar218._4_4_ = fVar192 * pfVar3[1];
      auVar218._8_4_ = fVar192 * pfVar3[2];
      auVar218._12_4_ = fVar192 * pfVar3[3];
      auVar104 = vmulps_avx512vl(auVar107,*(undefined1 (*) [16])(lVar98 + (uVar95 + 2) * lVar17));
      auVar105 = vmulps_avx512vl(auVar107,*(undefined1 (*) [16])(lVar98 + lVar17 * (uVar95 + 3)));
      lVar98 = *(long *)(_Var16 + lVar99);
      fVar192 = 1.0 - fVar192;
      auVar162._4_4_ = fVar192;
      auVar162._0_4_ = fVar192;
      auVar162._8_4_ = fVar192;
      auVar162._12_4_ = fVar192;
      auVar6 = vfmadd231ps_fma(auVar215,auVar162,*(undefined1 (*) [16])(lVar98 + lVar29 * uVar95));
      local_6d0 = vfmadd231ps_fma(auVar218,auVar162,
                                  *(undefined1 (*) [16])(lVar98 + lVar29 * (uVar95 + 1)));
      local_6e0 = vfmadd231ps_avx512vl
                            (auVar104,auVar162,
                             *(undefined1 (*) [16])(lVar98 + lVar29 * (uVar95 + 2)));
      _local_6f0 = vfmadd231ps_avx512vl
                             (auVar105,auVar162,
                              *(undefined1 (*) [16])(lVar98 + lVar29 * (uVar95 + 3)));
      iVar14 = (int)pGVar100[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar104 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      lVar29 = (long)iVar14 * 0x44;
      auVar104 = vinsertps_avx(auVar104,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar106 = vsubps_avx(auVar6,auVar104);
      uVar160 = auVar106._0_4_;
      auVar175._4_4_ = uVar160;
      auVar175._0_4_ = uVar160;
      auVar175._8_4_ = uVar160;
      auVar175._12_4_ = uVar160;
      auVar105 = vshufps_avx(auVar106,auVar106,0x55);
      aVar4 = (local_590->vx).field_0;
      aVar5 = (local_590->vy).field_0;
      fVar192 = (local_590->vz).field_0.m128[0];
      fVar159 = *(float *)((long)&(local_590->vz).field_0 + 4);
      fVar191 = *(float *)((long)&(local_590->vz).field_0 + 8);
      fVar199 = *(float *)((long)&(local_590->vz).field_0 + 0xc);
      auVar106 = vshufps_avx(auVar106,auVar106,0xaa);
      auVar220._0_4_ = fVar192 * auVar106._0_4_;
      auVar220._4_4_ = fVar159 * auVar106._4_4_;
      auVar220._8_4_ = fVar191 * auVar106._8_4_;
      auVar220._12_4_ = fVar199 * auVar106._12_4_;
      auVar105 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar5,auVar105);
      auVar7 = vfmadd231ps_fma(auVar105,(undefined1  [16])aVar4,auVar175);
      auVar106 = vsubps_avx(local_6d0,auVar104);
      uVar160 = auVar106._0_4_;
      auVar109._4_4_ = uVar160;
      auVar109._0_4_ = uVar160;
      auVar109._8_4_ = uVar160;
      auVar109._12_4_ = uVar160;
      auVar105 = vshufps_avx(auVar106,auVar106,0x55);
      auVar106 = vshufps_avx(auVar106,auVar106,0xaa);
      auVar221._0_4_ = fVar192 * auVar106._0_4_;
      auVar221._4_4_ = fVar159 * auVar106._4_4_;
      auVar221._8_4_ = fVar191 * auVar106._8_4_;
      auVar221._12_4_ = fVar199 * auVar106._12_4_;
      auVar105 = vfmadd231ps_fma(auVar221,(undefined1  [16])aVar5,auVar105);
      auVar8 = vfmadd231ps_fma(auVar105,(undefined1  [16])aVar4,auVar109);
      auVar106 = vsubps_avx512vl(local_6e0,auVar104);
      uVar160 = auVar106._0_4_;
      auVar176._4_4_ = uVar160;
      auVar176._0_4_ = uVar160;
      auVar176._8_4_ = uVar160;
      auVar176._12_4_ = uVar160;
      auVar105 = vshufps_avx(auVar106,auVar106,0x55);
      auVar106 = vshufps_avx(auVar106,auVar106,0xaa);
      auVar222._0_4_ = fVar192 * auVar106._0_4_;
      auVar222._4_4_ = fVar159 * auVar106._4_4_;
      auVar222._8_4_ = fVar191 * auVar106._8_4_;
      auVar222._12_4_ = fVar199 * auVar106._12_4_;
      auVar105 = vfmadd231ps_fma(auVar222,(undefined1  [16])aVar5,auVar105);
      auVar106 = vfmadd231ps_fma(auVar105,(undefined1  [16])aVar4,auVar176);
      auVar105 = vsubps_avx512vl(_local_6f0,auVar104);
      uVar160 = auVar105._0_4_;
      auVar108._4_4_ = uVar160;
      auVar108._0_4_ = uVar160;
      auVar108._8_4_ = uVar160;
      auVar108._12_4_ = uVar160;
      auVar104 = vshufps_avx(auVar105,auVar105,0x55);
      auVar105 = vshufps_avx(auVar105,auVar105,0xaa);
      auVar226._0_4_ = fVar192 * auVar105._0_4_;
      auVar226._4_4_ = fVar159 * auVar105._4_4_;
      auVar226._8_4_ = fVar191 * auVar105._8_4_;
      auVar226._12_4_ = fVar199 * auVar105._12_4_;
      auVar104 = vfmadd231ps_fma(auVar226,(undefined1  [16])aVar5,auVar104);
      auVar9 = vfmadd231ps_fma(auVar104,(undefined1  [16])aVar4,auVar108);
      auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar29);
      uVar160 = auVar7._0_4_;
      local_500._4_4_ = uVar160;
      local_500._0_4_ = uVar160;
      local_500._8_4_ = uVar160;
      local_500._12_4_ = uVar160;
      local_500._16_4_ = uVar160;
      local_500._20_4_ = uVar160;
      local_500._24_4_ = uVar160;
      local_500._28_4_ = uVar160;
      auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar29 + 0x484);
      auVar167._8_4_ = 1;
      auVar167._0_8_ = 0x100000001;
      auVar167._12_4_ = 1;
      auVar167._16_4_ = 1;
      auVar167._20_4_ = 1;
      auVar167._24_4_ = 1;
      auVar167._28_4_ = 1;
      local_4e0 = vpermps_avx2(auVar167,ZEXT1632(auVar7));
      local_520 = vbroadcastss_avx512vl(auVar8);
      local_540 = vpermps_avx512vl(auVar167,ZEXT1632(auVar8));
      auVar125 = *(undefined1 (*) [32])(bezier_basis0 + lVar29 + 0x908);
      local_720 = vbroadcastss_avx512vl(auVar106);
      local_600 = vpermps_avx512vl(auVar167,ZEXT1632(auVar106));
      auVar124 = *(undefined1 (*) [32])(bezier_basis0 + lVar29 + 0xd8c);
      local_620 = vbroadcastss_avx512vl(auVar9);
      auVar237 = ZEXT3264(local_620);
      local_640 = vpermps_avx512vl(auVar167,ZEXT1632(auVar9));
      auVar238 = ZEXT3264(local_640);
      auVar115 = vmulps_avx512vl(local_620,auVar124);
      auVar116 = vmulps_avx512vl(local_640,auVar124);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar125,local_720);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar125,local_600);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar113,local_520);
      auVar117 = vfmadd231ps_avx512vl(auVar116,auVar113,local_540);
      auVar118 = vfmadd231ps_avx512vl(auVar115,auVar114,local_500);
      auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar29);
      auVar116 = *(undefined1 (*) [32])(bezier_basis1 + lVar29 + 0x484);
      auVar123 = *(undefined1 (*) [32])(bezier_basis1 + lVar29 + 0x908);
      auVar112 = vfmadd231ps_avx512vl(auVar117,auVar114,local_4e0);
      auVar117 = *(undefined1 (*) [32])(bezier_basis1 + lVar29 + 0xd8c);
      auVar119 = vmulps_avx512vl(local_620,auVar117);
      auVar120 = vmulps_avx512vl(local_640,auVar117);
      auVar119 = vfmadd231ps_avx512vl(auVar119,auVar123,local_720);
      auVar120 = vfmadd231ps_avx512vl(auVar120,auVar123,local_600);
      auVar119 = vfmadd231ps_avx512vl(auVar119,auVar116,local_520);
      auVar120 = vfmadd231ps_avx512vl(auVar120,auVar116,local_540);
      auVar10 = vfmadd231ps_fma(auVar119,auVar115,local_500);
      auVar11 = vfmadd231ps_fma(auVar120,auVar115,local_4e0);
      auVar120 = vsubps_avx512vl(ZEXT1632(auVar10),auVar118);
      auVar121 = vsubps_avx512vl(ZEXT1632(auVar11),auVar112);
      auVar119 = vmulps_avx512vl(auVar112,auVar120);
      auVar110 = vmulps_avx512vl(auVar118,auVar121);
      auVar119 = vsubps_avx512vl(auVar119,auVar110);
      auVar104 = vshufps_avx(auVar6,auVar6,0xff);
      uVar161 = auVar104._0_8_;
      local_a0._8_8_ = uVar161;
      local_a0._0_8_ = uVar161;
      local_a0._16_8_ = uVar161;
      local_a0._24_8_ = uVar161;
      auVar104 = vshufps_avx(local_6d0,local_6d0,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar104);
      auVar104 = vshufps_avx512vl(local_6e0,local_6e0,0xff);
      local_e0 = vbroadcastsd_avx512vl(auVar104);
      auVar104 = vshufps_avx512vl(_local_6f0,_local_6f0,0xff);
      uVar161 = auVar104._0_8_;
      register0x00001248 = uVar161;
      local_100 = uVar161;
      register0x00001250 = uVar161;
      register0x00001258 = uVar161;
      auVar110 = vmulps_avx512vl(_local_100,auVar124);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar125,local_e0);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar113,local_c0);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar114,local_a0);
      auVar111 = vmulps_avx512vl(_local_100,auVar117);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar123,local_e0);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar116,local_c0);
      auVar162 = vfmadd231ps_fma(auVar111,auVar115,local_a0);
      auVar111 = vmulps_avx512vl(auVar121,auVar121);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar120,auVar120);
      auVar122 = vmaxps_avx512vl(auVar110,ZEXT1632(auVar162));
      auVar122 = vmulps_avx512vl(auVar122,auVar122);
      auVar111 = vmulps_avx512vl(auVar122,auVar111);
      auVar119 = vmulps_avx512vl(auVar119,auVar119);
      uVar161 = vcmpps_avx512vl(auVar119,auVar111,2);
      auVar104 = vblendps_avx(auVar7,auVar6,8);
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar105 = vandps_avx512vl(auVar104,auVar107);
      auVar104 = vblendps_avx(auVar8,local_6d0,8);
      auVar104 = vandps_avx512vl(auVar104,auVar107);
      auVar105 = vmaxps_avx(auVar105,auVar104);
      auVar104 = vblendps_avx(auVar106,local_6e0,8);
      auVar108 = vandps_avx512vl(auVar104,auVar107);
      auVar104 = vblendps_avx(auVar9,_local_6f0,8);
      auVar104 = vandps_avx512vl(auVar104,auVar107);
      auVar104 = vmaxps_avx(auVar108,auVar104);
      auVar104 = vmaxps_avx(auVar105,auVar104);
      auVar105 = vmovshdup_avx(auVar104);
      auVar105 = vmaxss_avx(auVar105,auVar104);
      auVar104 = vshufpd_avx(auVar104,auVar104,1);
      auVar104 = vmaxss_avx(auVar104,auVar105);
      _local_480 = vcvtsi2ss_avx512f(local_6e0,iVar14);
      auVar217._0_4_ = local_480._0_4_;
      auVar217._4_4_ = auVar217._0_4_;
      auVar217._8_4_ = auVar217._0_4_;
      auVar217._12_4_ = auVar217._0_4_;
      auVar217._16_4_ = auVar217._0_4_;
      auVar217._20_4_ = auVar217._0_4_;
      auVar217._24_4_ = auVar217._0_4_;
      auVar217._28_4_ = auVar217._0_4_;
      uVar26 = vcmpps_avx512vl(auVar217,_DAT_02020f40,0xe);
      bVar102 = (byte)uVar161 & (byte)uVar26;
      fVar159 = auVar104._0_4_ * 4.7683716e-07;
      auVar188._8_4_ = 2;
      auVar188._0_8_ = 0x200000002;
      auVar188._12_4_ = 2;
      auVar188._16_4_ = 2;
      auVar188._20_4_ = 2;
      auVar188._24_4_ = 2;
      auVar188._28_4_ = 2;
      local_120 = vpermps_avx512vl(auVar188,ZEXT1632(auVar7));
      local_140 = vpermps_avx512vl(auVar188,ZEXT1632(auVar8));
      local_160 = vpermps_avx512vl(auVar188,ZEXT1632(auVar106));
      auVar119 = vpermps_avx2(auVar188,ZEXT1632(auVar9));
      fVar192 = *(float *)(ray + k * 4 + 0x60);
      auVar104 = auVar121._0_16_;
      _local_700 = ZEXT416((uint)fVar159);
      local_770 = auVar6._0_8_;
      uStack_768 = auVar6._8_8_;
      if (bVar102 == 0) {
        auVar104 = vxorps_avx512vl(auVar104,auVar104);
        auVar235 = ZEXT1664(auVar104);
        auVar232 = ZEXT3264(local_500);
        auVar233 = ZEXT3264(local_4e0);
        auVar234 = ZEXT3264(local_520);
        auVar230 = ZEXT3264(local_540);
        auVar239 = ZEXT3264(local_720);
        auVar236 = ZEXT3264(local_600);
      }
      else {
        fStack_57c = 0.0;
        fStack_578 = 0.0;
        fStack_574 = 0.0;
        auVar117 = vmulps_avx512vl(auVar119,auVar117);
        auVar123 = vfmadd213ps_avx512vl(auVar123,local_160,auVar117);
        auVar116 = vfmadd213ps_avx512vl(auVar116,local_140,auVar123);
        auVar116 = vfmadd213ps_avx512vl(auVar115,local_120,auVar116);
        auVar124 = vmulps_avx512vl(auVar119,auVar124);
        auVar125 = vfmadd213ps_avx512vl(auVar125,local_160,auVar124);
        auVar123 = vfmadd213ps_avx512vl(auVar113,local_140,auVar125);
        auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar29 + 0x1210);
        auVar125 = *(undefined1 (*) [32])(bezier_basis0 + lVar29 + 0x1694);
        auVar124 = *(undefined1 (*) [32])(bezier_basis0 + lVar29 + 0x1b18);
        auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar29 + 0x1f9c);
        auVar123 = vfmadd213ps_avx512vl(auVar114,local_120,auVar123);
        auVar114 = vmulps_avx512vl(local_620,auVar115);
        auVar117 = vmulps_avx512vl(local_640,auVar115);
        auVar223._0_4_ = auVar119._0_4_ * auVar115._0_4_;
        auVar223._4_4_ = auVar119._4_4_ * auVar115._4_4_;
        auVar223._8_4_ = auVar119._8_4_ * auVar115._8_4_;
        auVar223._12_4_ = auVar119._12_4_ * auVar115._12_4_;
        auVar223._16_4_ = auVar119._16_4_ * auVar115._16_4_;
        auVar223._20_4_ = auVar119._20_4_ * auVar115._20_4_;
        auVar223._24_4_ = auVar119._24_4_ * auVar115._24_4_;
        auVar223._28_4_ = 0;
        auVar239 = ZEXT3264(local_720);
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar124,local_720);
        auVar115 = vfmadd231ps_avx512vl(auVar117,auVar124,local_600);
        auVar124 = vfmadd231ps_avx512vl(auVar223,local_160,auVar124);
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar125,local_520);
        auVar115 = vfmadd231ps_avx512vl(auVar115,auVar125,local_540);
        auVar117 = vfmadd231ps_avx512vl(auVar124,local_140,auVar125);
        auVar111 = vfmadd231ps_avx512vl(auVar114,auVar113,local_500);
        auVar115 = vfmadd231ps_avx512vl(auVar115,auVar113,local_4e0);
        auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar29 + 0x1210);
        auVar125 = *(undefined1 (*) [32])(bezier_basis1 + lVar29 + 0x1b18);
        auVar124 = *(undefined1 (*) [32])(bezier_basis1 + lVar29 + 0x1f9c);
        auVar117 = vfmadd231ps_avx512vl(auVar117,local_120,auVar113);
        auVar113 = vmulps_avx512vl(local_620,auVar124);
        auVar122 = vmulps_avx512vl(local_640,auVar124);
        auVar41._4_4_ = auVar119._4_4_ * auVar124._4_4_;
        auVar41._0_4_ = auVar119._0_4_ * auVar124._0_4_;
        auVar41._8_4_ = auVar119._8_4_ * auVar124._8_4_;
        auVar41._12_4_ = auVar119._12_4_ * auVar124._12_4_;
        auVar41._16_4_ = auVar119._16_4_ * auVar124._16_4_;
        auVar41._20_4_ = auVar119._20_4_ * auVar124._20_4_;
        auVar41._24_4_ = auVar119._24_4_ * auVar124._24_4_;
        auVar41._28_4_ = auVar124._28_4_;
        auVar124 = vfmadd231ps_avx512vl(auVar113,auVar125,local_720);
        auVar122 = vfmadd231ps_avx512vl(auVar122,auVar125,local_600);
        auVar125 = vfmadd231ps_avx512vl(auVar41,local_160,auVar125);
        auVar113 = *(undefined1 (*) [32])(bezier_basis1 + lVar29 + 0x1694);
        auVar124 = vfmadd231ps_avx512vl(auVar124,auVar113,local_520);
        auVar122 = vfmadd231ps_avx512vl(auVar122,auVar113,local_540);
        auVar113 = vfmadd231ps_avx512vl(auVar125,local_140,auVar113);
        auVar125 = vfmadd231ps_avx512vl(auVar124,auVar114,local_500);
        auVar124 = vfmadd231ps_avx512vl(auVar122,auVar114,local_4e0);
        auVar122 = vfmadd231ps_avx512vl(auVar113,local_120,auVar114);
        auVar228._8_4_ = 0x7fffffff;
        auVar228._0_8_ = 0x7fffffff7fffffff;
        auVar228._12_4_ = 0x7fffffff;
        auVar228._16_4_ = 0x7fffffff;
        auVar228._20_4_ = 0x7fffffff;
        auVar228._24_4_ = 0x7fffffff;
        auVar228._28_4_ = 0x7fffffff;
        auVar114 = vandps_avx(auVar111,auVar228);
        auVar113 = vandps_avx(auVar115,auVar228);
        auVar113 = vmaxps_avx(auVar114,auVar113);
        auVar114 = vandps_avx(auVar117,auVar228);
        auVar114 = vmaxps_avx(auVar113,auVar114);
        auVar117 = vbroadcastss_avx512vl(_local_700);
        uVar95 = vcmpps_avx512vl(auVar114,auVar117,1);
        bVar19 = (bool)((byte)uVar95 & 1);
        auVar126._0_4_ = (float)((uint)bVar19 * auVar120._0_4_ | (uint)!bVar19 * auVar111._0_4_);
        bVar19 = (bool)((byte)(uVar95 >> 1) & 1);
        auVar126._4_4_ = (float)((uint)bVar19 * auVar120._4_4_ | (uint)!bVar19 * auVar111._4_4_);
        bVar19 = (bool)((byte)(uVar95 >> 2) & 1);
        auVar126._8_4_ = (float)((uint)bVar19 * auVar120._8_4_ | (uint)!bVar19 * auVar111._8_4_);
        bVar19 = (bool)((byte)(uVar95 >> 3) & 1);
        auVar126._12_4_ = (float)((uint)bVar19 * auVar120._12_4_ | (uint)!bVar19 * auVar111._12_4_);
        bVar19 = (bool)((byte)(uVar95 >> 4) & 1);
        auVar126._16_4_ = (float)((uint)bVar19 * auVar120._16_4_ | (uint)!bVar19 * auVar111._16_4_);
        bVar19 = (bool)((byte)(uVar95 >> 5) & 1);
        auVar126._20_4_ = (float)((uint)bVar19 * auVar120._20_4_ | (uint)!bVar19 * auVar111._20_4_);
        bVar19 = (bool)((byte)(uVar95 >> 6) & 1);
        auVar126._24_4_ = (float)((uint)bVar19 * auVar120._24_4_ | (uint)!bVar19 * auVar111._24_4_);
        bVar19 = SUB81(uVar95 >> 7,0);
        auVar126._28_4_ = (uint)bVar19 * auVar120._28_4_ | (uint)!bVar19 * auVar111._28_4_;
        bVar19 = (bool)((byte)uVar95 & 1);
        auVar127._0_4_ = (float)((uint)bVar19 * auVar121._0_4_ | (uint)!bVar19 * auVar115._0_4_);
        bVar19 = (bool)((byte)(uVar95 >> 1) & 1);
        auVar127._4_4_ = (float)((uint)bVar19 * auVar121._4_4_ | (uint)!bVar19 * auVar115._4_4_);
        bVar19 = (bool)((byte)(uVar95 >> 2) & 1);
        auVar127._8_4_ = (float)((uint)bVar19 * auVar121._8_4_ | (uint)!bVar19 * auVar115._8_4_);
        bVar19 = (bool)((byte)(uVar95 >> 3) & 1);
        auVar127._12_4_ = (float)((uint)bVar19 * auVar121._12_4_ | (uint)!bVar19 * auVar115._12_4_);
        bVar19 = (bool)((byte)(uVar95 >> 4) & 1);
        auVar127._16_4_ = (float)((uint)bVar19 * auVar121._16_4_ | (uint)!bVar19 * auVar115._16_4_);
        bVar19 = (bool)((byte)(uVar95 >> 5) & 1);
        auVar127._20_4_ = (float)((uint)bVar19 * auVar121._20_4_ | (uint)!bVar19 * auVar115._20_4_);
        bVar19 = (bool)((byte)(uVar95 >> 6) & 1);
        auVar127._24_4_ = (float)((uint)bVar19 * auVar121._24_4_ | (uint)!bVar19 * auVar115._24_4_);
        bVar19 = SUB81(uVar95 >> 7,0);
        auVar127._28_4_ = (uint)bVar19 * auVar121._28_4_ | (uint)!bVar19 * auVar115._28_4_;
        auVar114 = vandps_avx(auVar228,auVar125);
        auVar113 = vandps_avx(auVar124,auVar228);
        auVar113 = vmaxps_avx(auVar114,auVar113);
        auVar114 = vandps_avx(auVar122,auVar228);
        auVar114 = vmaxps_avx(auVar113,auVar114);
        uVar95 = vcmpps_avx512vl(auVar114,auVar117,1);
        bVar19 = (bool)((byte)uVar95 & 1);
        auVar128._0_4_ = (float)((uint)bVar19 * auVar120._0_4_ | (uint)!bVar19 * auVar125._0_4_);
        bVar19 = (bool)((byte)(uVar95 >> 1) & 1);
        auVar128._4_4_ = (float)((uint)bVar19 * auVar120._4_4_ | (uint)!bVar19 * auVar125._4_4_);
        bVar19 = (bool)((byte)(uVar95 >> 2) & 1);
        auVar128._8_4_ = (float)((uint)bVar19 * auVar120._8_4_ | (uint)!bVar19 * auVar125._8_4_);
        bVar19 = (bool)((byte)(uVar95 >> 3) & 1);
        auVar128._12_4_ = (float)((uint)bVar19 * auVar120._12_4_ | (uint)!bVar19 * auVar125._12_4_);
        bVar19 = (bool)((byte)(uVar95 >> 4) & 1);
        auVar128._16_4_ = (float)((uint)bVar19 * auVar120._16_4_ | (uint)!bVar19 * auVar125._16_4_);
        bVar19 = (bool)((byte)(uVar95 >> 5) & 1);
        auVar128._20_4_ = (float)((uint)bVar19 * auVar120._20_4_ | (uint)!bVar19 * auVar125._20_4_);
        bVar19 = (bool)((byte)(uVar95 >> 6) & 1);
        auVar128._24_4_ = (float)((uint)bVar19 * auVar120._24_4_ | (uint)!bVar19 * auVar125._24_4_);
        bVar19 = SUB81(uVar95 >> 7,0);
        auVar128._28_4_ = (uint)bVar19 * auVar120._28_4_ | (uint)!bVar19 * auVar125._28_4_;
        bVar19 = (bool)((byte)uVar95 & 1);
        auVar129._0_4_ = (float)((uint)bVar19 * auVar121._0_4_ | (uint)!bVar19 * auVar124._0_4_);
        bVar19 = (bool)((byte)(uVar95 >> 1) & 1);
        auVar129._4_4_ = (float)((uint)bVar19 * auVar121._4_4_ | (uint)!bVar19 * auVar124._4_4_);
        bVar19 = (bool)((byte)(uVar95 >> 2) & 1);
        auVar129._8_4_ = (float)((uint)bVar19 * auVar121._8_4_ | (uint)!bVar19 * auVar124._8_4_);
        bVar19 = (bool)((byte)(uVar95 >> 3) & 1);
        auVar129._12_4_ = (float)((uint)bVar19 * auVar121._12_4_ | (uint)!bVar19 * auVar124._12_4_);
        bVar19 = (bool)((byte)(uVar95 >> 4) & 1);
        auVar129._16_4_ = (float)((uint)bVar19 * auVar121._16_4_ | (uint)!bVar19 * auVar124._16_4_);
        bVar19 = (bool)((byte)(uVar95 >> 5) & 1);
        auVar129._20_4_ = (float)((uint)bVar19 * auVar121._20_4_ | (uint)!bVar19 * auVar124._20_4_);
        bVar19 = (bool)((byte)(uVar95 >> 6) & 1);
        auVar129._24_4_ = (float)((uint)bVar19 * auVar121._24_4_ | (uint)!bVar19 * auVar124._24_4_);
        bVar19 = SUB81(uVar95 >> 7,0);
        auVar129._28_4_ = (uint)bVar19 * auVar121._28_4_ | (uint)!bVar19 * auVar124._28_4_;
        auVar109 = vxorps_avx512vl(auVar104,auVar104);
        auVar235 = ZEXT1664(auVar109);
        auVar114 = vfmadd213ps_avx512vl(auVar126,auVar126,ZEXT1632(auVar109));
        auVar104 = vfmadd231ps_fma(auVar114,auVar127,auVar127);
        auVar114 = vrsqrt14ps_avx512vl(ZEXT1632(auVar104));
        fVar191 = auVar114._0_4_;
        fVar199 = auVar114._4_4_;
        fVar200 = auVar114._8_4_;
        fVar201 = auVar114._12_4_;
        fVar183 = auVar114._16_4_;
        fVar190 = auVar114._20_4_;
        fVar103 = auVar114._24_4_;
        auVar42._4_4_ = fVar199 * fVar199 * fVar199 * auVar104._4_4_ * -0.5;
        auVar42._0_4_ = fVar191 * fVar191 * fVar191 * auVar104._0_4_ * -0.5;
        auVar42._8_4_ = fVar200 * fVar200 * fVar200 * auVar104._8_4_ * -0.5;
        auVar42._12_4_ = fVar201 * fVar201 * fVar201 * auVar104._12_4_ * -0.5;
        auVar42._16_4_ = fVar183 * fVar183 * fVar183 * -0.0;
        auVar42._20_4_ = fVar190 * fVar190 * fVar190 * -0.0;
        auVar42._24_4_ = fVar103 * fVar103 * fVar103 * -0.0;
        auVar42._28_4_ = auVar122._28_4_;
        auVar113 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar114 = vfmadd231ps_avx512vl(auVar42,auVar113,auVar114);
        auVar43._4_4_ = auVar127._4_4_ * auVar114._4_4_;
        auVar43._0_4_ = auVar127._0_4_ * auVar114._0_4_;
        auVar43._8_4_ = auVar127._8_4_ * auVar114._8_4_;
        auVar43._12_4_ = auVar127._12_4_ * auVar114._12_4_;
        auVar43._16_4_ = auVar127._16_4_ * auVar114._16_4_;
        auVar43._20_4_ = auVar127._20_4_ * auVar114._20_4_;
        auVar43._24_4_ = auVar127._24_4_ * auVar114._24_4_;
        auVar43._28_4_ = 0;
        auVar44._4_4_ = auVar114._4_4_ * -auVar126._4_4_;
        auVar44._0_4_ = auVar114._0_4_ * -auVar126._0_4_;
        auVar44._8_4_ = auVar114._8_4_ * -auVar126._8_4_;
        auVar44._12_4_ = auVar114._12_4_ * -auVar126._12_4_;
        auVar44._16_4_ = auVar114._16_4_ * -auVar126._16_4_;
        auVar44._20_4_ = auVar114._20_4_ * -auVar126._20_4_;
        auVar44._24_4_ = auVar114._24_4_ * -auVar126._24_4_;
        auVar44._28_4_ = auVar127._28_4_;
        auVar114 = vmulps_avx512vl(auVar114,ZEXT1632(auVar109));
        auVar120 = ZEXT1632(auVar109);
        auVar125 = vfmadd213ps_avx512vl(auVar128,auVar128,auVar120);
        auVar104 = vfmadd231ps_fma(auVar125,auVar129,auVar129);
        auVar125 = vrsqrt14ps_avx512vl(ZEXT1632(auVar104));
        fVar191 = auVar125._0_4_;
        fVar199 = auVar125._4_4_;
        fVar200 = auVar125._8_4_;
        fVar201 = auVar125._12_4_;
        fVar183 = auVar125._16_4_;
        fVar190 = auVar125._20_4_;
        fVar103 = auVar125._24_4_;
        auVar45._4_4_ = fVar199 * fVar199 * fVar199 * auVar104._4_4_ * -0.5;
        auVar45._0_4_ = fVar191 * fVar191 * fVar191 * auVar104._0_4_ * -0.5;
        auVar45._8_4_ = fVar200 * fVar200 * fVar200 * auVar104._8_4_ * -0.5;
        auVar45._12_4_ = fVar201 * fVar201 * fVar201 * auVar104._12_4_ * -0.5;
        auVar45._16_4_ = fVar183 * fVar183 * fVar183 * -0.0;
        auVar45._20_4_ = fVar190 * fVar190 * fVar190 * -0.0;
        auVar45._24_4_ = fVar103 * fVar103 * fVar103 * -0.0;
        auVar45._28_4_ = 0;
        auVar113 = vfmadd231ps_avx512vl(auVar45,auVar113,auVar125);
        auVar46._4_4_ = auVar129._4_4_ * auVar113._4_4_;
        auVar46._0_4_ = auVar129._0_4_ * auVar113._0_4_;
        auVar46._8_4_ = auVar129._8_4_ * auVar113._8_4_;
        auVar46._12_4_ = auVar129._12_4_ * auVar113._12_4_;
        auVar46._16_4_ = auVar129._16_4_ * auVar113._16_4_;
        auVar46._20_4_ = auVar129._20_4_ * auVar113._20_4_;
        auVar46._24_4_ = auVar129._24_4_ * auVar113._24_4_;
        auVar46._28_4_ = auVar125._28_4_;
        auVar47._4_4_ = -auVar128._4_4_ * auVar113._4_4_;
        auVar47._0_4_ = -auVar128._0_4_ * auVar113._0_4_;
        auVar47._8_4_ = -auVar128._8_4_ * auVar113._8_4_;
        auVar47._12_4_ = -auVar128._12_4_ * auVar113._12_4_;
        auVar47._16_4_ = -auVar128._16_4_ * auVar113._16_4_;
        auVar47._20_4_ = -auVar128._20_4_ * auVar113._20_4_;
        auVar47._24_4_ = -auVar128._24_4_ * auVar113._24_4_;
        auVar47._28_4_ = auVar128._28_4_ ^ 0x80000000;
        auVar113 = vmulps_avx512vl(auVar113,auVar120);
        auVar104 = vfmadd213ps_fma(auVar43,auVar110,auVar118);
        auVar105 = vfmadd213ps_fma(auVar44,auVar110,auVar112);
        auVar125 = vfmadd213ps_avx512vl(auVar114,auVar110,auVar123);
        auVar124 = vfmadd213ps_avx512vl(auVar46,ZEXT1632(auVar162),ZEXT1632(auVar10));
        auVar107 = vfnmadd213ps_fma(auVar43,auVar110,auVar118);
        auVar117 = ZEXT1632(auVar162);
        auVar106 = vfmadd213ps_fma(auVar47,auVar117,ZEXT1632(auVar11));
        auVar108 = vfnmadd213ps_fma(auVar44,auVar110,auVar112);
        auVar7 = vfmadd213ps_fma(auVar113,auVar117,auVar116);
        auVar115 = vfnmadd231ps_avx512vl(auVar123,auVar110,auVar114);
        auVar10 = vfnmadd213ps_fma(auVar46,auVar117,ZEXT1632(auVar10));
        auVar11 = vfnmadd213ps_fma(auVar47,auVar117,ZEXT1632(auVar11));
        auVar175 = vfnmadd231ps_fma(auVar116,ZEXT1632(auVar162),auVar113);
        auVar113 = vsubps_avx512vl(auVar124,ZEXT1632(auVar107));
        auVar114 = vsubps_avx(ZEXT1632(auVar106),ZEXT1632(auVar108));
        auVar116 = vsubps_avx512vl(ZEXT1632(auVar7),auVar115);
        auVar123 = vmulps_avx512vl(auVar114,auVar115);
        auVar8 = vfmsub231ps_fma(auVar123,ZEXT1632(auVar108),auVar116);
        auVar48._4_4_ = auVar107._4_4_ * auVar116._4_4_;
        auVar48._0_4_ = auVar107._0_4_ * auVar116._0_4_;
        auVar48._8_4_ = auVar107._8_4_ * auVar116._8_4_;
        auVar48._12_4_ = auVar107._12_4_ * auVar116._12_4_;
        auVar48._16_4_ = auVar116._16_4_ * 0.0;
        auVar48._20_4_ = auVar116._20_4_ * 0.0;
        auVar48._24_4_ = auVar116._24_4_ * 0.0;
        auVar48._28_4_ = auVar116._28_4_;
        auVar116 = vfmsub231ps_avx512vl(auVar48,auVar115,auVar113);
        auVar49._4_4_ = auVar108._4_4_ * auVar113._4_4_;
        auVar49._0_4_ = auVar108._0_4_ * auVar113._0_4_;
        auVar49._8_4_ = auVar108._8_4_ * auVar113._8_4_;
        auVar49._12_4_ = auVar108._12_4_ * auVar113._12_4_;
        auVar49._16_4_ = auVar113._16_4_ * 0.0;
        auVar49._20_4_ = auVar113._20_4_ * 0.0;
        auVar49._24_4_ = auVar113._24_4_ * 0.0;
        auVar49._28_4_ = auVar113._28_4_;
        auVar9 = vfmsub231ps_fma(auVar49,ZEXT1632(auVar107),auVar114);
        auVar114 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar120,auVar116);
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar120,ZEXT1632(auVar8));
        auVar121 = ZEXT1632(auVar109);
        uVar95 = vcmpps_avx512vl(auVar114,auVar121,2);
        bVar94 = (byte)uVar95;
        fVar103 = (float)((uint)(bVar94 & 1) * auVar104._0_4_ |
                         (uint)!(bool)(bVar94 & 1) * auVar10._0_4_);
        bVar19 = (bool)((byte)(uVar95 >> 1) & 1);
        fVar152 = (float)((uint)bVar19 * auVar104._4_4_ | (uint)!bVar19 * auVar10._4_4_);
        bVar19 = (bool)((byte)(uVar95 >> 2) & 1);
        fVar154 = (float)((uint)bVar19 * auVar104._8_4_ | (uint)!bVar19 * auVar10._8_4_);
        bVar19 = (bool)((byte)(uVar95 >> 3) & 1);
        fVar156 = (float)((uint)bVar19 * auVar104._12_4_ | (uint)!bVar19 * auVar10._12_4_);
        auVar123 = ZEXT1632(CONCAT412(fVar156,CONCAT48(fVar154,CONCAT44(fVar152,fVar103))));
        fVar182 = (float)((uint)(bVar94 & 1) * auVar105._0_4_ |
                         (uint)!(bool)(bVar94 & 1) * auVar11._0_4_);
        bVar19 = (bool)((byte)(uVar95 >> 1) & 1);
        fVar153 = (float)((uint)bVar19 * auVar105._4_4_ | (uint)!bVar19 * auVar11._4_4_);
        bVar19 = (bool)((byte)(uVar95 >> 2) & 1);
        fVar155 = (float)((uint)bVar19 * auVar105._8_4_ | (uint)!bVar19 * auVar11._8_4_);
        bVar19 = (bool)((byte)(uVar95 >> 3) & 1);
        fVar157 = (float)((uint)bVar19 * auVar105._12_4_ | (uint)!bVar19 * auVar11._12_4_);
        auVar117 = ZEXT1632(CONCAT412(fVar157,CONCAT48(fVar155,CONCAT44(fVar153,fVar182))));
        auVar130._0_4_ =
             (float)((uint)(bVar94 & 1) * auVar125._0_4_ |
                    (uint)!(bool)(bVar94 & 1) * auVar175._0_4_);
        bVar19 = (bool)((byte)(uVar95 >> 1) & 1);
        auVar130._4_4_ = (float)((uint)bVar19 * auVar125._4_4_ | (uint)!bVar19 * auVar175._4_4_);
        bVar19 = (bool)((byte)(uVar95 >> 2) & 1);
        auVar130._8_4_ = (float)((uint)bVar19 * auVar125._8_4_ | (uint)!bVar19 * auVar175._8_4_);
        bVar19 = (bool)((byte)(uVar95 >> 3) & 1);
        auVar130._12_4_ = (float)((uint)bVar19 * auVar125._12_4_ | (uint)!bVar19 * auVar175._12_4_);
        fVar191 = (float)((uint)((byte)(uVar95 >> 4) & 1) * auVar125._16_4_);
        auVar130._16_4_ = fVar191;
        fVar199 = (float)((uint)((byte)(uVar95 >> 5) & 1) * auVar125._20_4_);
        auVar130._20_4_ = fVar199;
        fVar200 = (float)((uint)((byte)(uVar95 >> 6) & 1) * auVar125._24_4_);
        auVar130._24_4_ = fVar200;
        iVar1 = (uint)(byte)(uVar95 >> 7) * auVar125._28_4_;
        auVar130._28_4_ = iVar1;
        auVar113 = vblendmps_avx512vl(ZEXT1632(auVar107),auVar124);
        auVar131._0_4_ =
             (uint)(bVar94 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar94 & 1) * auVar8._0_4_;
        bVar19 = (bool)((byte)(uVar95 >> 1) & 1);
        auVar131._4_4_ = (uint)bVar19 * auVar113._4_4_ | (uint)!bVar19 * auVar8._4_4_;
        bVar19 = (bool)((byte)(uVar95 >> 2) & 1);
        auVar131._8_4_ = (uint)bVar19 * auVar113._8_4_ | (uint)!bVar19 * auVar8._8_4_;
        bVar19 = (bool)((byte)(uVar95 >> 3) & 1);
        auVar131._12_4_ = (uint)bVar19 * auVar113._12_4_ | (uint)!bVar19 * auVar8._12_4_;
        auVar131._16_4_ = (uint)((byte)(uVar95 >> 4) & 1) * auVar113._16_4_;
        auVar131._20_4_ = (uint)((byte)(uVar95 >> 5) & 1) * auVar113._20_4_;
        auVar131._24_4_ = (uint)((byte)(uVar95 >> 6) & 1) * auVar113._24_4_;
        auVar131._28_4_ = (uint)(byte)(uVar95 >> 7) * auVar113._28_4_;
        auVar113 = vblendmps_avx512vl(ZEXT1632(auVar108),ZEXT1632(auVar106));
        auVar132._0_4_ =
             (float)((uint)(bVar94 & 1) * auVar113._0_4_ |
                    (uint)!(bool)(bVar94 & 1) * auVar105._0_4_);
        bVar19 = (bool)((byte)(uVar95 >> 1) & 1);
        auVar132._4_4_ = (float)((uint)bVar19 * auVar113._4_4_ | (uint)!bVar19 * auVar105._4_4_);
        bVar19 = (bool)((byte)(uVar95 >> 2) & 1);
        auVar132._8_4_ = (float)((uint)bVar19 * auVar113._8_4_ | (uint)!bVar19 * auVar105._8_4_);
        bVar19 = (bool)((byte)(uVar95 >> 3) & 1);
        auVar132._12_4_ = (float)((uint)bVar19 * auVar113._12_4_ | (uint)!bVar19 * auVar105._12_4_);
        fVar201 = (float)((uint)((byte)(uVar95 >> 4) & 1) * auVar113._16_4_);
        auVar132._16_4_ = fVar201;
        fVar183 = (float)((uint)((byte)(uVar95 >> 5) & 1) * auVar113._20_4_);
        auVar132._20_4_ = fVar183;
        fVar190 = (float)((uint)((byte)(uVar95 >> 6) & 1) * auVar113._24_4_);
        auVar132._24_4_ = fVar190;
        auVar132._28_4_ = (uint)(byte)(uVar95 >> 7) * auVar113._28_4_;
        auVar113 = vblendmps_avx512vl(auVar115,ZEXT1632(auVar7));
        auVar133._0_4_ =
             (float)((uint)(bVar94 & 1) * auVar113._0_4_ |
                    (uint)!(bool)(bVar94 & 1) * auVar125._0_4_);
        bVar19 = (bool)((byte)(uVar95 >> 1) & 1);
        auVar133._4_4_ = (float)((uint)bVar19 * auVar113._4_4_ | (uint)!bVar19 * auVar125._4_4_);
        bVar19 = (bool)((byte)(uVar95 >> 2) & 1);
        auVar133._8_4_ = (float)((uint)bVar19 * auVar113._8_4_ | (uint)!bVar19 * auVar125._8_4_);
        bVar19 = (bool)((byte)(uVar95 >> 3) & 1);
        auVar133._12_4_ = (float)((uint)bVar19 * auVar113._12_4_ | (uint)!bVar19 * auVar125._12_4_);
        bVar19 = (bool)((byte)(uVar95 >> 4) & 1);
        auVar133._16_4_ = (float)((uint)bVar19 * auVar113._16_4_ | (uint)!bVar19 * auVar125._16_4_);
        bVar19 = (bool)((byte)(uVar95 >> 5) & 1);
        auVar133._20_4_ = (float)((uint)bVar19 * auVar113._20_4_ | (uint)!bVar19 * auVar125._20_4_);
        bVar19 = (bool)((byte)(uVar95 >> 6) & 1);
        auVar133._24_4_ = (float)((uint)bVar19 * auVar113._24_4_ | (uint)!bVar19 * auVar125._24_4_);
        bVar19 = SUB81(uVar95 >> 7,0);
        auVar133._28_4_ = (uint)bVar19 * auVar113._28_4_ | (uint)!bVar19 * auVar125._28_4_;
        auVar134._0_4_ =
             (uint)(bVar94 & 1) * (int)auVar107._0_4_ | (uint)!(bool)(bVar94 & 1) * auVar124._0_4_;
        bVar19 = (bool)((byte)(uVar95 >> 1) & 1);
        auVar134._4_4_ = (uint)bVar19 * (int)auVar107._4_4_ | (uint)!bVar19 * auVar124._4_4_;
        bVar19 = (bool)((byte)(uVar95 >> 2) & 1);
        auVar134._8_4_ = (uint)bVar19 * (int)auVar107._8_4_ | (uint)!bVar19 * auVar124._8_4_;
        bVar19 = (bool)((byte)(uVar95 >> 3) & 1);
        auVar134._12_4_ = (uint)bVar19 * (int)auVar107._12_4_ | (uint)!bVar19 * auVar124._12_4_;
        auVar134._16_4_ = (uint)!(bool)((byte)(uVar95 >> 4) & 1) * auVar124._16_4_;
        auVar134._20_4_ = (uint)!(bool)((byte)(uVar95 >> 5) & 1) * auVar124._20_4_;
        auVar134._24_4_ = (uint)!(bool)((byte)(uVar95 >> 6) & 1) * auVar124._24_4_;
        auVar134._28_4_ = (uint)!SUB81(uVar95 >> 7,0) * auVar124._28_4_;
        bVar19 = (bool)((byte)(uVar95 >> 1) & 1);
        bVar21 = (bool)((byte)(uVar95 >> 2) & 1);
        bVar22 = (bool)((byte)(uVar95 >> 3) & 1);
        auVar135._0_4_ =
             (uint)(bVar94 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar94 & 1) * auVar7._0_4_;
        bVar20 = (bool)((byte)(uVar95 >> 1) & 1);
        auVar135._4_4_ = (uint)bVar20 * auVar115._4_4_ | (uint)!bVar20 * auVar7._4_4_;
        bVar20 = (bool)((byte)(uVar95 >> 2) & 1);
        auVar135._8_4_ = (uint)bVar20 * auVar115._8_4_ | (uint)!bVar20 * auVar7._8_4_;
        bVar20 = (bool)((byte)(uVar95 >> 3) & 1);
        auVar135._12_4_ = (uint)bVar20 * auVar115._12_4_ | (uint)!bVar20 * auVar7._12_4_;
        auVar135._16_4_ = (uint)((byte)(uVar95 >> 4) & 1) * auVar115._16_4_;
        auVar135._20_4_ = (uint)((byte)(uVar95 >> 5) & 1) * auVar115._20_4_;
        auVar135._24_4_ = (uint)((byte)(uVar95 >> 6) & 1) * auVar115._24_4_;
        iVar2 = (uint)(byte)(uVar95 >> 7) * auVar115._28_4_;
        auVar135._28_4_ = iVar2;
        auVar118 = vsubps_avx512vl(auVar134,auVar123);
        auVar113 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar108._12_4_ |
                                                 (uint)!bVar22 * auVar106._12_4_,
                                                 CONCAT48((uint)bVar21 * (int)auVar108._8_4_ |
                                                          (uint)!bVar21 * auVar106._8_4_,
                                                          CONCAT44((uint)bVar19 *
                                                                   (int)auVar108._4_4_ |
                                                                   (uint)!bVar19 * auVar106._4_4_,
                                                                   (uint)(bVar94 & 1) *
                                                                   (int)auVar108._0_4_ |
                                                                   (uint)!(bool)(bVar94 & 1) *
                                                                   auVar106._0_4_)))),auVar117);
        auVar125 = vsubps_avx(auVar135,auVar130);
        auVar124 = vsubps_avx(auVar123,auVar131);
        auVar115 = vsubps_avx(auVar117,auVar132);
        auVar116 = vsubps_avx(auVar130,auVar133);
        auVar50._4_4_ = auVar125._4_4_ * fVar152;
        auVar50._0_4_ = auVar125._0_4_ * fVar103;
        auVar50._8_4_ = auVar125._8_4_ * fVar154;
        auVar50._12_4_ = auVar125._12_4_ * fVar156;
        auVar50._16_4_ = auVar125._16_4_ * 0.0;
        auVar50._20_4_ = auVar125._20_4_ * 0.0;
        auVar50._24_4_ = auVar125._24_4_ * 0.0;
        auVar50._28_4_ = iVar2;
        auVar104 = vfmsub231ps_fma(auVar50,auVar130,auVar118);
        auVar51._4_4_ = fVar153 * auVar118._4_4_;
        auVar51._0_4_ = fVar182 * auVar118._0_4_;
        auVar51._8_4_ = fVar155 * auVar118._8_4_;
        auVar51._12_4_ = fVar157 * auVar118._12_4_;
        auVar51._16_4_ = auVar118._16_4_ * 0.0;
        auVar51._20_4_ = auVar118._20_4_ * 0.0;
        auVar51._24_4_ = auVar118._24_4_ * 0.0;
        auVar51._28_4_ = auVar114._28_4_;
        auVar105 = vfmsub231ps_fma(auVar51,auVar123,auVar113);
        auVar114 = vfmadd231ps_avx512vl(ZEXT1632(auVar105),auVar121,ZEXT1632(auVar104));
        auVar193._0_4_ = auVar113._0_4_ * auVar130._0_4_;
        auVar193._4_4_ = auVar113._4_4_ * auVar130._4_4_;
        auVar193._8_4_ = auVar113._8_4_ * auVar130._8_4_;
        auVar193._12_4_ = auVar113._12_4_ * auVar130._12_4_;
        auVar193._16_4_ = auVar113._16_4_ * fVar191;
        auVar193._20_4_ = auVar113._20_4_ * fVar199;
        auVar193._24_4_ = auVar113._24_4_ * fVar200;
        auVar193._28_4_ = 0;
        auVar104 = vfmsub231ps_fma(auVar193,auVar117,auVar125);
        auVar112 = vfmadd231ps_avx512vl(auVar114,auVar121,ZEXT1632(auVar104));
        auVar114 = vmulps_avx512vl(auVar116,auVar131);
        auVar114 = vfmsub231ps_avx512vl(auVar114,auVar124,auVar133);
        auVar52._4_4_ = auVar115._4_4_ * auVar133._4_4_;
        auVar52._0_4_ = auVar115._0_4_ * auVar133._0_4_;
        auVar52._8_4_ = auVar115._8_4_ * auVar133._8_4_;
        auVar52._12_4_ = auVar115._12_4_ * auVar133._12_4_;
        auVar52._16_4_ = auVar115._16_4_ * auVar133._16_4_;
        auVar52._20_4_ = auVar115._20_4_ * auVar133._20_4_;
        auVar52._24_4_ = auVar115._24_4_ * auVar133._24_4_;
        auVar52._28_4_ = auVar133._28_4_;
        auVar104 = vfmsub231ps_fma(auVar52,auVar132,auVar116);
        auVar194._0_4_ = auVar132._0_4_ * auVar124._0_4_;
        auVar194._4_4_ = auVar132._4_4_ * auVar124._4_4_;
        auVar194._8_4_ = auVar132._8_4_ * auVar124._8_4_;
        auVar194._12_4_ = auVar132._12_4_ * auVar124._12_4_;
        auVar194._16_4_ = fVar201 * auVar124._16_4_;
        auVar194._20_4_ = fVar183 * auVar124._20_4_;
        auVar194._24_4_ = fVar190 * auVar124._24_4_;
        auVar194._28_4_ = 0;
        auVar105 = vfmsub231ps_fma(auVar194,auVar115,auVar131);
        auVar114 = vfmadd231ps_avx512vl(ZEXT1632(auVar105),auVar121,auVar114);
        auVar120 = vfmadd231ps_avx512vl(auVar114,auVar121,ZEXT1632(auVar104));
        auVar114 = vmaxps_avx(auVar112,auVar120);
        uVar161 = vcmpps_avx512vl(auVar114,auVar121,2);
        bVar102 = bVar102 & (byte)uVar161;
        auVar232 = ZEXT3264(local_500);
        auVar233 = ZEXT3264(local_4e0);
        auVar234 = ZEXT3264(local_520);
        auVar230 = ZEXT3264(local_540);
        auVar225 = ZEXT1664(_local_700);
        if (bVar102 == 0) {
          bVar102 = 0;
        }
        else {
          auVar53._4_4_ = auVar116._4_4_ * auVar113._4_4_;
          auVar53._0_4_ = auVar116._0_4_ * auVar113._0_4_;
          auVar53._8_4_ = auVar116._8_4_ * auVar113._8_4_;
          auVar53._12_4_ = auVar116._12_4_ * auVar113._12_4_;
          auVar53._16_4_ = auVar116._16_4_ * auVar113._16_4_;
          auVar53._20_4_ = auVar116._20_4_ * auVar113._20_4_;
          auVar53._24_4_ = auVar116._24_4_ * auVar113._24_4_;
          auVar53._28_4_ = auVar114._28_4_;
          auVar106 = vfmsub231ps_fma(auVar53,auVar115,auVar125);
          auVar54._4_4_ = auVar125._4_4_ * auVar124._4_4_;
          auVar54._0_4_ = auVar125._0_4_ * auVar124._0_4_;
          auVar54._8_4_ = auVar125._8_4_ * auVar124._8_4_;
          auVar54._12_4_ = auVar125._12_4_ * auVar124._12_4_;
          auVar54._16_4_ = auVar125._16_4_ * auVar124._16_4_;
          auVar54._20_4_ = auVar125._20_4_ * auVar124._20_4_;
          auVar54._24_4_ = auVar125._24_4_ * auVar124._24_4_;
          auVar54._28_4_ = auVar125._28_4_;
          auVar105 = vfmsub231ps_fma(auVar54,auVar118,auVar116);
          auVar55._4_4_ = auVar115._4_4_ * auVar118._4_4_;
          auVar55._0_4_ = auVar115._0_4_ * auVar118._0_4_;
          auVar55._8_4_ = auVar115._8_4_ * auVar118._8_4_;
          auVar55._12_4_ = auVar115._12_4_ * auVar118._12_4_;
          auVar55._16_4_ = auVar115._16_4_ * auVar118._16_4_;
          auVar55._20_4_ = auVar115._20_4_ * auVar118._20_4_;
          auVar55._24_4_ = auVar115._24_4_ * auVar118._24_4_;
          auVar55._28_4_ = auVar115._28_4_;
          auVar7 = vfmsub231ps_fma(auVar55,auVar124,auVar113);
          auVar104 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar105),ZEXT1632(auVar7));
          auVar114 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),ZEXT1632(auVar106),auVar121);
          auVar113 = vrcp14ps_avx512vl(auVar114);
          auVar30._8_4_ = 0x3f800000;
          auVar30._0_8_ = &DAT_3f8000003f800000;
          auVar30._12_4_ = 0x3f800000;
          auVar30._16_4_ = 0x3f800000;
          auVar30._20_4_ = 0x3f800000;
          auVar30._24_4_ = 0x3f800000;
          auVar30._28_4_ = 0x3f800000;
          auVar125 = vfnmadd213ps_avx512vl(auVar113,auVar114,auVar30);
          auVar104 = vfmadd132ps_fma(auVar125,auVar113,auVar113);
          auVar56._4_4_ = auVar7._4_4_ * auVar130._4_4_;
          auVar56._0_4_ = auVar7._0_4_ * auVar130._0_4_;
          auVar56._8_4_ = auVar7._8_4_ * auVar130._8_4_;
          auVar56._12_4_ = auVar7._12_4_ * auVar130._12_4_;
          auVar56._16_4_ = fVar191 * 0.0;
          auVar56._20_4_ = fVar199 * 0.0;
          auVar56._24_4_ = fVar200 * 0.0;
          auVar56._28_4_ = iVar1;
          auVar105 = vfmadd231ps_fma(auVar56,auVar117,ZEXT1632(auVar105));
          auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar123,ZEXT1632(auVar106));
          fVar191 = auVar104._0_4_;
          fVar199 = auVar104._4_4_;
          fVar200 = auVar104._8_4_;
          fVar201 = auVar104._12_4_;
          auVar113 = ZEXT1632(CONCAT412(auVar105._12_4_ * fVar201,
                                        CONCAT48(auVar105._8_4_ * fVar200,
                                                 CONCAT44(auVar105._4_4_ * fVar199,
                                                          auVar105._0_4_ * fVar191))));
          auVar214._4_4_ = fVar192;
          auVar214._0_4_ = fVar192;
          auVar214._8_4_ = fVar192;
          auVar214._12_4_ = fVar192;
          auVar214._16_4_ = fVar192;
          auVar214._20_4_ = fVar192;
          auVar214._24_4_ = fVar192;
          auVar214._28_4_ = fVar192;
          uVar161 = vcmpps_avx512vl(auVar214,auVar113,2);
          uVar160 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar31._4_4_ = uVar160;
          auVar31._0_4_ = uVar160;
          auVar31._8_4_ = uVar160;
          auVar31._12_4_ = uVar160;
          auVar31._16_4_ = uVar160;
          auVar31._20_4_ = uVar160;
          auVar31._24_4_ = uVar160;
          auVar31._28_4_ = uVar160;
          uVar26 = vcmpps_avx512vl(auVar113,auVar31,2);
          bVar102 = (byte)uVar161 & (byte)uVar26 & bVar102;
          if (bVar102 != 0) {
            uVar161 = vcmpps_avx512vl(auVar114,auVar121,4);
            if ((bVar102 & (byte)uVar161) != 0) {
              bVar102 = bVar102 & (byte)uVar161;
              fVar183 = auVar112._0_4_ * fVar191;
              fVar190 = auVar112._4_4_ * fVar199;
              auVar57._4_4_ = fVar190;
              auVar57._0_4_ = fVar183;
              fVar103 = auVar112._8_4_ * fVar200;
              auVar57._8_4_ = fVar103;
              fVar182 = auVar112._12_4_ * fVar201;
              auVar57._12_4_ = fVar182;
              fVar152 = auVar112._16_4_ * 0.0;
              auVar57._16_4_ = fVar152;
              fVar153 = auVar112._20_4_ * 0.0;
              auVar57._20_4_ = fVar153;
              fVar154 = auVar112._24_4_ * 0.0;
              auVar57._24_4_ = fVar154;
              auVar57._28_4_ = auVar112._28_4_;
              fVar191 = auVar120._0_4_ * fVar191;
              fVar199 = auVar120._4_4_ * fVar199;
              auVar58._4_4_ = fVar199;
              auVar58._0_4_ = fVar191;
              fVar200 = auVar120._8_4_ * fVar200;
              auVar58._8_4_ = fVar200;
              fVar201 = auVar120._12_4_ * fVar201;
              auVar58._12_4_ = fVar201;
              fVar155 = auVar120._16_4_ * 0.0;
              auVar58._16_4_ = fVar155;
              fVar156 = auVar120._20_4_ * 0.0;
              auVar58._20_4_ = fVar156;
              fVar157 = auVar120._24_4_ * 0.0;
              auVar58._24_4_ = fVar157;
              auVar58._28_4_ = auVar120._28_4_;
              auVar210._8_4_ = 0x3f800000;
              auVar210._0_8_ = &DAT_3f8000003f800000;
              auVar210._12_4_ = 0x3f800000;
              auVar210._16_4_ = 0x3f800000;
              auVar210._20_4_ = 0x3f800000;
              auVar210._24_4_ = 0x3f800000;
              auVar210._28_4_ = 0x3f800000;
              auVar114 = vsubps_avx(auVar210,auVar57);
              local_660._0_4_ =
                   (uint)(bVar94 & 1) * (int)fVar183 | (uint)!(bool)(bVar94 & 1) * auVar114._0_4_;
              bVar19 = (bool)((byte)(uVar95 >> 1) & 1);
              local_660._4_4_ = (uint)bVar19 * (int)fVar190 | (uint)!bVar19 * auVar114._4_4_;
              bVar19 = (bool)((byte)(uVar95 >> 2) & 1);
              local_660._8_4_ = (uint)bVar19 * (int)fVar103 | (uint)!bVar19 * auVar114._8_4_;
              bVar19 = (bool)((byte)(uVar95 >> 3) & 1);
              local_660._12_4_ = (uint)bVar19 * (int)fVar182 | (uint)!bVar19 * auVar114._12_4_;
              bVar19 = (bool)((byte)(uVar95 >> 4) & 1);
              local_660._16_4_ = (uint)bVar19 * (int)fVar152 | (uint)!bVar19 * auVar114._16_4_;
              bVar19 = (bool)((byte)(uVar95 >> 5) & 1);
              local_660._20_4_ = (uint)bVar19 * (int)fVar153 | (uint)!bVar19 * auVar114._20_4_;
              bVar19 = (bool)((byte)(uVar95 >> 6) & 1);
              local_660._24_4_ = (uint)bVar19 * (int)fVar154 | (uint)!bVar19 * auVar114._24_4_;
              bVar19 = SUB81(uVar95 >> 7,0);
              local_660._28_4_ = (uint)bVar19 * auVar112._28_4_ | (uint)!bVar19 * auVar114._28_4_;
              auVar114 = vsubps_avx(auVar210,auVar58);
              bVar19 = (bool)((byte)(uVar95 >> 1) & 1);
              bVar20 = (bool)((byte)(uVar95 >> 2) & 1);
              bVar21 = (bool)((byte)(uVar95 >> 3) & 1);
              bVar22 = (bool)((byte)(uVar95 >> 4) & 1);
              bVar23 = (bool)((byte)(uVar95 >> 5) & 1);
              bVar24 = (bool)((byte)(uVar95 >> 6) & 1);
              bVar25 = SUB81(uVar95 >> 7,0);
              local_2e0._4_4_ = (uint)bVar19 * (int)fVar199 | (uint)!bVar19 * auVar114._4_4_;
              local_2e0._0_4_ =
                   (uint)(bVar94 & 1) * (int)fVar191 | (uint)!(bool)(bVar94 & 1) * auVar114._0_4_;
              local_2e0._8_4_ = (uint)bVar20 * (int)fVar200 | (uint)!bVar20 * auVar114._8_4_;
              local_2e0._12_4_ = (uint)bVar21 * (int)fVar201 | (uint)!bVar21 * auVar114._12_4_;
              local_2e0._16_4_ = (uint)bVar22 * (int)fVar155 | (uint)!bVar22 * auVar114._16_4_;
              local_2e0._20_4_ = (uint)bVar23 * (int)fVar156 | (uint)!bVar23 * auVar114._20_4_;
              local_2e0._24_4_ = (uint)bVar24 * (int)fVar157 | (uint)!bVar24 * auVar114._24_4_;
              local_2e0._28_4_ = (uint)bVar25 * auVar120._28_4_ | (uint)!bVar25 * auVar114._28_4_;
              local_680 = auVar113;
              goto LAB_01e76f25;
            }
          }
          bVar102 = 0;
        }
LAB_01e76f25:
        auVar238 = ZEXT3264(local_640);
        auVar237 = ZEXT3264(local_620);
        auVar236 = ZEXT3264(local_600);
        auVar231 = ZEXT3264(auVar119);
        if (bVar102 != 0) {
          auVar114 = vsubps_avx(ZEXT1632(auVar162),auVar110);
          auVar104 = vfmadd213ps_fma(auVar114,local_660,auVar110);
          uVar160 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
          auVar32._4_4_ = uVar160;
          auVar32._0_4_ = uVar160;
          auVar32._8_4_ = uVar160;
          auVar32._12_4_ = uVar160;
          auVar32._16_4_ = uVar160;
          auVar32._20_4_ = uVar160;
          auVar32._24_4_ = uVar160;
          auVar32._28_4_ = uVar160;
          auVar114 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar104._12_4_ + auVar104._12_4_,
                                                        CONCAT48(auVar104._8_4_ + auVar104._8_4_,
                                                                 CONCAT44(auVar104._4_4_ +
                                                                          auVar104._4_4_,
                                                                          auVar104._0_4_ +
                                                                          auVar104._0_4_)))),auVar32
                                    );
          uVar161 = vcmpps_avx512vl(local_680,auVar114,6);
          bVar102 = bVar102 & (byte)uVar161;
          if (bVar102 != 0) {
            auVar168._8_4_ = 0xbf800000;
            auVar168._0_8_ = 0xbf800000bf800000;
            auVar168._12_4_ = 0xbf800000;
            auVar168._16_4_ = 0xbf800000;
            auVar168._20_4_ = 0xbf800000;
            auVar168._24_4_ = 0xbf800000;
            auVar168._28_4_ = 0xbf800000;
            auVar33._8_4_ = 0x40000000;
            auVar33._0_8_ = 0x4000000040000000;
            auVar33._12_4_ = 0x40000000;
            auVar33._16_4_ = 0x40000000;
            auVar33._20_4_ = 0x40000000;
            auVar33._24_4_ = 0x40000000;
            auVar33._28_4_ = 0x40000000;
            local_440 = vfmadd132ps_avx512vl(local_2e0,auVar168,auVar33);
            local_2e0 = local_440;
            auVar114 = local_2e0;
            local_400 = 0;
            local_3f0 = local_770;
            uStack_3e8 = uStack_768;
            local_3e0 = local_6d0._0_8_;
            uStack_3d8 = local_6d0._8_8_;
            local_3d0 = local_6e0._0_8_;
            uStack_3c8 = local_6e0._8_8_;
            local_3c0 = local_6f0;
            uStack_3b8 = uStack_6e8;
            local_2e0 = auVar114;
            if ((pGVar100->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              fVar191 = 1.0 / auVar217._0_4_;
              local_3a0[0] = fVar191 * (local_660._0_4_ + 0.0);
              local_3a0[1] = fVar191 * (local_660._4_4_ + 1.0);
              local_3a0[2] = fVar191 * (local_660._8_4_ + 2.0);
              local_3a0[3] = fVar191 * (local_660._12_4_ + 3.0);
              fStack_390 = fVar191 * (local_660._16_4_ + 4.0);
              fStack_38c = fVar191 * (local_660._20_4_ + 5.0);
              fStack_388 = fVar191 * (local_660._24_4_ + 6.0);
              fStack_384 = local_660._28_4_ + 7.0;
              local_2e0._0_8_ = local_440._0_8_;
              local_2e0._8_8_ = local_440._8_8_;
              local_2e0._16_8_ = local_440._16_8_;
              local_2e0._24_8_ = local_440._24_8_;
              local_380 = local_2e0._0_8_;
              uStack_378 = local_2e0._8_8_;
              uStack_370 = local_2e0._16_8_;
              uStack_368 = local_2e0._24_8_;
              local_360 = local_680;
              auVar169._8_4_ = 0x7f800000;
              auVar169._0_8_ = 0x7f8000007f800000;
              auVar169._12_4_ = 0x7f800000;
              auVar169._16_4_ = 0x7f800000;
              auVar169._20_4_ = 0x7f800000;
              auVar169._24_4_ = 0x7f800000;
              auVar169._28_4_ = 0x7f800000;
              auVar114 = vblendmps_avx512vl(auVar169,local_680);
              auVar136._0_4_ =
                   (uint)(bVar102 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar102 & 1) * 0x7f800000;
              bVar19 = (bool)(bVar102 >> 1 & 1);
              auVar136._4_4_ = (uint)bVar19 * auVar114._4_4_ | (uint)!bVar19 * 0x7f800000;
              bVar19 = (bool)(bVar102 >> 2 & 1);
              auVar136._8_4_ = (uint)bVar19 * auVar114._8_4_ | (uint)!bVar19 * 0x7f800000;
              bVar19 = (bool)(bVar102 >> 3 & 1);
              auVar136._12_4_ = (uint)bVar19 * auVar114._12_4_ | (uint)!bVar19 * 0x7f800000;
              bVar19 = (bool)(bVar102 >> 4 & 1);
              auVar136._16_4_ = (uint)bVar19 * auVar114._16_4_ | (uint)!bVar19 * 0x7f800000;
              bVar19 = (bool)(bVar102 >> 5 & 1);
              auVar136._20_4_ = (uint)bVar19 * auVar114._20_4_ | (uint)!bVar19 * 0x7f800000;
              bVar19 = (bool)(bVar102 >> 6 & 1);
              auVar136._24_4_ = (uint)bVar19 * auVar114._24_4_ | (uint)!bVar19 * 0x7f800000;
              auVar136._28_4_ =
                   (uint)(bVar102 >> 7) * auVar114._28_4_ | (uint)!(bool)(bVar102 >> 7) * 0x7f800000
              ;
              auVar114 = vshufps_avx(auVar136,auVar136,0xb1);
              auVar114 = vminps_avx(auVar136,auVar114);
              auVar113 = vshufpd_avx(auVar114,auVar114,5);
              auVar114 = vminps_avx(auVar114,auVar113);
              auVar113 = vpermpd_avx2(auVar114,0x4e);
              auVar114 = vminps_avx(auVar114,auVar113);
              uVar161 = vcmpps_avx512vl(auVar136,auVar114,0);
              bVar93 = (byte)uVar161 & bVar102;
              bVar94 = bVar102;
              if (bVar93 != 0) {
                bVar94 = bVar93;
              }
              uVar28 = 0;
              for (uVar96 = (uint)bVar94; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000) {
                uVar28 = uVar28 + 1;
              }
              uVar95 = (ulong)uVar28;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar100->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar191 = local_3a0[uVar95];
                uVar160 = *(undefined4 *)((long)&local_380 + uVar95 * 4);
                fVar200 = 1.0 - fVar191;
                fVar199 = fVar200 * fVar200 * -3.0;
                auVar104 = vfmadd231ss_fma(ZEXT416((uint)(fVar200 * fVar200)),
                                           ZEXT416((uint)(fVar191 * fVar200)),ZEXT416(0xc0000000));
                auVar105 = vfmsub132ss_fma(ZEXT416((uint)(fVar191 * fVar200)),
                                           ZEXT416((uint)(fVar191 * fVar191)),ZEXT416(0x40000000));
                fVar200 = auVar104._0_4_ * 3.0;
                fVar201 = auVar105._0_4_ * 3.0;
                fVar183 = fVar191 * fVar191 * 3.0;
                auVar202._0_4_ = fVar183 * (float)local_6f0._0_4_;
                auVar202._4_4_ = fVar183 * (float)local_6f0._4_4_;
                auVar202._8_4_ = fVar183 * (float)uStack_6e8;
                auVar202._12_4_ = fVar183 * uStack_6e8._4_4_;
                auVar177._4_4_ = fVar201;
                auVar177._0_4_ = fVar201;
                auVar177._8_4_ = fVar201;
                auVar177._12_4_ = fVar201;
                auVar104 = vfmadd132ps_fma(auVar177,auVar202,local_6e0);
                auVar184._4_4_ = fVar200;
                auVar184._0_4_ = fVar200;
                auVar184._8_4_ = fVar200;
                auVar184._12_4_ = fVar200;
                auVar104 = vfmadd132ps_fma(auVar184,auVar104,local_6d0);
                auVar178._4_4_ = fVar199;
                auVar178._0_4_ = fVar199;
                auVar178._8_4_ = fVar199;
                auVar178._12_4_ = fVar199;
                auVar104 = vfmadd132ps_fma(auVar178,auVar104,auVar6);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_360 + uVar95 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar104._0_4_;
                uVar15 = vextractps_avx(auVar104,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar15;
                uVar15 = vextractps_avx(auVar104,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar15;
                *(float *)(ray + k * 4 + 0x1e0) = fVar191;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar160;
                *(uint *)(ray + k * 4 + 0x220) = uVar13;
                *(uint *)(ray + k * 4 + 0x240) = uVar101;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                local_340 = vpbroadcastd_avx512vl();
                local_4c0 = vpbroadcastd_avx512vl();
                local_5a0 = local_6d0._0_4_;
                uStack_59c = local_6d0._4_4_;
                uStack_598 = local_6d0._8_8_;
                local_5b0 = local_6e0._0_8_;
                uStack_5a8 = local_6e0._8_8_;
                local_5c0 = (float)local_6f0._0_4_;
                fStack_5bc = (float)local_6f0._4_4_;
                fStack_5b8 = (float)uStack_6e8;
                fStack_5b4 = uStack_6e8._4_4_;
                local_580 = fVar192;
                local_560 = auVar119;
                local_460 = local_660;
                local_420 = local_680;
                local_3fc = iVar14;
                local_3b0 = bVar102;
                do {
                  auVar106 = auVar235._0_16_;
                  local_320._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                  local_220 = local_3a0[uVar95];
                  local_200 = *(undefined4 *)((long)&local_380 + uVar95 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_360 + uVar95 * 4);
                  local_760.context = context->user;
                  fVar191 = 1.0 - local_220;
                  fVar159 = fVar191 * fVar191 * -3.0;
                  auVar104 = vfmadd231ss_fma(ZEXT416((uint)(fVar191 * fVar191)),
                                             ZEXT416((uint)(local_220 * fVar191)),
                                             ZEXT416(0xc0000000));
                  auVar105 = vfmsub132ss_fma(ZEXT416((uint)(local_220 * fVar191)),
                                             ZEXT416((uint)(local_220 * local_220)),
                                             ZEXT416(0x40000000));
                  fVar191 = auVar104._0_4_ * 3.0;
                  fVar199 = auVar105._0_4_ * 3.0;
                  fVar200 = local_220 * local_220 * 3.0;
                  auVar205._0_4_ = fVar200 * local_5c0;
                  auVar205._4_4_ = fVar200 * fStack_5bc;
                  auVar205._8_4_ = fVar200 * fStack_5b8;
                  auVar205._12_4_ = fVar200 * fStack_5b4;
                  auVar165._4_4_ = fVar199;
                  auVar165._0_4_ = fVar199;
                  auVar165._8_4_ = fVar199;
                  auVar165._12_4_ = fVar199;
                  auVar89._8_8_ = uStack_5a8;
                  auVar89._0_8_ = local_5b0;
                  auVar104 = vfmadd132ps_fma(auVar165,auVar205,auVar89);
                  auVar187._4_4_ = fVar191;
                  auVar187._0_4_ = fVar191;
                  auVar187._8_4_ = fVar191;
                  auVar187._12_4_ = fVar191;
                  auVar90._4_4_ = uStack_59c;
                  auVar90._0_4_ = local_5a0;
                  auVar90._8_8_ = uStack_598;
                  auVar104 = vfmadd132ps_fma(auVar187,auVar104,auVar90);
                  auVar166._4_4_ = fVar159;
                  auVar166._0_4_ = fVar159;
                  auVar166._8_4_ = fVar159;
                  auVar166._12_4_ = fVar159;
                  auVar104 = vfmadd132ps_fma(auVar166,auVar104,auVar6);
                  local_280 = auVar104._0_4_;
                  auVar198._8_4_ = 1;
                  auVar198._0_8_ = 0x100000001;
                  auVar198._12_4_ = 1;
                  auVar198._16_4_ = 1;
                  auVar198._20_4_ = 1;
                  auVar198._24_4_ = 1;
                  auVar198._28_4_ = 1;
                  local_260 = vpermps_avx2(auVar198,ZEXT1632(auVar104));
                  auVar208._8_4_ = 2;
                  auVar208._0_8_ = 0x200000002;
                  auVar208._12_4_ = 2;
                  auVar208._16_4_ = 2;
                  auVar208._20_4_ = 2;
                  auVar208._24_4_ = 2;
                  auVar208._28_4_ = 2;
                  local_240 = vpermps_avx2(auVar208,ZEXT1632(auVar104));
                  iStack_27c = local_280;
                  iStack_278 = local_280;
                  iStack_274 = local_280;
                  iStack_270 = local_280;
                  iStack_26c = local_280;
                  iStack_268 = local_280;
                  iStack_264 = local_280;
                  fStack_21c = local_220;
                  fStack_218 = local_220;
                  fStack_214 = local_220;
                  fStack_210 = local_220;
                  fStack_20c = local_220;
                  fStack_208 = local_220;
                  fStack_204 = local_220;
                  uStack_1fc = local_200;
                  uStack_1f8 = local_200;
                  uStack_1f4 = local_200;
                  uStack_1f0 = local_200;
                  uStack_1ec = local_200;
                  uStack_1e8 = local_200;
                  uStack_1e4 = local_200;
                  local_1e0 = local_4c0._0_8_;
                  uStack_1d8 = local_4c0._8_8_;
                  uStack_1d0 = local_4c0._16_8_;
                  uStack_1c8 = local_4c0._24_8_;
                  local_1c0 = local_340;
                  auVar114 = vpcmpeqd_avx2(local_340,local_340);
                  local_728[1] = auVar114;
                  *local_728 = auVar114;
                  local_1a0 = (local_760.context)->instID[0];
                  uStack_19c = local_1a0;
                  uStack_198 = local_1a0;
                  uStack_194 = local_1a0;
                  uStack_190 = local_1a0;
                  uStack_18c = local_1a0;
                  uStack_188 = local_1a0;
                  uStack_184 = local_1a0;
                  local_180 = (local_760.context)->instPrimID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_5e0 = local_2a0._0_8_;
                  uStack_5d8 = local_2a0._8_8_;
                  uStack_5d0 = local_2a0._16_8_;
                  uStack_5c8 = local_2a0._24_8_;
                  local_760.valid = (int *)&local_5e0;
                  local_760.geometryUserPtr = pGVar100->userPtr;
                  local_760.hit = (RTCHitN *)&local_280;
                  local_760.N = 8;
                  local_4a0 = (undefined4)uVar95;
                  uStack_49c = (undefined4)(uVar95 >> 0x20);
                  local_760.ray = (RTCRayN *)ray;
                  if (pGVar100->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar100->intersectionFilterN)(&local_760);
                    uVar95 = CONCAT44(uStack_49c,local_4a0);
                    auVar225 = ZEXT1664(_local_700);
                    auVar231 = ZEXT3264(local_560);
                    auVar238 = ZEXT3264(local_640);
                    auVar237 = ZEXT3264(local_620);
                    auVar236 = ZEXT3264(local_600);
                    auVar239 = ZEXT3264(local_720);
                    auVar230 = ZEXT3264(local_540);
                    auVar234 = ZEXT3264(local_520);
                    auVar233 = ZEXT3264(local_4e0);
                    auVar232 = ZEXT3264(local_500);
                    auVar104 = vxorps_avx512vl(auVar106,auVar106);
                    auVar235 = ZEXT1664(auVar104);
                    fVar192 = local_580;
                  }
                  auVar104 = auVar235._0_16_;
                  auVar85._8_8_ = uStack_5d8;
                  auVar85._0_8_ = local_5e0;
                  auVar85._16_8_ = uStack_5d0;
                  auVar85._24_8_ = uStack_5c8;
                  if (auVar85 == (undefined1  [32])0x0) {
LAB_01e7857a:
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_320._0_4_;
                  }
                  else {
                    p_Var18 = context->args->filter;
                    if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar100->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var18)(&local_760);
                      uVar95 = CONCAT44(uStack_49c,local_4a0);
                      auVar225 = ZEXT1664(_local_700);
                      auVar231 = ZEXT3264(local_560);
                      auVar238 = ZEXT3264(local_640);
                      auVar237 = ZEXT3264(local_620);
                      auVar236 = ZEXT3264(local_600);
                      auVar239 = ZEXT3264(local_720);
                      auVar230 = ZEXT3264(local_540);
                      auVar234 = ZEXT3264(local_520);
                      auVar233 = ZEXT3264(local_4e0);
                      auVar232 = ZEXT3264(local_500);
                      auVar104 = vxorps_avx512vl(auVar104,auVar104);
                      auVar235 = ZEXT1664(auVar104);
                      fVar192 = local_580;
                    }
                    auVar86._8_8_ = uStack_5d8;
                    auVar86._0_8_ = local_5e0;
                    auVar86._16_8_ = uStack_5d0;
                    auVar86._24_8_ = uStack_5c8;
                    if (auVar86 == (undefined1  [32])0x0) goto LAB_01e7857a;
                    uVar27 = vptestmd_avx512vl(auVar86,auVar86);
                    iVar1 = *(int *)(local_760.hit + 4);
                    iVar2 = *(int *)(local_760.hit + 8);
                    iVar78 = *(int *)(local_760.hit + 0xc);
                    iVar79 = *(int *)(local_760.hit + 0x10);
                    iVar80 = *(int *)(local_760.hit + 0x14);
                    iVar81 = *(int *)(local_760.hit + 0x18);
                    iVar82 = *(int *)(local_760.hit + 0x1c);
                    bVar94 = (byte)uVar27;
                    bVar19 = (bool)((byte)(uVar27 >> 1) & 1);
                    bVar20 = (bool)((byte)(uVar27 >> 2) & 1);
                    bVar21 = (bool)((byte)(uVar27 >> 3) & 1);
                    bVar22 = (bool)((byte)(uVar27 >> 4) & 1);
                    bVar23 = (bool)((byte)(uVar27 >> 5) & 1);
                    bVar24 = (bool)((byte)(uVar27 >> 6) & 1);
                    bVar25 = SUB81(uVar27 >> 7,0);
                    *(uint *)(local_760.ray + 0x180) =
                         (uint)(bVar94 & 1) * *(int *)local_760.hit |
                         (uint)!(bool)(bVar94 & 1) * *(int *)(local_760.ray + 0x180);
                    *(uint *)(local_760.ray + 0x184) =
                         (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_760.ray + 0x184);
                    *(uint *)(local_760.ray + 0x188) =
                         (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_760.ray + 0x188);
                    *(uint *)(local_760.ray + 0x18c) =
                         (uint)bVar21 * iVar78 | (uint)!bVar21 * *(int *)(local_760.ray + 0x18c);
                    *(uint *)(local_760.ray + 400) =
                         (uint)bVar22 * iVar79 | (uint)!bVar22 * *(int *)(local_760.ray + 400);
                    *(uint *)(local_760.ray + 0x194) =
                         (uint)bVar23 * iVar80 | (uint)!bVar23 * *(int *)(local_760.ray + 0x194);
                    *(uint *)(local_760.ray + 0x198) =
                         (uint)bVar24 * iVar81 | (uint)!bVar24 * *(int *)(local_760.ray + 0x198);
                    *(uint *)(local_760.ray + 0x19c) =
                         (uint)bVar25 * iVar82 | (uint)!bVar25 * *(int *)(local_760.ray + 0x19c);
                    iVar1 = *(int *)(local_760.hit + 0x24);
                    iVar2 = *(int *)(local_760.hit + 0x28);
                    iVar78 = *(int *)(local_760.hit + 0x2c);
                    iVar79 = *(int *)(local_760.hit + 0x30);
                    iVar80 = *(int *)(local_760.hit + 0x34);
                    iVar81 = *(int *)(local_760.hit + 0x38);
                    iVar82 = *(int *)(local_760.hit + 0x3c);
                    bVar19 = (bool)((byte)(uVar27 >> 1) & 1);
                    bVar20 = (bool)((byte)(uVar27 >> 2) & 1);
                    bVar21 = (bool)((byte)(uVar27 >> 3) & 1);
                    bVar22 = (bool)((byte)(uVar27 >> 4) & 1);
                    bVar23 = (bool)((byte)(uVar27 >> 5) & 1);
                    bVar24 = (bool)((byte)(uVar27 >> 6) & 1);
                    bVar25 = SUB81(uVar27 >> 7,0);
                    *(uint *)(local_760.ray + 0x1a0) =
                         (uint)(bVar94 & 1) * *(int *)(local_760.hit + 0x20) |
                         (uint)!(bool)(bVar94 & 1) * *(int *)(local_760.ray + 0x1a0);
                    *(uint *)(local_760.ray + 0x1a4) =
                         (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_760.ray + 0x1a4);
                    *(uint *)(local_760.ray + 0x1a8) =
                         (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_760.ray + 0x1a8);
                    *(uint *)(local_760.ray + 0x1ac) =
                         (uint)bVar21 * iVar78 | (uint)!bVar21 * *(int *)(local_760.ray + 0x1ac);
                    *(uint *)(local_760.ray + 0x1b0) =
                         (uint)bVar22 * iVar79 | (uint)!bVar22 * *(int *)(local_760.ray + 0x1b0);
                    *(uint *)(local_760.ray + 0x1b4) =
                         (uint)bVar23 * iVar80 | (uint)!bVar23 * *(int *)(local_760.ray + 0x1b4);
                    *(uint *)(local_760.ray + 0x1b8) =
                         (uint)bVar24 * iVar81 | (uint)!bVar24 * *(int *)(local_760.ray + 0x1b8);
                    *(uint *)(local_760.ray + 0x1bc) =
                         (uint)bVar25 * iVar82 | (uint)!bVar25 * *(int *)(local_760.ray + 0x1bc);
                    iVar1 = *(int *)(local_760.hit + 0x44);
                    iVar2 = *(int *)(local_760.hit + 0x48);
                    iVar78 = *(int *)(local_760.hit + 0x4c);
                    iVar79 = *(int *)(local_760.hit + 0x50);
                    iVar80 = *(int *)(local_760.hit + 0x54);
                    iVar81 = *(int *)(local_760.hit + 0x58);
                    iVar82 = *(int *)(local_760.hit + 0x5c);
                    bVar19 = (bool)((byte)(uVar27 >> 1) & 1);
                    bVar20 = (bool)((byte)(uVar27 >> 2) & 1);
                    bVar21 = (bool)((byte)(uVar27 >> 3) & 1);
                    bVar22 = (bool)((byte)(uVar27 >> 4) & 1);
                    bVar23 = (bool)((byte)(uVar27 >> 5) & 1);
                    bVar24 = (bool)((byte)(uVar27 >> 6) & 1);
                    bVar25 = SUB81(uVar27 >> 7,0);
                    *(uint *)(local_760.ray + 0x1c0) =
                         (uint)(bVar94 & 1) * *(int *)(local_760.hit + 0x40) |
                         (uint)!(bool)(bVar94 & 1) * *(int *)(local_760.ray + 0x1c0);
                    *(uint *)(local_760.ray + 0x1c4) =
                         (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_760.ray + 0x1c4);
                    *(uint *)(local_760.ray + 0x1c8) =
                         (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_760.ray + 0x1c8);
                    *(uint *)(local_760.ray + 0x1cc) =
                         (uint)bVar21 * iVar78 | (uint)!bVar21 * *(int *)(local_760.ray + 0x1cc);
                    *(uint *)(local_760.ray + 0x1d0) =
                         (uint)bVar22 * iVar79 | (uint)!bVar22 * *(int *)(local_760.ray + 0x1d0);
                    *(uint *)(local_760.ray + 0x1d4) =
                         (uint)bVar23 * iVar80 | (uint)!bVar23 * *(int *)(local_760.ray + 0x1d4);
                    *(uint *)(local_760.ray + 0x1d8) =
                         (uint)bVar24 * iVar81 | (uint)!bVar24 * *(int *)(local_760.ray + 0x1d8);
                    *(uint *)(local_760.ray + 0x1dc) =
                         (uint)bVar25 * iVar82 | (uint)!bVar25 * *(int *)(local_760.ray + 0x1dc);
                    iVar1 = *(int *)(local_760.hit + 100);
                    iVar2 = *(int *)(local_760.hit + 0x68);
                    iVar78 = *(int *)(local_760.hit + 0x6c);
                    iVar79 = *(int *)(local_760.hit + 0x70);
                    iVar80 = *(int *)(local_760.hit + 0x74);
                    iVar81 = *(int *)(local_760.hit + 0x78);
                    iVar82 = *(int *)(local_760.hit + 0x7c);
                    bVar19 = (bool)((byte)(uVar27 >> 1) & 1);
                    bVar20 = (bool)((byte)(uVar27 >> 2) & 1);
                    bVar21 = (bool)((byte)(uVar27 >> 3) & 1);
                    bVar22 = (bool)((byte)(uVar27 >> 4) & 1);
                    bVar23 = (bool)((byte)(uVar27 >> 5) & 1);
                    bVar24 = (bool)((byte)(uVar27 >> 6) & 1);
                    bVar25 = SUB81(uVar27 >> 7,0);
                    *(uint *)(local_760.ray + 0x1e0) =
                         (uint)(bVar94 & 1) * *(int *)(local_760.hit + 0x60) |
                         (uint)!(bool)(bVar94 & 1) * *(int *)(local_760.ray + 0x1e0);
                    *(uint *)(local_760.ray + 0x1e4) =
                         (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_760.ray + 0x1e4);
                    *(uint *)(local_760.ray + 0x1e8) =
                         (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_760.ray + 0x1e8);
                    *(uint *)(local_760.ray + 0x1ec) =
                         (uint)bVar21 * iVar78 | (uint)!bVar21 * *(int *)(local_760.ray + 0x1ec);
                    *(uint *)(local_760.ray + 0x1f0) =
                         (uint)bVar22 * iVar79 | (uint)!bVar22 * *(int *)(local_760.ray + 0x1f0);
                    *(uint *)(local_760.ray + 500) =
                         (uint)bVar23 * iVar80 | (uint)!bVar23 * *(int *)(local_760.ray + 500);
                    *(uint *)(local_760.ray + 0x1f8) =
                         (uint)bVar24 * iVar81 | (uint)!bVar24 * *(int *)(local_760.ray + 0x1f8);
                    *(uint *)(local_760.ray + 0x1fc) =
                         (uint)bVar25 * iVar82 | (uint)!bVar25 * *(int *)(local_760.ray + 0x1fc);
                    auVar150._0_4_ =
                         (uint)(bVar94 & 1) * *(int *)(local_760.hit + 0x80) |
                         (uint)!(bool)(bVar94 & 1) * *(int *)(local_760.ray + 0x200);
                    bVar19 = (bool)((byte)(uVar27 >> 1) & 1);
                    auVar150._4_4_ =
                         (uint)bVar19 * *(int *)(local_760.hit + 0x84) |
                         (uint)!bVar19 * *(int *)(local_760.ray + 0x204);
                    bVar19 = (bool)((byte)(uVar27 >> 2) & 1);
                    auVar150._8_4_ =
                         (uint)bVar19 * *(int *)(local_760.hit + 0x88) |
                         (uint)!bVar19 * *(int *)(local_760.ray + 0x208);
                    bVar19 = (bool)((byte)(uVar27 >> 3) & 1);
                    auVar150._12_4_ =
                         (uint)bVar19 * *(int *)(local_760.hit + 0x8c) |
                         (uint)!bVar19 * *(int *)(local_760.ray + 0x20c);
                    bVar19 = (bool)((byte)(uVar27 >> 4) & 1);
                    auVar150._16_4_ =
                         (uint)bVar19 * *(int *)(local_760.hit + 0x90) |
                         (uint)!bVar19 * *(int *)(local_760.ray + 0x210);
                    bVar19 = (bool)((byte)(uVar27 >> 5) & 1);
                    auVar150._20_4_ =
                         (uint)bVar19 * *(int *)(local_760.hit + 0x94) |
                         (uint)!bVar19 * *(int *)(local_760.ray + 0x214);
                    bVar19 = (bool)((byte)(uVar27 >> 6) & 1);
                    auVar150._24_4_ =
                         (uint)bVar19 * *(int *)(local_760.hit + 0x98) |
                         (uint)!bVar19 * *(int *)(local_760.ray + 0x218);
                    bVar19 = SUB81(uVar27 >> 7,0);
                    auVar150._28_4_ =
                         (uint)bVar19 * *(int *)(local_760.hit + 0x9c) |
                         (uint)!bVar19 * *(int *)(local_760.ray + 0x21c);
                    *(undefined1 (*) [32])(local_760.ray + 0x200) = auVar150;
                    auVar114 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_760.hit + 0xa0));
                    *(undefined1 (*) [32])(local_760.ray + 0x220) = auVar114;
                    auVar114 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_760.hit + 0xc0));
                    *(undefined1 (*) [32])(local_760.ray + 0x240) = auVar114;
                    auVar114 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_760.hit + 0xe0));
                    *(undefined1 (*) [32])(local_760.ray + 0x260) = auVar114;
                    auVar114 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_760.hit + 0x100));
                    *(undefined1 (*) [32])(local_760.ray + 0x280) = auVar114;
                  }
                  auVar119 = auVar231._0_32_;
                  bVar94 = ~(byte)(1 << ((uint)uVar95 & 0x1f)) & bVar102;
                  uVar160 = *(undefined4 *)(ray + k * 4 + 0x100);
                  auVar40._4_4_ = uVar160;
                  auVar40._0_4_ = uVar160;
                  auVar40._8_4_ = uVar160;
                  auVar40._12_4_ = uVar160;
                  auVar40._16_4_ = uVar160;
                  auVar40._20_4_ = uVar160;
                  auVar40._24_4_ = uVar160;
                  auVar40._28_4_ = uVar160;
                  uVar161 = vcmpps_avx512vl(local_680,auVar40,2);
                  bVar102 = bVar94 & (byte)uVar161;
                  if ((bVar94 & (byte)uVar161) != 0) {
                    auVar173._8_4_ = 0x7f800000;
                    auVar173._0_8_ = 0x7f8000007f800000;
                    auVar173._12_4_ = 0x7f800000;
                    auVar173._16_4_ = 0x7f800000;
                    auVar173._20_4_ = 0x7f800000;
                    auVar173._24_4_ = 0x7f800000;
                    auVar173._28_4_ = 0x7f800000;
                    auVar114 = vblendmps_avx512vl(auVar173,local_680);
                    auVar151._0_4_ =
                         (uint)(bVar102 & 1) * auVar114._0_4_ |
                         (uint)!(bool)(bVar102 & 1) * 0x7f800000;
                    bVar19 = (bool)(bVar102 >> 1 & 1);
                    auVar151._4_4_ = (uint)bVar19 * auVar114._4_4_ | (uint)!bVar19 * 0x7f800000;
                    bVar19 = (bool)(bVar102 >> 2 & 1);
                    auVar151._8_4_ = (uint)bVar19 * auVar114._8_4_ | (uint)!bVar19 * 0x7f800000;
                    bVar19 = (bool)(bVar102 >> 3 & 1);
                    auVar151._12_4_ = (uint)bVar19 * auVar114._12_4_ | (uint)!bVar19 * 0x7f800000;
                    bVar19 = (bool)(bVar102 >> 4 & 1);
                    auVar151._16_4_ = (uint)bVar19 * auVar114._16_4_ | (uint)!bVar19 * 0x7f800000;
                    bVar19 = (bool)(bVar102 >> 5 & 1);
                    auVar151._20_4_ = (uint)bVar19 * auVar114._20_4_ | (uint)!bVar19 * 0x7f800000;
                    bVar19 = (bool)(bVar102 >> 6 & 1);
                    auVar151._24_4_ = (uint)bVar19 * auVar114._24_4_ | (uint)!bVar19 * 0x7f800000;
                    auVar151._28_4_ =
                         (uint)(bVar102 >> 7) * auVar114._28_4_ |
                         (uint)!(bool)(bVar102 >> 7) * 0x7f800000;
                    auVar114 = vshufps_avx(auVar151,auVar151,0xb1);
                    auVar114 = vminps_avx(auVar151,auVar114);
                    auVar113 = vshufpd_avx(auVar114,auVar114,5);
                    auVar114 = vminps_avx(auVar114,auVar113);
                    auVar113 = vpermpd_avx2(auVar114,0x4e);
                    auVar114 = vminps_avx(auVar114,auVar113);
                    uVar161 = vcmpps_avx512vl(auVar151,auVar114,0);
                    bVar93 = (byte)uVar161 & bVar102;
                    bVar94 = bVar102;
                    if (bVar93 != 0) {
                      bVar94 = bVar93;
                    }
                    uVar28 = 0;
                    for (uVar96 = (uint)bVar94; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000
                        ) {
                      uVar28 = uVar28 + 1;
                    }
                    uVar95 = (ulong)uVar28;
                  }
                  fVar159 = auVar225._0_4_;
                } while (bVar102 != 0);
              }
            }
          }
        }
      }
      local_580 = fVar159;
      if (8 < iVar14) {
        auVar114 = vpbroadcastd_avx512vl();
        auVar225 = ZEXT3264(auVar114);
        fStack_470 = 1.0 / (float)local_480._0_4_;
        local_480._4_4_ = fStack_470;
        local_480._0_4_ = fStack_470;
        fStack_478 = fStack_470;
        fStack_474 = fStack_470;
        local_320 = vpbroadcastd_avx512vl();
        local_340 = vpbroadcastd_avx512vl();
        lVar98 = 8;
        fStack_57c = local_580;
        fStack_578 = local_580;
        fStack_574 = local_580;
        fStack_570 = local_580;
        fStack_56c = local_580;
        fStack_568 = local_580;
        fStack_564 = local_580;
        local_560 = auVar119;
        local_4a0 = fVar192;
        uStack_49c = fVar192;
        uStack_498 = fVar192;
        uStack_494 = fVar192;
        uStack_490 = fVar192;
        uStack_48c = fVar192;
        uStack_488 = fVar192;
        uStack_484 = fVar192;
        fStack_46c = fStack_470;
        fStack_468 = fStack_470;
        fStack_464 = fStack_470;
        do {
          auVar114 = vpbroadcastd_avx512vl();
          auVar115 = vpor_avx2(auVar114,_DAT_0205a920);
          uVar26 = vpcmpgtd_avx512vl(auVar225._0_32_,auVar115);
          auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar98 * 4 + lVar29);
          auVar113 = *(undefined1 (*) [32])(lVar29 + 0x2227768 + lVar98 * 4);
          auVar125 = *(undefined1 (*) [32])(lVar29 + 0x2227bec + lVar98 * 4);
          auVar124 = *(undefined1 (*) [32])(lVar29 + 0x2228070 + lVar98 * 4);
          local_620 = auVar237._0_32_;
          auVar116 = vmulps_avx512vl(local_620,auVar124);
          local_640 = auVar238._0_32_;
          auVar123 = vmulps_avx512vl(local_640,auVar124);
          auVar59._4_4_ = auVar124._4_4_ * (float)local_100._4_4_;
          auVar59._0_4_ = auVar124._0_4_ * (float)local_100._0_4_;
          auVar59._8_4_ = auVar124._8_4_ * fStack_f8;
          auVar59._12_4_ = auVar124._12_4_ * fStack_f4;
          auVar59._16_4_ = auVar124._16_4_ * fStack_f0;
          auVar59._20_4_ = auVar124._20_4_ * fStack_ec;
          auVar59._24_4_ = auVar124._24_4_ * fStack_e8;
          auVar59._28_4_ = auVar115._28_4_;
          auVar209 = auVar239._0_32_;
          auVar115 = vfmadd231ps_avx512vl(auVar116,auVar125,auVar209);
          local_600 = auVar236._0_32_;
          auVar116 = vfmadd231ps_avx512vl(auVar123,auVar125,local_600);
          auVar123 = vfmadd231ps_avx512vl(auVar59,auVar125,local_e0);
          auVar206 = auVar234._0_32_;
          auVar115 = vfmadd231ps_avx512vl(auVar115,auVar113,auVar206);
          auVar174 = auVar230._0_32_;
          auVar116 = vfmadd231ps_avx512vl(auVar116,auVar113,auVar174);
          auVar104 = vfmadd231ps_fma(auVar123,auVar113,local_c0);
          auVar181 = auVar232._0_32_;
          auVar112 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar181);
          local_4e0 = auVar233._0_32_;
          auVar120 = vfmadd231ps_avx512vl(auVar116,auVar114,local_4e0);
          auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar98 * 4 + lVar29);
          auVar116 = *(undefined1 (*) [32])(lVar29 + 0x2229b88 + lVar98 * 4);
          auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar114,local_a0);
          auVar123 = *(undefined1 (*) [32])(lVar29 + 0x222a00c + lVar98 * 4);
          auVar117 = *(undefined1 (*) [32])(lVar29 + 0x222a490 + lVar98 * 4);
          auVar119 = vmulps_avx512vl(local_620,auVar117);
          auVar118 = vmulps_avx512vl(local_640,auVar117);
          auVar60._4_4_ = auVar117._4_4_ * (float)local_100._4_4_;
          auVar60._0_4_ = auVar117._0_4_ * (float)local_100._0_4_;
          auVar60._8_4_ = auVar117._8_4_ * fStack_f8;
          auVar60._12_4_ = auVar117._12_4_ * fStack_f4;
          auVar60._16_4_ = auVar117._16_4_ * fStack_f0;
          auVar60._20_4_ = auVar117._20_4_ * fStack_ec;
          auVar60._24_4_ = auVar117._24_4_ * fStack_e8;
          auVar60._28_4_ = uStack_e4;
          auVar119 = vfmadd231ps_avx512vl(auVar119,auVar123,auVar209);
          auVar118 = vfmadd231ps_avx512vl(auVar118,auVar123,local_600);
          auVar121 = vfmadd231ps_avx512vl(auVar60,auVar123,local_e0);
          auVar119 = vfmadd231ps_avx512vl(auVar119,auVar116,auVar206);
          auVar118 = vfmadd231ps_avx512vl(auVar118,auVar116,auVar174);
          auVar105 = vfmadd231ps_fma(auVar121,auVar116,local_c0);
          auVar121 = vfmadd231ps_avx512vl(auVar119,auVar115,auVar181);
          auVar110 = vfmadd231ps_avx512vl(auVar118,auVar115,local_4e0);
          auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar115,local_a0);
          auVar111 = vmaxps_avx512vl(ZEXT1632(auVar104),ZEXT1632(auVar105));
          auVar119 = vsubps_avx(auVar121,auVar112);
          auVar118 = vsubps_avx(auVar110,auVar120);
          auVar122 = vmulps_avx512vl(auVar120,auVar119);
          auVar137 = vmulps_avx512vl(auVar112,auVar118);
          auVar122 = vsubps_avx512vl(auVar122,auVar137);
          auVar137 = vmulps_avx512vl(auVar118,auVar118);
          auVar137 = vfmadd231ps_avx512vl(auVar137,auVar119,auVar119);
          auVar111 = vmulps_avx512vl(auVar111,auVar111);
          auVar111 = vmulps_avx512vl(auVar111,auVar137);
          auVar122 = vmulps_avx512vl(auVar122,auVar122);
          uVar161 = vcmpps_avx512vl(auVar122,auVar111,2);
          local_3b0 = (byte)uVar26 & (byte)uVar161;
          if (local_3b0 == 0) {
            auVar231 = ZEXT3264(auVar174);
            auVar239 = ZEXT3264(auVar209);
          }
          else {
            auVar117 = vmulps_avx512vl(local_560,auVar117);
            auVar123 = vfmadd213ps_avx512vl(auVar123,local_160,auVar117);
            auVar116 = vfmadd213ps_avx512vl(auVar116,local_140,auVar123);
            auVar115 = vfmadd213ps_avx512vl(auVar115,local_120,auVar116);
            auVar124 = vmulps_avx512vl(local_560,auVar124);
            auVar125 = vfmadd213ps_avx512vl(auVar125,local_160,auVar124);
            auVar113 = vfmadd213ps_avx512vl(auVar113,local_140,auVar125);
            auVar116 = vfmadd213ps_avx512vl(auVar114,local_120,auVar113);
            auVar114 = *(undefined1 (*) [32])(lVar29 + 0x22284f4 + lVar98 * 4);
            auVar113 = *(undefined1 (*) [32])(lVar29 + 0x2228978 + lVar98 * 4);
            auVar125 = *(undefined1 (*) [32])(lVar29 + 0x2228dfc + lVar98 * 4);
            auVar124 = *(undefined1 (*) [32])(lVar29 + 0x2229280 + lVar98 * 4);
            auVar123 = vmulps_avx512vl(local_620,auVar124);
            auVar117 = vmulps_avx512vl(local_640,auVar124);
            auVar124 = vmulps_avx512vl(local_560,auVar124);
            auVar123 = vfmadd231ps_avx512vl(auVar123,auVar125,auVar209);
            auVar117 = vfmadd231ps_avx512vl(auVar117,auVar125,local_600);
            auVar125 = vfmadd231ps_avx512vl(auVar124,local_160,auVar125);
            auVar124 = vfmadd231ps_avx512vl(auVar123,auVar113,auVar206);
            auVar123 = vfmadd231ps_avx512vl(auVar117,auVar113,auVar174);
            auVar113 = vfmadd231ps_avx512vl(auVar125,local_140,auVar113);
            auVar124 = vfmadd231ps_avx512vl(auVar124,auVar114,auVar181);
            auVar123 = vfmadd231ps_avx512vl(auVar123,auVar114,local_4e0);
            auVar117 = vfmadd231ps_avx512vl(auVar113,local_120,auVar114);
            auVar114 = *(undefined1 (*) [32])(lVar29 + 0x222a914 + lVar98 * 4);
            auVar113 = *(undefined1 (*) [32])(lVar29 + 0x222b21c + lVar98 * 4);
            auVar125 = *(undefined1 (*) [32])(lVar29 + 0x222b6a0 + lVar98 * 4);
            auVar111 = vmulps_avx512vl(local_620,auVar125);
            auVar122 = vmulps_avx512vl(local_640,auVar125);
            auVar125 = vmulps_avx512vl(local_560,auVar125);
            auVar111 = vfmadd231ps_avx512vl(auVar111,auVar113,auVar209);
            auVar122 = vfmadd231ps_avx512vl(auVar122,auVar113,local_600);
            auVar125 = vfmadd231ps_avx512vl(auVar125,local_160,auVar113);
            auVar113 = *(undefined1 (*) [32])(lVar29 + 0x222ad98 + lVar98 * 4);
            auVar111 = vfmadd231ps_avx512vl(auVar111,auVar113,auVar206);
            auVar122 = vfmadd231ps_avx512vl(auVar122,auVar113,auVar174);
            auVar113 = vfmadd231ps_avx512vl(auVar125,local_140,auVar113);
            auVar125 = vfmadd231ps_avx512vl(auVar111,auVar114,auVar181);
            auVar111 = vfmadd231ps_avx512vl(auVar122,auVar114,local_4e0);
            auVar113 = vfmadd231ps_avx512vl(auVar113,local_120,auVar114);
            auVar122 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar124,auVar122);
            vandps_avx512vl(auVar123,auVar122);
            auVar114 = vmaxps_avx(auVar122,auVar122);
            vandps_avx512vl(auVar117,auVar122);
            auVar114 = vmaxps_avx(auVar114,auVar122);
            auVar91._4_4_ = fStack_57c;
            auVar91._0_4_ = local_580;
            auVar91._8_4_ = fStack_578;
            auVar91._12_4_ = fStack_574;
            auVar91._16_4_ = fStack_570;
            auVar91._20_4_ = fStack_56c;
            auVar91._24_4_ = fStack_568;
            auVar91._28_4_ = fStack_564;
            uVar95 = vcmpps_avx512vl(auVar114,auVar91,1);
            bVar19 = (bool)((byte)uVar95 & 1);
            auVar138._0_4_ = (float)((uint)bVar19 * auVar119._0_4_ | (uint)!bVar19 * auVar124._0_4_)
            ;
            bVar19 = (bool)((byte)(uVar95 >> 1) & 1);
            auVar138._4_4_ = (float)((uint)bVar19 * auVar119._4_4_ | (uint)!bVar19 * auVar124._4_4_)
            ;
            bVar19 = (bool)((byte)(uVar95 >> 2) & 1);
            auVar138._8_4_ = (float)((uint)bVar19 * auVar119._8_4_ | (uint)!bVar19 * auVar124._8_4_)
            ;
            bVar19 = (bool)((byte)(uVar95 >> 3) & 1);
            auVar138._12_4_ =
                 (float)((uint)bVar19 * auVar119._12_4_ | (uint)!bVar19 * auVar124._12_4_);
            bVar19 = (bool)((byte)(uVar95 >> 4) & 1);
            auVar138._16_4_ =
                 (float)((uint)bVar19 * auVar119._16_4_ | (uint)!bVar19 * auVar124._16_4_);
            bVar19 = (bool)((byte)(uVar95 >> 5) & 1);
            auVar138._20_4_ =
                 (float)((uint)bVar19 * auVar119._20_4_ | (uint)!bVar19 * auVar124._20_4_);
            bVar19 = (bool)((byte)(uVar95 >> 6) & 1);
            auVar138._24_4_ =
                 (float)((uint)bVar19 * auVar119._24_4_ | (uint)!bVar19 * auVar124._24_4_);
            bVar19 = SUB81(uVar95 >> 7,0);
            auVar138._28_4_ = (uint)bVar19 * auVar119._28_4_ | (uint)!bVar19 * auVar124._28_4_;
            bVar19 = (bool)((byte)uVar95 & 1);
            auVar139._0_4_ = (float)((uint)bVar19 * auVar118._0_4_ | (uint)!bVar19 * auVar123._0_4_)
            ;
            bVar19 = (bool)((byte)(uVar95 >> 1) & 1);
            auVar139._4_4_ = (float)((uint)bVar19 * auVar118._4_4_ | (uint)!bVar19 * auVar123._4_4_)
            ;
            bVar19 = (bool)((byte)(uVar95 >> 2) & 1);
            auVar139._8_4_ = (float)((uint)bVar19 * auVar118._8_4_ | (uint)!bVar19 * auVar123._8_4_)
            ;
            bVar19 = (bool)((byte)(uVar95 >> 3) & 1);
            auVar139._12_4_ =
                 (float)((uint)bVar19 * auVar118._12_4_ | (uint)!bVar19 * auVar123._12_4_);
            bVar19 = (bool)((byte)(uVar95 >> 4) & 1);
            auVar139._16_4_ =
                 (float)((uint)bVar19 * auVar118._16_4_ | (uint)!bVar19 * auVar123._16_4_);
            bVar19 = (bool)((byte)(uVar95 >> 5) & 1);
            auVar139._20_4_ =
                 (float)((uint)bVar19 * auVar118._20_4_ | (uint)!bVar19 * auVar123._20_4_);
            bVar19 = (bool)((byte)(uVar95 >> 6) & 1);
            auVar139._24_4_ =
                 (float)((uint)bVar19 * auVar118._24_4_ | (uint)!bVar19 * auVar123._24_4_);
            bVar19 = SUB81(uVar95 >> 7,0);
            auVar139._28_4_ = (uint)bVar19 * auVar118._28_4_ | (uint)!bVar19 * auVar123._28_4_;
            vandps_avx512vl(auVar125,auVar122);
            vandps_avx512vl(auVar111,auVar122);
            auVar114 = vmaxps_avx(auVar139,auVar139);
            vandps_avx512vl(auVar113,auVar122);
            auVar114 = vmaxps_avx(auVar114,auVar139);
            uVar95 = vcmpps_avx512vl(auVar114,auVar91,1);
            bVar19 = (bool)((byte)uVar95 & 1);
            auVar140._0_4_ = (uint)bVar19 * auVar119._0_4_ | (uint)!bVar19 * auVar125._0_4_;
            bVar19 = (bool)((byte)(uVar95 >> 1) & 1);
            auVar140._4_4_ = (uint)bVar19 * auVar119._4_4_ | (uint)!bVar19 * auVar125._4_4_;
            bVar19 = (bool)((byte)(uVar95 >> 2) & 1);
            auVar140._8_4_ = (uint)bVar19 * auVar119._8_4_ | (uint)!bVar19 * auVar125._8_4_;
            bVar19 = (bool)((byte)(uVar95 >> 3) & 1);
            auVar140._12_4_ = (uint)bVar19 * auVar119._12_4_ | (uint)!bVar19 * auVar125._12_4_;
            bVar19 = (bool)((byte)(uVar95 >> 4) & 1);
            auVar140._16_4_ = (uint)bVar19 * auVar119._16_4_ | (uint)!bVar19 * auVar125._16_4_;
            bVar19 = (bool)((byte)(uVar95 >> 5) & 1);
            auVar140._20_4_ = (uint)bVar19 * auVar119._20_4_ | (uint)!bVar19 * auVar125._20_4_;
            bVar19 = (bool)((byte)(uVar95 >> 6) & 1);
            auVar140._24_4_ = (uint)bVar19 * auVar119._24_4_ | (uint)!bVar19 * auVar125._24_4_;
            bVar19 = SUB81(uVar95 >> 7,0);
            auVar140._28_4_ = (uint)bVar19 * auVar119._28_4_ | (uint)!bVar19 * auVar125._28_4_;
            bVar19 = (bool)((byte)uVar95 & 1);
            auVar141._0_4_ = (float)((uint)bVar19 * auVar118._0_4_ | (uint)!bVar19 * auVar111._0_4_)
            ;
            bVar19 = (bool)((byte)(uVar95 >> 1) & 1);
            auVar141._4_4_ = (float)((uint)bVar19 * auVar118._4_4_ | (uint)!bVar19 * auVar111._4_4_)
            ;
            bVar19 = (bool)((byte)(uVar95 >> 2) & 1);
            auVar141._8_4_ = (float)((uint)bVar19 * auVar118._8_4_ | (uint)!bVar19 * auVar111._8_4_)
            ;
            bVar19 = (bool)((byte)(uVar95 >> 3) & 1);
            auVar141._12_4_ =
                 (float)((uint)bVar19 * auVar118._12_4_ | (uint)!bVar19 * auVar111._12_4_);
            bVar19 = (bool)((byte)(uVar95 >> 4) & 1);
            auVar141._16_4_ =
                 (float)((uint)bVar19 * auVar118._16_4_ | (uint)!bVar19 * auVar111._16_4_);
            bVar19 = (bool)((byte)(uVar95 >> 5) & 1);
            auVar141._20_4_ =
                 (float)((uint)bVar19 * auVar118._20_4_ | (uint)!bVar19 * auVar111._20_4_);
            bVar19 = (bool)((byte)(uVar95 >> 6) & 1);
            auVar141._24_4_ =
                 (float)((uint)bVar19 * auVar118._24_4_ | (uint)!bVar19 * auVar111._24_4_);
            bVar19 = SUB81(uVar95 >> 7,0);
            auVar141._28_4_ = (uint)bVar19 * auVar118._28_4_ | (uint)!bVar19 * auVar111._28_4_;
            auVar219._8_4_ = 0x80000000;
            auVar219._0_8_ = 0x8000000080000000;
            auVar219._12_4_ = 0x80000000;
            auVar219._16_4_ = 0x80000000;
            auVar219._20_4_ = 0x80000000;
            auVar219._24_4_ = 0x80000000;
            auVar219._28_4_ = 0x80000000;
            auVar114 = vxorps_avx512vl(auVar140,auVar219);
            auVar111 = auVar235._0_32_;
            auVar113 = vfmadd213ps_avx512vl(auVar138,auVar138,auVar111);
            auVar106 = vfmadd231ps_fma(auVar113,auVar139,auVar139);
            auVar113 = vrsqrt14ps_avx512vl(ZEXT1632(auVar106));
            auVar229._8_4_ = 0xbf000000;
            auVar229._0_8_ = 0xbf000000bf000000;
            auVar229._12_4_ = 0xbf000000;
            auVar229._16_4_ = 0xbf000000;
            auVar229._20_4_ = 0xbf000000;
            auVar229._24_4_ = 0xbf000000;
            auVar229._28_4_ = 0xbf000000;
            fVar192 = auVar113._0_4_;
            fVar159 = auVar113._4_4_;
            fVar191 = auVar113._8_4_;
            fVar199 = auVar113._12_4_;
            fVar200 = auVar113._16_4_;
            fVar201 = auVar113._20_4_;
            fVar183 = auVar113._24_4_;
            auVar61._4_4_ = fVar159 * fVar159 * fVar159 * auVar106._4_4_ * -0.5;
            auVar61._0_4_ = fVar192 * fVar192 * fVar192 * auVar106._0_4_ * -0.5;
            auVar61._8_4_ = fVar191 * fVar191 * fVar191 * auVar106._8_4_ * -0.5;
            auVar61._12_4_ = fVar199 * fVar199 * fVar199 * auVar106._12_4_ * -0.5;
            auVar61._16_4_ = fVar200 * fVar200 * fVar200 * -0.0;
            auVar61._20_4_ = fVar201 * fVar201 * fVar201 * -0.0;
            auVar61._24_4_ = fVar183 * fVar183 * fVar183 * -0.0;
            auVar61._28_4_ = auVar139._28_4_;
            auVar125 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar113 = vfmadd231ps_avx512vl(auVar61,auVar125,auVar113);
            auVar62._4_4_ = auVar139._4_4_ * auVar113._4_4_;
            auVar62._0_4_ = auVar139._0_4_ * auVar113._0_4_;
            auVar62._8_4_ = auVar139._8_4_ * auVar113._8_4_;
            auVar62._12_4_ = auVar139._12_4_ * auVar113._12_4_;
            auVar62._16_4_ = auVar139._16_4_ * auVar113._16_4_;
            auVar62._20_4_ = auVar139._20_4_ * auVar113._20_4_;
            auVar62._24_4_ = auVar139._24_4_ * auVar113._24_4_;
            auVar62._28_4_ = 0;
            auVar63._4_4_ = auVar113._4_4_ * -auVar138._4_4_;
            auVar63._0_4_ = auVar113._0_4_ * -auVar138._0_4_;
            auVar63._8_4_ = auVar113._8_4_ * -auVar138._8_4_;
            auVar63._12_4_ = auVar113._12_4_ * -auVar138._12_4_;
            auVar63._16_4_ = auVar113._16_4_ * -auVar138._16_4_;
            auVar63._20_4_ = auVar113._20_4_ * -auVar138._20_4_;
            auVar63._24_4_ = auVar113._24_4_ * -auVar138._24_4_;
            auVar63._28_4_ = auVar139._28_4_;
            auVar124 = vmulps_avx512vl(auVar113,auVar111);
            auVar113 = vfmadd213ps_avx512vl(auVar140,auVar140,auVar111);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar141,auVar141);
            auVar123 = vrsqrt14ps_avx512vl(auVar113);
            auVar113 = vmulps_avx512vl(auVar113,auVar229);
            fVar192 = auVar123._0_4_;
            fVar159 = auVar123._4_4_;
            fVar191 = auVar123._8_4_;
            fVar199 = auVar123._12_4_;
            fVar200 = auVar123._16_4_;
            fVar201 = auVar123._20_4_;
            fVar183 = auVar123._24_4_;
            auVar64._4_4_ = fVar159 * fVar159 * fVar159 * auVar113._4_4_;
            auVar64._0_4_ = fVar192 * fVar192 * fVar192 * auVar113._0_4_;
            auVar64._8_4_ = fVar191 * fVar191 * fVar191 * auVar113._8_4_;
            auVar64._12_4_ = fVar199 * fVar199 * fVar199 * auVar113._12_4_;
            auVar64._16_4_ = fVar200 * fVar200 * fVar200 * auVar113._16_4_;
            auVar64._20_4_ = fVar201 * fVar201 * fVar201 * auVar113._20_4_;
            auVar64._24_4_ = fVar183 * fVar183 * fVar183 * auVar113._24_4_;
            auVar64._28_4_ = auVar113._28_4_;
            auVar113 = vfmadd231ps_avx512vl(auVar64,auVar125,auVar123);
            auVar65._4_4_ = auVar141._4_4_ * auVar113._4_4_;
            auVar65._0_4_ = auVar141._0_4_ * auVar113._0_4_;
            auVar65._8_4_ = auVar141._8_4_ * auVar113._8_4_;
            auVar65._12_4_ = auVar141._12_4_ * auVar113._12_4_;
            auVar65._16_4_ = auVar141._16_4_ * auVar113._16_4_;
            auVar65._20_4_ = auVar141._20_4_ * auVar113._20_4_;
            auVar65._24_4_ = auVar141._24_4_ * auVar113._24_4_;
            auVar65._28_4_ = auVar123._28_4_;
            auVar66._4_4_ = auVar113._4_4_ * auVar114._4_4_;
            auVar66._0_4_ = auVar113._0_4_ * auVar114._0_4_;
            auVar66._8_4_ = auVar113._8_4_ * auVar114._8_4_;
            auVar66._12_4_ = auVar113._12_4_ * auVar114._12_4_;
            auVar66._16_4_ = auVar113._16_4_ * auVar114._16_4_;
            auVar66._20_4_ = auVar113._20_4_ * auVar114._20_4_;
            auVar66._24_4_ = auVar113._24_4_ * auVar114._24_4_;
            auVar66._28_4_ = auVar114._28_4_;
            auVar114 = vmulps_avx512vl(auVar113,auVar111);
            auVar106 = vfmadd213ps_fma(auVar62,ZEXT1632(auVar104),auVar112);
            auVar113 = ZEXT1632(auVar104);
            auVar7 = vfmadd213ps_fma(auVar63,auVar113,auVar120);
            auVar125 = vfmadd213ps_avx512vl(auVar124,auVar113,auVar116);
            auVar123 = vfmadd213ps_avx512vl(auVar65,ZEXT1632(auVar105),auVar121);
            auVar162 = vfnmadd213ps_fma(auVar62,auVar113,auVar112);
            auVar117 = ZEXT1632(auVar105);
            auVar8 = vfmadd213ps_fma(auVar66,auVar117,auVar110);
            auVar107 = vfnmadd213ps_fma(auVar63,auVar113,auVar120);
            auVar9 = vfmadd213ps_fma(auVar114,auVar117,auVar115);
            auVar120 = ZEXT1632(auVar104);
            auVar109 = vfnmadd231ps_fma(auVar116,auVar120,auVar124);
            auVar108 = vfnmadd213ps_fma(auVar65,auVar117,auVar121);
            auVar175 = vfnmadd213ps_fma(auVar66,auVar117,auVar110);
            auVar176 = vfnmadd231ps_fma(auVar115,ZEXT1632(auVar105),auVar114);
            auVar115 = vsubps_avx512vl(auVar123,ZEXT1632(auVar162));
            auVar114 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar107));
            auVar113 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar109));
            auVar67._4_4_ = auVar114._4_4_ * auVar109._4_4_;
            auVar67._0_4_ = auVar114._0_4_ * auVar109._0_4_;
            auVar67._8_4_ = auVar114._8_4_ * auVar109._8_4_;
            auVar67._12_4_ = auVar114._12_4_ * auVar109._12_4_;
            auVar67._16_4_ = auVar114._16_4_ * 0.0;
            auVar67._20_4_ = auVar114._20_4_ * 0.0;
            auVar67._24_4_ = auVar114._24_4_ * 0.0;
            auVar67._28_4_ = auVar124._28_4_;
            auVar104 = vfmsub231ps_fma(auVar67,ZEXT1632(auVar107),auVar113);
            auVar68._4_4_ = auVar113._4_4_ * auVar162._4_4_;
            auVar68._0_4_ = auVar113._0_4_ * auVar162._0_4_;
            auVar68._8_4_ = auVar113._8_4_ * auVar162._8_4_;
            auVar68._12_4_ = auVar113._12_4_ * auVar162._12_4_;
            auVar68._16_4_ = auVar113._16_4_ * 0.0;
            auVar68._20_4_ = auVar113._20_4_ * 0.0;
            auVar68._24_4_ = auVar113._24_4_ * 0.0;
            auVar68._28_4_ = auVar113._28_4_;
            auVar10 = vfmsub231ps_fma(auVar68,ZEXT1632(auVar109),auVar115);
            auVar69._4_4_ = auVar107._4_4_ * auVar115._4_4_;
            auVar69._0_4_ = auVar107._0_4_ * auVar115._0_4_;
            auVar69._8_4_ = auVar107._8_4_ * auVar115._8_4_;
            auVar69._12_4_ = auVar107._12_4_ * auVar115._12_4_;
            auVar69._16_4_ = auVar115._16_4_ * 0.0;
            auVar69._20_4_ = auVar115._20_4_ * 0.0;
            auVar69._24_4_ = auVar115._24_4_ * 0.0;
            auVar69._28_4_ = auVar115._28_4_;
            auVar11 = vfmsub231ps_fma(auVar69,ZEXT1632(auVar162),auVar114);
            auVar114 = vfmadd231ps_avx512vl(ZEXT1632(auVar11),auVar111,ZEXT1632(auVar10));
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar111,ZEXT1632(auVar104));
            uVar95 = vcmpps_avx512vl(auVar114,auVar111,2);
            bVar102 = (byte)uVar95;
            fVar182 = (float)((uint)(bVar102 & 1) * auVar106._0_4_ |
                             (uint)!(bool)(bVar102 & 1) * auVar108._0_4_);
            bVar19 = (bool)((byte)(uVar95 >> 1) & 1);
            fVar153 = (float)((uint)bVar19 * auVar106._4_4_ | (uint)!bVar19 * auVar108._4_4_);
            bVar19 = (bool)((byte)(uVar95 >> 2) & 1);
            fVar155 = (float)((uint)bVar19 * auVar106._8_4_ | (uint)!bVar19 * auVar108._8_4_);
            bVar19 = (bool)((byte)(uVar95 >> 3) & 1);
            fVar157 = (float)((uint)bVar19 * auVar106._12_4_ | (uint)!bVar19 * auVar108._12_4_);
            auVar117 = ZEXT1632(CONCAT412(fVar157,CONCAT48(fVar155,CONCAT44(fVar153,fVar182))));
            fVar152 = (float)((uint)(bVar102 & 1) * auVar7._0_4_ |
                             (uint)!(bool)(bVar102 & 1) * auVar175._0_4_);
            bVar19 = (bool)((byte)(uVar95 >> 1) & 1);
            fVar154 = (float)((uint)bVar19 * auVar7._4_4_ | (uint)!bVar19 * auVar175._4_4_);
            bVar19 = (bool)((byte)(uVar95 >> 2) & 1);
            fVar156 = (float)((uint)bVar19 * auVar7._8_4_ | (uint)!bVar19 * auVar175._8_4_);
            bVar19 = (bool)((byte)(uVar95 >> 3) & 1);
            fVar158 = (float)((uint)bVar19 * auVar7._12_4_ | (uint)!bVar19 * auVar175._12_4_);
            auVar119 = ZEXT1632(CONCAT412(fVar158,CONCAT48(fVar156,CONCAT44(fVar154,fVar152))));
            auVar142._0_4_ =
                 (float)((uint)(bVar102 & 1) * auVar125._0_4_ |
                        (uint)!(bool)(bVar102 & 1) * auVar176._0_4_);
            bVar19 = (bool)((byte)(uVar95 >> 1) & 1);
            auVar142._4_4_ = (float)((uint)bVar19 * auVar125._4_4_ | (uint)!bVar19 * auVar176._4_4_)
            ;
            bVar19 = (bool)((byte)(uVar95 >> 2) & 1);
            auVar142._8_4_ = (float)((uint)bVar19 * auVar125._8_4_ | (uint)!bVar19 * auVar176._8_4_)
            ;
            bVar19 = (bool)((byte)(uVar95 >> 3) & 1);
            auVar142._12_4_ =
                 (float)((uint)bVar19 * auVar125._12_4_ | (uint)!bVar19 * auVar176._12_4_);
            fVar192 = (float)((uint)((byte)(uVar95 >> 4) & 1) * auVar125._16_4_);
            auVar142._16_4_ = fVar192;
            fVar159 = (float)((uint)((byte)(uVar95 >> 5) & 1) * auVar125._20_4_);
            auVar142._20_4_ = fVar159;
            fVar191 = (float)((uint)((byte)(uVar95 >> 6) & 1) * auVar125._24_4_);
            auVar142._24_4_ = fVar191;
            iVar1 = (uint)(byte)(uVar95 >> 7) * auVar125._28_4_;
            auVar142._28_4_ = iVar1;
            auVar114 = vblendmps_avx512vl(ZEXT1632(auVar162),auVar123);
            auVar143._0_4_ =
                 (uint)(bVar102 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar102 & 1) * auVar104._0_4_;
            bVar19 = (bool)((byte)(uVar95 >> 1) & 1);
            auVar143._4_4_ = (uint)bVar19 * auVar114._4_4_ | (uint)!bVar19 * auVar104._4_4_;
            bVar19 = (bool)((byte)(uVar95 >> 2) & 1);
            auVar143._8_4_ = (uint)bVar19 * auVar114._8_4_ | (uint)!bVar19 * auVar104._8_4_;
            bVar19 = (bool)((byte)(uVar95 >> 3) & 1);
            auVar143._12_4_ = (uint)bVar19 * auVar114._12_4_ | (uint)!bVar19 * auVar104._12_4_;
            auVar143._16_4_ = (uint)((byte)(uVar95 >> 4) & 1) * auVar114._16_4_;
            auVar143._20_4_ = (uint)((byte)(uVar95 >> 5) & 1) * auVar114._20_4_;
            auVar143._24_4_ = (uint)((byte)(uVar95 >> 6) & 1) * auVar114._24_4_;
            auVar143._28_4_ = (uint)(byte)(uVar95 >> 7) * auVar114._28_4_;
            auVar114 = vblendmps_avx512vl(ZEXT1632(auVar107),ZEXT1632(auVar8));
            auVar144._0_4_ =
                 (float)((uint)(bVar102 & 1) * auVar114._0_4_ |
                        (uint)!(bool)(bVar102 & 1) * auVar106._0_4_);
            bVar19 = (bool)((byte)(uVar95 >> 1) & 1);
            auVar144._4_4_ = (float)((uint)bVar19 * auVar114._4_4_ | (uint)!bVar19 * auVar106._4_4_)
            ;
            bVar19 = (bool)((byte)(uVar95 >> 2) & 1);
            auVar144._8_4_ = (float)((uint)bVar19 * auVar114._8_4_ | (uint)!bVar19 * auVar106._8_4_)
            ;
            bVar19 = (bool)((byte)(uVar95 >> 3) & 1);
            auVar144._12_4_ =
                 (float)((uint)bVar19 * auVar114._12_4_ | (uint)!bVar19 * auVar106._12_4_);
            fVar199 = (float)((uint)((byte)(uVar95 >> 4) & 1) * auVar114._16_4_);
            auVar144._16_4_ = fVar199;
            fVar200 = (float)((uint)((byte)(uVar95 >> 5) & 1) * auVar114._20_4_);
            auVar144._20_4_ = fVar200;
            fVar201 = (float)((uint)((byte)(uVar95 >> 6) & 1) * auVar114._24_4_);
            auVar144._24_4_ = fVar201;
            auVar144._28_4_ = (uint)(byte)(uVar95 >> 7) * auVar114._28_4_;
            auVar114 = vblendmps_avx512vl(ZEXT1632(auVar109),ZEXT1632(auVar9));
            auVar145._0_4_ =
                 (float)((uint)(bVar102 & 1) * auVar114._0_4_ |
                        (uint)!(bool)(bVar102 & 1) * auVar7._0_4_);
            bVar19 = (bool)((byte)(uVar95 >> 1) & 1);
            auVar145._4_4_ = (float)((uint)bVar19 * auVar114._4_4_ | (uint)!bVar19 * auVar7._4_4_);
            bVar19 = (bool)((byte)(uVar95 >> 2) & 1);
            auVar145._8_4_ = (float)((uint)bVar19 * auVar114._8_4_ | (uint)!bVar19 * auVar7._8_4_);
            bVar19 = (bool)((byte)(uVar95 >> 3) & 1);
            auVar145._12_4_ =
                 (float)((uint)bVar19 * auVar114._12_4_ | (uint)!bVar19 * auVar7._12_4_);
            fVar190 = (float)((uint)((byte)(uVar95 >> 4) & 1) * auVar114._16_4_);
            auVar145._16_4_ = fVar190;
            fVar103 = (float)((uint)((byte)(uVar95 >> 5) & 1) * auVar114._20_4_);
            auVar145._20_4_ = fVar103;
            fVar183 = (float)((uint)((byte)(uVar95 >> 6) & 1) * auVar114._24_4_);
            auVar145._24_4_ = fVar183;
            iVar2 = (uint)(byte)(uVar95 >> 7) * auVar114._28_4_;
            auVar145._28_4_ = iVar2;
            auVar146._0_4_ =
                 (uint)(bVar102 & 1) * (int)auVar162._0_4_ |
                 (uint)!(bool)(bVar102 & 1) * auVar123._0_4_;
            bVar19 = (bool)((byte)(uVar95 >> 1) & 1);
            auVar146._4_4_ = (uint)bVar19 * (int)auVar162._4_4_ | (uint)!bVar19 * auVar123._4_4_;
            bVar19 = (bool)((byte)(uVar95 >> 2) & 1);
            auVar146._8_4_ = (uint)bVar19 * (int)auVar162._8_4_ | (uint)!bVar19 * auVar123._8_4_;
            bVar19 = (bool)((byte)(uVar95 >> 3) & 1);
            auVar146._12_4_ = (uint)bVar19 * (int)auVar162._12_4_ | (uint)!bVar19 * auVar123._12_4_;
            auVar146._16_4_ = (uint)!(bool)((byte)(uVar95 >> 4) & 1) * auVar123._16_4_;
            auVar146._20_4_ = (uint)!(bool)((byte)(uVar95 >> 5) & 1) * auVar123._20_4_;
            auVar146._24_4_ = (uint)!(bool)((byte)(uVar95 >> 6) & 1) * auVar123._24_4_;
            auVar146._28_4_ = (uint)!SUB81(uVar95 >> 7,0) * auVar123._28_4_;
            bVar19 = (bool)((byte)(uVar95 >> 1) & 1);
            bVar21 = (bool)((byte)(uVar95 >> 2) & 1);
            bVar23 = (bool)((byte)(uVar95 >> 3) & 1);
            bVar20 = (bool)((byte)(uVar95 >> 1) & 1);
            bVar22 = (bool)((byte)(uVar95 >> 2) & 1);
            bVar24 = (bool)((byte)(uVar95 >> 3) & 1);
            auVar123 = vsubps_avx512vl(auVar146,auVar117);
            auVar113 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar23 * (int)auVar107._12_4_ |
                                                     (uint)!bVar23 * auVar8._12_4_,
                                                     CONCAT48((uint)bVar21 * (int)auVar107._8_4_ |
                                                              (uint)!bVar21 * auVar8._8_4_,
                                                              CONCAT44((uint)bVar19 *
                                                                       (int)auVar107._4_4_ |
                                                                       (uint)!bVar19 * auVar8._4_4_,
                                                                       (uint)(bVar102 & 1) *
                                                                       (int)auVar107._0_4_ |
                                                                       (uint)!(bool)(bVar102 & 1) *
                                                                       auVar8._0_4_)))),auVar119);
            auVar125 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar24 * (int)auVar109._12_4_ |
                                                     (uint)!bVar24 * auVar9._12_4_,
                                                     CONCAT48((uint)bVar22 * (int)auVar109._8_4_ |
                                                              (uint)!bVar22 * auVar9._8_4_,
                                                              CONCAT44((uint)bVar20 *
                                                                       (int)auVar109._4_4_ |
                                                                       (uint)!bVar20 * auVar9._4_4_,
                                                                       (uint)(bVar102 & 1) *
                                                                       (int)auVar109._0_4_ |
                                                                       (uint)!(bool)(bVar102 & 1) *
                                                                       auVar9._0_4_)))),auVar142);
            auVar124 = vsubps_avx(auVar117,auVar143);
            auVar115 = vsubps_avx(auVar119,auVar144);
            auVar116 = vsubps_avx(auVar142,auVar145);
            auVar70._4_4_ = auVar125._4_4_ * fVar153;
            auVar70._0_4_ = auVar125._0_4_ * fVar182;
            auVar70._8_4_ = auVar125._8_4_ * fVar155;
            auVar70._12_4_ = auVar125._12_4_ * fVar157;
            auVar70._16_4_ = auVar125._16_4_ * 0.0;
            auVar70._20_4_ = auVar125._20_4_ * 0.0;
            auVar70._24_4_ = auVar125._24_4_ * 0.0;
            auVar70._28_4_ = 0;
            auVar104 = vfmsub231ps_fma(auVar70,auVar142,auVar123);
            auVar189._0_4_ = fVar152 * auVar123._0_4_;
            auVar189._4_4_ = fVar154 * auVar123._4_4_;
            auVar189._8_4_ = fVar156 * auVar123._8_4_;
            auVar189._12_4_ = fVar158 * auVar123._12_4_;
            auVar189._16_4_ = auVar123._16_4_ * 0.0;
            auVar189._20_4_ = auVar123._20_4_ * 0.0;
            auVar189._24_4_ = auVar123._24_4_ * 0.0;
            auVar189._28_4_ = 0;
            auVar106 = vfmsub231ps_fma(auVar189,auVar117,auVar113);
            auVar114 = vfmadd231ps_avx512vl(ZEXT1632(auVar106),auVar111,ZEXT1632(auVar104));
            auVar195._0_4_ = auVar113._0_4_ * auVar142._0_4_;
            auVar195._4_4_ = auVar113._4_4_ * auVar142._4_4_;
            auVar195._8_4_ = auVar113._8_4_ * auVar142._8_4_;
            auVar195._12_4_ = auVar113._12_4_ * auVar142._12_4_;
            auVar195._16_4_ = auVar113._16_4_ * fVar192;
            auVar195._20_4_ = auVar113._20_4_ * fVar159;
            auVar195._24_4_ = auVar113._24_4_ * fVar191;
            auVar195._28_4_ = 0;
            auVar104 = vfmsub231ps_fma(auVar195,auVar119,auVar125);
            auVar118 = vfmadd231ps_avx512vl(auVar114,auVar111,ZEXT1632(auVar104));
            auVar114 = vmulps_avx512vl(auVar116,auVar143);
            auVar114 = vfmsub231ps_avx512vl(auVar114,auVar124,auVar145);
            auVar71._4_4_ = auVar115._4_4_ * auVar145._4_4_;
            auVar71._0_4_ = auVar115._0_4_ * auVar145._0_4_;
            auVar71._8_4_ = auVar115._8_4_ * auVar145._8_4_;
            auVar71._12_4_ = auVar115._12_4_ * auVar145._12_4_;
            auVar71._16_4_ = auVar115._16_4_ * fVar190;
            auVar71._20_4_ = auVar115._20_4_ * fVar103;
            auVar71._24_4_ = auVar115._24_4_ * fVar183;
            auVar71._28_4_ = iVar2;
            auVar104 = vfmsub231ps_fma(auVar71,auVar144,auVar116);
            auVar196._0_4_ = auVar144._0_4_ * auVar124._0_4_;
            auVar196._4_4_ = auVar144._4_4_ * auVar124._4_4_;
            auVar196._8_4_ = auVar144._8_4_ * auVar124._8_4_;
            auVar196._12_4_ = auVar144._12_4_ * auVar124._12_4_;
            auVar196._16_4_ = fVar199 * auVar124._16_4_;
            auVar196._20_4_ = fVar200 * auVar124._20_4_;
            auVar196._24_4_ = fVar201 * auVar124._24_4_;
            auVar196._28_4_ = 0;
            auVar106 = vfmsub231ps_fma(auVar196,auVar115,auVar143);
            auVar114 = vfmadd231ps_avx512vl(ZEXT1632(auVar106),auVar111,auVar114);
            auVar112 = vfmadd231ps_avx512vl(auVar114,auVar111,ZEXT1632(auVar104));
            auVar114 = vmaxps_avx(auVar118,auVar112);
            uVar161 = vcmpps_avx512vl(auVar114,auVar111,2);
            local_3b0 = local_3b0 & (byte)uVar161;
            auVar231 = ZEXT3264(auVar174);
            if (local_3b0 == 0) {
LAB_01e77bf6:
              local_3b0 = 0;
            }
            else {
              auVar72._4_4_ = auVar116._4_4_ * auVar113._4_4_;
              auVar72._0_4_ = auVar116._0_4_ * auVar113._0_4_;
              auVar72._8_4_ = auVar116._8_4_ * auVar113._8_4_;
              auVar72._12_4_ = auVar116._12_4_ * auVar113._12_4_;
              auVar72._16_4_ = auVar116._16_4_ * auVar113._16_4_;
              auVar72._20_4_ = auVar116._20_4_ * auVar113._20_4_;
              auVar72._24_4_ = auVar116._24_4_ * auVar113._24_4_;
              auVar72._28_4_ = auVar114._28_4_;
              auVar7 = vfmsub231ps_fma(auVar72,auVar115,auVar125);
              auVar73._4_4_ = auVar125._4_4_ * auVar124._4_4_;
              auVar73._0_4_ = auVar125._0_4_ * auVar124._0_4_;
              auVar73._8_4_ = auVar125._8_4_ * auVar124._8_4_;
              auVar73._12_4_ = auVar125._12_4_ * auVar124._12_4_;
              auVar73._16_4_ = auVar125._16_4_ * auVar124._16_4_;
              auVar73._20_4_ = auVar125._20_4_ * auVar124._20_4_;
              auVar73._24_4_ = auVar125._24_4_ * auVar124._24_4_;
              auVar73._28_4_ = auVar125._28_4_;
              auVar106 = vfmsub231ps_fma(auVar73,auVar123,auVar116);
              auVar74._4_4_ = auVar115._4_4_ * auVar123._4_4_;
              auVar74._0_4_ = auVar115._0_4_ * auVar123._0_4_;
              auVar74._8_4_ = auVar115._8_4_ * auVar123._8_4_;
              auVar74._12_4_ = auVar115._12_4_ * auVar123._12_4_;
              auVar74._16_4_ = auVar115._16_4_ * auVar123._16_4_;
              auVar74._20_4_ = auVar115._20_4_ * auVar123._20_4_;
              auVar74._24_4_ = auVar115._24_4_ * auVar123._24_4_;
              auVar74._28_4_ = auVar115._28_4_;
              auVar8 = vfmsub231ps_fma(auVar74,auVar124,auVar113);
              auVar104 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar106),ZEXT1632(auVar8));
              auVar114 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),ZEXT1632(auVar7),auVar111);
              auVar113 = vrcp14ps_avx512vl(auVar114);
              auVar35._8_4_ = 0x3f800000;
              auVar35._0_8_ = &DAT_3f8000003f800000;
              auVar35._12_4_ = 0x3f800000;
              auVar35._16_4_ = 0x3f800000;
              auVar35._20_4_ = 0x3f800000;
              auVar35._24_4_ = 0x3f800000;
              auVar35._28_4_ = 0x3f800000;
              auVar125 = vfnmadd213ps_avx512vl(auVar113,auVar114,auVar35);
              auVar104 = vfmadd132ps_fma(auVar125,auVar113,auVar113);
              auVar75._4_4_ = auVar8._4_4_ * auVar142._4_4_;
              auVar75._0_4_ = auVar8._0_4_ * auVar142._0_4_;
              auVar75._8_4_ = auVar8._8_4_ * auVar142._8_4_;
              auVar75._12_4_ = auVar8._12_4_ * auVar142._12_4_;
              auVar75._16_4_ = fVar192 * 0.0;
              auVar75._20_4_ = fVar159 * 0.0;
              auVar75._24_4_ = fVar191 * 0.0;
              auVar75._28_4_ = iVar1;
              auVar106 = vfmadd231ps_fma(auVar75,auVar119,ZEXT1632(auVar106));
              auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar117,ZEXT1632(auVar7));
              fVar192 = auVar104._0_4_;
              fVar159 = auVar104._4_4_;
              fVar191 = auVar104._8_4_;
              fVar199 = auVar104._12_4_;
              auVar113 = ZEXT1632(CONCAT412(auVar106._12_4_ * fVar199,
                                            CONCAT48(auVar106._8_4_ * fVar191,
                                                     CONCAT44(auVar106._4_4_ * fVar159,
                                                              auVar106._0_4_ * fVar192))));
              auVar92._4_4_ = uStack_49c;
              auVar92._0_4_ = local_4a0;
              auVar92._8_4_ = uStack_498;
              auVar92._12_4_ = uStack_494;
              auVar92._16_4_ = uStack_490;
              auVar92._20_4_ = uStack_48c;
              auVar92._24_4_ = uStack_488;
              auVar92._28_4_ = uStack_484;
              uVar161 = vcmpps_avx512vl(auVar113,auVar92,0xd);
              uVar160 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar36._4_4_ = uVar160;
              auVar36._0_4_ = uVar160;
              auVar36._8_4_ = uVar160;
              auVar36._12_4_ = uVar160;
              auVar36._16_4_ = uVar160;
              auVar36._20_4_ = uVar160;
              auVar36._24_4_ = uVar160;
              auVar36._28_4_ = uVar160;
              uVar26 = vcmpps_avx512vl(auVar113,auVar36,2);
              local_3b0 = (byte)uVar161 & (byte)uVar26 & local_3b0;
              if (local_3b0 == 0) goto LAB_01e77bf6;
              uVar161 = vcmpps_avx512vl(auVar114,auVar111,4);
              if ((local_3b0 & (byte)uVar161) == 0) {
                local_3b0 = 0;
              }
              else {
                local_3b0 = local_3b0 & (byte)uVar161;
                fVar200 = auVar118._0_4_ * fVar192;
                fVar201 = auVar118._4_4_ * fVar159;
                auVar76._4_4_ = fVar201;
                auVar76._0_4_ = fVar200;
                fVar183 = auVar118._8_4_ * fVar191;
                auVar76._8_4_ = fVar183;
                fVar190 = auVar118._12_4_ * fVar199;
                auVar76._12_4_ = fVar190;
                fVar103 = auVar118._16_4_ * 0.0;
                auVar76._16_4_ = fVar103;
                fVar182 = auVar118._20_4_ * 0.0;
                auVar76._20_4_ = fVar182;
                fVar152 = auVar118._24_4_ * 0.0;
                auVar76._24_4_ = fVar152;
                auVar76._28_4_ = auVar118._28_4_;
                fVar192 = auVar112._0_4_ * fVar192;
                fVar159 = auVar112._4_4_ * fVar159;
                auVar77._4_4_ = fVar159;
                auVar77._0_4_ = fVar192;
                fVar191 = auVar112._8_4_ * fVar191;
                auVar77._8_4_ = fVar191;
                fVar199 = auVar112._12_4_ * fVar199;
                auVar77._12_4_ = fVar199;
                fVar153 = auVar112._16_4_ * 0.0;
                auVar77._16_4_ = fVar153;
                fVar154 = auVar112._20_4_ * 0.0;
                auVar77._20_4_ = fVar154;
                fVar155 = auVar112._24_4_ * 0.0;
                auVar77._24_4_ = fVar155;
                auVar77._28_4_ = auVar112._28_4_;
                auVar211._8_4_ = 0x3f800000;
                auVar211._0_8_ = &DAT_3f8000003f800000;
                auVar211._12_4_ = 0x3f800000;
                auVar211._16_4_ = 0x3f800000;
                auVar211._20_4_ = 0x3f800000;
                auVar211._24_4_ = 0x3f800000;
                auVar211._28_4_ = 0x3f800000;
                auVar114 = vsubps_avx(auVar211,auVar76);
                local_6a0._0_4_ =
                     (uint)(bVar102 & 1) * (int)fVar200 |
                     (uint)!(bool)(bVar102 & 1) * auVar114._0_4_;
                bVar19 = (bool)((byte)(uVar95 >> 1) & 1);
                local_6a0._4_4_ = (uint)bVar19 * (int)fVar201 | (uint)!bVar19 * auVar114._4_4_;
                bVar19 = (bool)((byte)(uVar95 >> 2) & 1);
                local_6a0._8_4_ = (uint)bVar19 * (int)fVar183 | (uint)!bVar19 * auVar114._8_4_;
                bVar19 = (bool)((byte)(uVar95 >> 3) & 1);
                local_6a0._12_4_ = (uint)bVar19 * (int)fVar190 | (uint)!bVar19 * auVar114._12_4_;
                bVar19 = (bool)((byte)(uVar95 >> 4) & 1);
                local_6a0._16_4_ = (uint)bVar19 * (int)fVar103 | (uint)!bVar19 * auVar114._16_4_;
                bVar19 = (bool)((byte)(uVar95 >> 5) & 1);
                local_6a0._20_4_ = (uint)bVar19 * (int)fVar182 | (uint)!bVar19 * auVar114._20_4_;
                bVar19 = (bool)((byte)(uVar95 >> 6) & 1);
                local_6a0._24_4_ = (uint)bVar19 * (int)fVar152 | (uint)!bVar19 * auVar114._24_4_;
                bVar19 = SUB81(uVar95 >> 7,0);
                local_6a0._28_4_ = (uint)bVar19 * auVar118._28_4_ | (uint)!bVar19 * auVar114._28_4_;
                auVar114 = vsubps_avx(auVar211,auVar77);
                bVar19 = (bool)((byte)(uVar95 >> 1) & 1);
                bVar20 = (bool)((byte)(uVar95 >> 2) & 1);
                bVar21 = (bool)((byte)(uVar95 >> 3) & 1);
                bVar22 = (bool)((byte)(uVar95 >> 4) & 1);
                bVar23 = (bool)((byte)(uVar95 >> 5) & 1);
                bVar24 = (bool)((byte)(uVar95 >> 6) & 1);
                bVar25 = SUB81(uVar95 >> 7,0);
                local_300._4_4_ = (uint)bVar19 * (int)fVar159 | (uint)!bVar19 * auVar114._4_4_;
                local_300._0_4_ =
                     (uint)(bVar102 & 1) * (int)fVar192 |
                     (uint)!(bool)(bVar102 & 1) * auVar114._0_4_;
                local_300._8_4_ = (uint)bVar20 * (int)fVar191 | (uint)!bVar20 * auVar114._8_4_;
                local_300._12_4_ = (uint)bVar21 * (int)fVar199 | (uint)!bVar21 * auVar114._12_4_;
                local_300._16_4_ = (uint)bVar22 * (int)fVar153 | (uint)!bVar22 * auVar114._16_4_;
                local_300._20_4_ = (uint)bVar23 * (int)fVar154 | (uint)!bVar23 * auVar114._20_4_;
                local_300._24_4_ = (uint)bVar24 * (int)fVar155 | (uint)!bVar24 * auVar114._24_4_;
                local_300._28_4_ = (uint)bVar25 * auVar112._28_4_ | (uint)!bVar25 * auVar114._28_4_;
                local_6c0 = auVar113;
              }
            }
            auVar239 = ZEXT3264(local_720);
            if (local_3b0 != 0) {
              auVar114 = vsubps_avx(ZEXT1632(auVar105),auVar120);
              auVar104 = vfmadd213ps_fma(auVar114,local_6a0,auVar120);
              uVar160 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar37._4_4_ = uVar160;
              auVar37._0_4_ = uVar160;
              auVar37._8_4_ = uVar160;
              auVar37._12_4_ = uVar160;
              auVar37._16_4_ = uVar160;
              auVar37._20_4_ = uVar160;
              auVar37._24_4_ = uVar160;
              auVar37._28_4_ = uVar160;
              auVar114 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar104._12_4_ + auVar104._12_4_,
                                                            CONCAT48(auVar104._8_4_ + auVar104._8_4_
                                                                     ,CONCAT44(auVar104._4_4_ +
                                                                               auVar104._4_4_,
                                                                               auVar104._0_4_ +
                                                                               auVar104._0_4_)))),
                                         auVar37);
              uVar161 = vcmpps_avx512vl(local_6c0,auVar114,6);
              local_3b0 = local_3b0 & (byte)uVar161;
              if (local_3b0 != 0) {
                auVar170._8_4_ = 0xbf800000;
                auVar170._0_8_ = 0xbf800000bf800000;
                auVar170._12_4_ = 0xbf800000;
                auVar170._16_4_ = 0xbf800000;
                auVar170._20_4_ = 0xbf800000;
                auVar170._24_4_ = 0xbf800000;
                auVar170._28_4_ = 0xbf800000;
                auVar38._8_4_ = 0x40000000;
                auVar38._0_8_ = 0x4000000040000000;
                auVar38._12_4_ = 0x40000000;
                auVar38._16_4_ = 0x40000000;
                auVar38._20_4_ = 0x40000000;
                auVar38._24_4_ = 0x40000000;
                auVar38._28_4_ = 0x40000000;
                local_440 = vfmadd132ps_avx512vl(local_300,auVar170,auVar38);
                local_300 = local_440;
                auVar114 = local_300;
                local_400 = (undefined4)lVar98;
                local_3f0 = local_770;
                uStack_3e8 = uStack_768;
                local_3e0 = local_6d0._0_8_;
                uStack_3d8 = local_6d0._8_8_;
                local_3d0 = local_6e0._0_8_;
                uStack_3c8 = local_6e0._8_8_;
                local_3c0 = local_6f0;
                uStack_3b8 = uStack_6e8;
                pGVar100 = (context->scene->geometries).items[uVar101].ptr;
                local_300 = auVar114;
                if ((pGVar100->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar104 = vcvtsi2ss_avx512f(auVar230._0_16_,local_400);
                  fVar192 = auVar104._0_4_;
                  local_3a0[0] = (fVar192 + local_6a0._0_4_ + 0.0) * (float)local_480._0_4_;
                  local_3a0[1] = (fVar192 + local_6a0._4_4_ + 1.0) * (float)local_480._4_4_;
                  local_3a0[2] = (fVar192 + local_6a0._8_4_ + 2.0) * fStack_478;
                  local_3a0[3] = (fVar192 + local_6a0._12_4_ + 3.0) * fStack_474;
                  fStack_390 = (fVar192 + local_6a0._16_4_ + 4.0) * fStack_470;
                  fStack_38c = (fVar192 + local_6a0._20_4_ + 5.0) * fStack_46c;
                  fStack_388 = (fVar192 + local_6a0._24_4_ + 6.0) * fStack_468;
                  fStack_384 = fVar192 + local_6a0._28_4_ + 7.0;
                  local_300._0_8_ = local_440._0_8_;
                  local_300._8_8_ = local_440._8_8_;
                  local_300._16_8_ = local_440._16_8_;
                  local_300._24_8_ = local_440._24_8_;
                  local_380 = local_300._0_8_;
                  uStack_378 = local_300._8_8_;
                  uStack_370 = local_300._16_8_;
                  uStack_368 = local_300._24_8_;
                  local_360 = local_6c0;
                  auVar171._8_4_ = 0x7f800000;
                  auVar171._0_8_ = 0x7f8000007f800000;
                  auVar171._12_4_ = 0x7f800000;
                  auVar171._16_4_ = 0x7f800000;
                  auVar171._20_4_ = 0x7f800000;
                  auVar171._24_4_ = 0x7f800000;
                  auVar171._28_4_ = 0x7f800000;
                  auVar114 = vblendmps_avx512vl(auVar171,local_6c0);
                  auVar147._0_4_ =
                       (uint)(local_3b0 & 1) * auVar114._0_4_ |
                       (uint)!(bool)(local_3b0 & 1) * 0x7f800000;
                  bVar19 = (bool)(local_3b0 >> 1 & 1);
                  auVar147._4_4_ = (uint)bVar19 * auVar114._4_4_ | (uint)!bVar19 * 0x7f800000;
                  bVar19 = (bool)(local_3b0 >> 2 & 1);
                  auVar147._8_4_ = (uint)bVar19 * auVar114._8_4_ | (uint)!bVar19 * 0x7f800000;
                  bVar19 = (bool)(local_3b0 >> 3 & 1);
                  auVar147._12_4_ = (uint)bVar19 * auVar114._12_4_ | (uint)!bVar19 * 0x7f800000;
                  bVar19 = (bool)(local_3b0 >> 4 & 1);
                  auVar147._16_4_ = (uint)bVar19 * auVar114._16_4_ | (uint)!bVar19 * 0x7f800000;
                  bVar19 = (bool)(local_3b0 >> 5 & 1);
                  auVar147._20_4_ = (uint)bVar19 * auVar114._20_4_ | (uint)!bVar19 * 0x7f800000;
                  bVar19 = (bool)(local_3b0 >> 6 & 1);
                  auVar147._24_4_ = (uint)bVar19 * auVar114._24_4_ | (uint)!bVar19 * 0x7f800000;
                  auVar147._28_4_ =
                       (uint)(local_3b0 >> 7) * auVar114._28_4_ |
                       (uint)!(bool)(local_3b0 >> 7) * 0x7f800000;
                  auVar114 = vshufps_avx(auVar147,auVar147,0xb1);
                  auVar114 = vminps_avx(auVar147,auVar114);
                  auVar113 = vshufpd_avx(auVar114,auVar114,5);
                  auVar114 = vminps_avx(auVar114,auVar113);
                  auVar113 = vpermpd_avx2(auVar114,0x4e);
                  auVar114 = vminps_avx(auVar114,auVar113);
                  uVar161 = vcmpps_avx512vl(auVar147,auVar114,0);
                  bVar94 = (byte)uVar161 & local_3b0;
                  bVar102 = local_3b0;
                  if (bVar94 != 0) {
                    bVar102 = bVar94;
                  }
                  uVar28 = 0;
                  for (uVar96 = (uint)bVar102; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000)
                  {
                    uVar28 = uVar28 + 1;
                  }
                  uVar95 = (ulong)uVar28;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar100->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar192 = local_3a0[uVar95];
                    uVar160 = *(undefined4 *)((long)&local_380 + uVar95 * 4);
                    fVar191 = 1.0 - fVar192;
                    fVar159 = fVar191 * fVar191 * -3.0;
                    auVar104 = vfmadd231ss_fma(ZEXT416((uint)(fVar191 * fVar191)),
                                               ZEXT416((uint)(fVar192 * fVar191)),
                                               ZEXT416(0xc0000000));
                    auVar105 = vfmsub132ss_fma(ZEXT416((uint)(fVar192 * fVar191)),
                                               ZEXT416((uint)(fVar192 * fVar192)),
                                               ZEXT416(0x40000000));
                    fVar191 = auVar104._0_4_ * 3.0;
                    fVar199 = auVar105._0_4_ * 3.0;
                    fVar200 = fVar192 * fVar192 * 3.0;
                    auVar203._0_4_ = fVar200 * (float)local_6f0._0_4_;
                    auVar203._4_4_ = fVar200 * (float)local_6f0._4_4_;
                    auVar203._8_4_ = fVar200 * (float)uStack_6e8;
                    auVar203._12_4_ = fVar200 * uStack_6e8._4_4_;
                    auVar179._4_4_ = fVar199;
                    auVar179._0_4_ = fVar199;
                    auVar179._8_4_ = fVar199;
                    auVar179._12_4_ = fVar199;
                    auVar104 = vfmadd132ps_fma(auVar179,auVar203,local_6e0);
                    auVar185._4_4_ = fVar191;
                    auVar185._0_4_ = fVar191;
                    auVar185._8_4_ = fVar191;
                    auVar185._12_4_ = fVar191;
                    auVar104 = vfmadd132ps_fma(auVar185,auVar104,local_6d0);
                    auVar180._4_4_ = fVar159;
                    auVar180._0_4_ = fVar159;
                    auVar180._8_4_ = fVar159;
                    auVar180._12_4_ = fVar159;
                    auVar104 = vfmadd132ps_fma(auVar180,auVar104,auVar6);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_360 + uVar95 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar104._0_4_;
                    uVar15 = vextractps_avx(auVar104,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar15;
                    uVar15 = vextractps_avx(auVar104,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar15;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar192;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar160;
                    *(uint *)(ray + k * 4 + 0x220) = uVar13;
                    *(uint *)(ray + k * 4 + 0x240) = uVar101;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    local_5b0 = local_6d0._0_8_;
                    uStack_5a8 = local_6d0._8_8_;
                    local_5c0 = local_6e0._0_4_;
                    fStack_5bc = local_6e0._4_4_;
                    fStack_5b8 = local_6e0._8_4_;
                    fStack_5b4 = local_6e0._12_4_;
                    _local_700 = _local_6f0;
                    local_2c0 = vmovdqa64_avx512vl(auVar225._0_32_);
                    local_730 = pGVar100;
                    local_460 = local_6a0;
                    local_420 = local_6c0;
                    local_3fc = iVar14;
                    bVar102 = local_3b0;
                    do {
                      auVar113 = local_4c0;
                      auVar106 = auVar235._0_16_;
                      local_5a0 = *(undefined4 *)(ray + k * 4 + 0x100);
                      local_220 = local_3a0[uVar95];
                      local_200 = *(undefined4 *)((long)&local_380 + uVar95 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_360 + uVar95 * 4)
                      ;
                      local_760.context = context->user;
                      fVar159 = 1.0 - local_220;
                      fVar192 = fVar159 * fVar159 * -3.0;
                      auVar104 = vfmadd231ss_fma(ZEXT416((uint)(fVar159 * fVar159)),
                                                 ZEXT416((uint)(local_220 * fVar159)),
                                                 ZEXT416(0xc0000000));
                      auVar105 = vfmsub132ss_fma(ZEXT416((uint)(local_220 * fVar159)),
                                                 ZEXT416((uint)(local_220 * local_220)),
                                                 ZEXT416(0x40000000));
                      fVar159 = auVar104._0_4_ * 3.0;
                      fVar191 = auVar105._0_4_ * 3.0;
                      fVar199 = local_220 * local_220 * 3.0;
                      auVar204._0_4_ = fVar199 * (float)local_700._0_4_;
                      auVar204._4_4_ = fVar199 * (float)local_700._4_4_;
                      auVar204._8_4_ = fVar199 * fStack_6f8;
                      auVar204._12_4_ = fVar199 * fStack_6f4;
                      auVar163._4_4_ = fVar191;
                      auVar163._0_4_ = fVar191;
                      auVar163._8_4_ = fVar191;
                      auVar163._12_4_ = fVar191;
                      auVar87._4_4_ = fStack_5bc;
                      auVar87._0_4_ = local_5c0;
                      auVar87._8_4_ = fStack_5b8;
                      auVar87._12_4_ = fStack_5b4;
                      auVar104 = vfmadd132ps_fma(auVar163,auVar204,auVar87);
                      auVar186._4_4_ = fVar159;
                      auVar186._0_4_ = fVar159;
                      auVar186._8_4_ = fVar159;
                      auVar186._12_4_ = fVar159;
                      auVar88._8_8_ = uStack_5a8;
                      auVar88._0_8_ = local_5b0;
                      auVar104 = vfmadd132ps_fma(auVar186,auVar104,auVar88);
                      auVar164._4_4_ = fVar192;
                      auVar164._0_4_ = fVar192;
                      auVar164._8_4_ = fVar192;
                      auVar164._12_4_ = fVar192;
                      auVar104 = vfmadd132ps_fma(auVar164,auVar104,auVar6);
                      local_280 = auVar104._0_4_;
                      auVar197._8_4_ = 1;
                      auVar197._0_8_ = 0x100000001;
                      auVar197._12_4_ = 1;
                      auVar197._16_4_ = 1;
                      auVar197._20_4_ = 1;
                      auVar197._24_4_ = 1;
                      auVar197._28_4_ = 1;
                      local_260 = vpermps_avx2(auVar197,ZEXT1632(auVar104));
                      auVar207._8_4_ = 2;
                      auVar207._0_8_ = 0x200000002;
                      auVar207._12_4_ = 2;
                      auVar207._16_4_ = 2;
                      auVar207._20_4_ = 2;
                      auVar207._24_4_ = 2;
                      auVar207._28_4_ = 2;
                      local_240 = vpermps_avx2(auVar207,ZEXT1632(auVar104));
                      iStack_27c = local_280;
                      iStack_278 = local_280;
                      iStack_274 = local_280;
                      iStack_270 = local_280;
                      iStack_26c = local_280;
                      iStack_268 = local_280;
                      iStack_264 = local_280;
                      fStack_21c = local_220;
                      fStack_218 = local_220;
                      fStack_214 = local_220;
                      fStack_210 = local_220;
                      fStack_20c = local_220;
                      fStack_208 = local_220;
                      fStack_204 = local_220;
                      uStack_1fc = local_200;
                      uStack_1f8 = local_200;
                      uStack_1f4 = local_200;
                      uStack_1f0 = local_200;
                      uStack_1ec = local_200;
                      uStack_1e8 = local_200;
                      uStack_1e4 = local_200;
                      local_1e0 = local_340._0_8_;
                      uStack_1d8 = local_340._8_8_;
                      uStack_1d0 = local_340._16_8_;
                      uStack_1c8 = local_340._24_8_;
                      local_1c0 = local_320;
                      auVar114 = vpcmpeqd_avx2(local_320,local_320);
                      local_728[1] = auVar114;
                      *local_728 = auVar114;
                      local_1a0 = (local_760.context)->instID[0];
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_180 = (local_760.context)->instPrimID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_5e0 = local_2a0._0_8_;
                      uStack_5d8 = local_2a0._8_8_;
                      uStack_5d0 = local_2a0._16_8_;
                      uStack_5c8 = local_2a0._24_8_;
                      local_760.valid = (int *)&local_5e0;
                      local_760.geometryUserPtr = pGVar100->userPtr;
                      local_760.hit = (RTCHitN *)&local_280;
                      local_760.N = 8;
                      local_4c0._1_3_ = 0;
                      local_4c0[0] = bVar102;
                      local_4c0._4_28_ = auVar113._4_28_;
                      local_760.ray = (RTCRayN *)ray;
                      if (pGVar100->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar100->intersectionFilterN)(&local_760);
                        auVar114 = vmovdqa64_avx512vl(local_2c0);
                        auVar225 = ZEXT3264(auVar114);
                        auVar238 = ZEXT3264(local_640);
                        auVar237 = ZEXT3264(local_620);
                        auVar236 = ZEXT3264(local_600);
                        auVar239 = ZEXT3264(local_720);
                        auVar231 = ZEXT3264(local_540);
                        auVar234 = ZEXT3264(local_520);
                        auVar233 = ZEXT3264(local_4e0);
                        auVar232 = ZEXT3264(local_500);
                        auVar104 = vxorps_avx512vl(auVar106,auVar106);
                        auVar235 = ZEXT1664(auVar104);
                        pGVar100 = local_730;
                        bVar102 = local_4c0[0];
                      }
                      auVar104 = auVar235._0_16_;
                      auVar83._8_8_ = uStack_5d8;
                      auVar83._0_8_ = local_5e0;
                      auVar83._16_8_ = uStack_5d0;
                      auVar83._24_8_ = uStack_5c8;
                      if (auVar83 == (undefined1  [32])0x0) {
LAB_01e78051:
                        *(undefined4 *)(ray + k * 4 + 0x100) = local_5a0;
                      }
                      else {
                        p_Var18 = context->args->filter;
                        if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar100->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var18)(&local_760);
                          bVar102 = local_4c0[0];
                          auVar114 = vmovdqa64_avx512vl(local_2c0);
                          auVar225 = ZEXT3264(auVar114);
                          auVar238 = ZEXT3264(local_640);
                          auVar237 = ZEXT3264(local_620);
                          auVar236 = ZEXT3264(local_600);
                          auVar239 = ZEXT3264(local_720);
                          auVar231 = ZEXT3264(local_540);
                          auVar234 = ZEXT3264(local_520);
                          auVar233 = ZEXT3264(local_4e0);
                          auVar232 = ZEXT3264(local_500);
                          auVar104 = vxorps_avx512vl(auVar104,auVar104);
                          auVar235 = ZEXT1664(auVar104);
                          pGVar100 = local_730;
                        }
                        auVar84._8_8_ = uStack_5d8;
                        auVar84._0_8_ = local_5e0;
                        auVar84._16_8_ = uStack_5d0;
                        auVar84._24_8_ = uStack_5c8;
                        if (auVar84 == (undefined1  [32])0x0) goto LAB_01e78051;
                        uVar27 = vptestmd_avx512vl(auVar84,auVar84);
                        iVar1 = *(int *)(local_760.hit + 4);
                        iVar2 = *(int *)(local_760.hit + 8);
                        iVar78 = *(int *)(local_760.hit + 0xc);
                        iVar79 = *(int *)(local_760.hit + 0x10);
                        iVar80 = *(int *)(local_760.hit + 0x14);
                        iVar81 = *(int *)(local_760.hit + 0x18);
                        iVar82 = *(int *)(local_760.hit + 0x1c);
                        bVar94 = (byte)uVar27;
                        bVar19 = (bool)((byte)(uVar27 >> 1) & 1);
                        bVar20 = (bool)((byte)(uVar27 >> 2) & 1);
                        bVar21 = (bool)((byte)(uVar27 >> 3) & 1);
                        bVar22 = (bool)((byte)(uVar27 >> 4) & 1);
                        bVar23 = (bool)((byte)(uVar27 >> 5) & 1);
                        bVar24 = (bool)((byte)(uVar27 >> 6) & 1);
                        bVar25 = SUB81(uVar27 >> 7,0);
                        *(uint *)(local_760.ray + 0x180) =
                             (uint)(bVar94 & 1) * *(int *)local_760.hit |
                             (uint)!(bool)(bVar94 & 1) * *(int *)(local_760.ray + 0x180);
                        *(uint *)(local_760.ray + 0x184) =
                             (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_760.ray + 0x184);
                        *(uint *)(local_760.ray + 0x188) =
                             (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_760.ray + 0x188);
                        *(uint *)(local_760.ray + 0x18c) =
                             (uint)bVar21 * iVar78 | (uint)!bVar21 * *(int *)(local_760.ray + 0x18c)
                        ;
                        *(uint *)(local_760.ray + 400) =
                             (uint)bVar22 * iVar79 | (uint)!bVar22 * *(int *)(local_760.ray + 400);
                        *(uint *)(local_760.ray + 0x194) =
                             (uint)bVar23 * iVar80 | (uint)!bVar23 * *(int *)(local_760.ray + 0x194)
                        ;
                        *(uint *)(local_760.ray + 0x198) =
                             (uint)bVar24 * iVar81 | (uint)!bVar24 * *(int *)(local_760.ray + 0x198)
                        ;
                        *(uint *)(local_760.ray + 0x19c) =
                             (uint)bVar25 * iVar82 | (uint)!bVar25 * *(int *)(local_760.ray + 0x19c)
                        ;
                        iVar1 = *(int *)(local_760.hit + 0x24);
                        iVar2 = *(int *)(local_760.hit + 0x28);
                        iVar78 = *(int *)(local_760.hit + 0x2c);
                        iVar79 = *(int *)(local_760.hit + 0x30);
                        iVar80 = *(int *)(local_760.hit + 0x34);
                        iVar81 = *(int *)(local_760.hit + 0x38);
                        iVar82 = *(int *)(local_760.hit + 0x3c);
                        bVar19 = (bool)((byte)(uVar27 >> 1) & 1);
                        bVar20 = (bool)((byte)(uVar27 >> 2) & 1);
                        bVar21 = (bool)((byte)(uVar27 >> 3) & 1);
                        bVar22 = (bool)((byte)(uVar27 >> 4) & 1);
                        bVar23 = (bool)((byte)(uVar27 >> 5) & 1);
                        bVar24 = (bool)((byte)(uVar27 >> 6) & 1);
                        bVar25 = SUB81(uVar27 >> 7,0);
                        *(uint *)(local_760.ray + 0x1a0) =
                             (uint)(bVar94 & 1) * *(int *)(local_760.hit + 0x20) |
                             (uint)!(bool)(bVar94 & 1) * *(int *)(local_760.ray + 0x1a0);
                        *(uint *)(local_760.ray + 0x1a4) =
                             (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_760.ray + 0x1a4);
                        *(uint *)(local_760.ray + 0x1a8) =
                             (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_760.ray + 0x1a8);
                        *(uint *)(local_760.ray + 0x1ac) =
                             (uint)bVar21 * iVar78 | (uint)!bVar21 * *(int *)(local_760.ray + 0x1ac)
                        ;
                        *(uint *)(local_760.ray + 0x1b0) =
                             (uint)bVar22 * iVar79 | (uint)!bVar22 * *(int *)(local_760.ray + 0x1b0)
                        ;
                        *(uint *)(local_760.ray + 0x1b4) =
                             (uint)bVar23 * iVar80 | (uint)!bVar23 * *(int *)(local_760.ray + 0x1b4)
                        ;
                        *(uint *)(local_760.ray + 0x1b8) =
                             (uint)bVar24 * iVar81 | (uint)!bVar24 * *(int *)(local_760.ray + 0x1b8)
                        ;
                        *(uint *)(local_760.ray + 0x1bc) =
                             (uint)bVar25 * iVar82 | (uint)!bVar25 * *(int *)(local_760.ray + 0x1bc)
                        ;
                        iVar1 = *(int *)(local_760.hit + 0x44);
                        iVar2 = *(int *)(local_760.hit + 0x48);
                        iVar78 = *(int *)(local_760.hit + 0x4c);
                        iVar79 = *(int *)(local_760.hit + 0x50);
                        iVar80 = *(int *)(local_760.hit + 0x54);
                        iVar81 = *(int *)(local_760.hit + 0x58);
                        iVar82 = *(int *)(local_760.hit + 0x5c);
                        bVar19 = (bool)((byte)(uVar27 >> 1) & 1);
                        bVar20 = (bool)((byte)(uVar27 >> 2) & 1);
                        bVar21 = (bool)((byte)(uVar27 >> 3) & 1);
                        bVar22 = (bool)((byte)(uVar27 >> 4) & 1);
                        bVar23 = (bool)((byte)(uVar27 >> 5) & 1);
                        bVar24 = (bool)((byte)(uVar27 >> 6) & 1);
                        bVar25 = SUB81(uVar27 >> 7,0);
                        *(uint *)(local_760.ray + 0x1c0) =
                             (uint)(bVar94 & 1) * *(int *)(local_760.hit + 0x40) |
                             (uint)!(bool)(bVar94 & 1) * *(int *)(local_760.ray + 0x1c0);
                        *(uint *)(local_760.ray + 0x1c4) =
                             (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_760.ray + 0x1c4);
                        *(uint *)(local_760.ray + 0x1c8) =
                             (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_760.ray + 0x1c8);
                        *(uint *)(local_760.ray + 0x1cc) =
                             (uint)bVar21 * iVar78 | (uint)!bVar21 * *(int *)(local_760.ray + 0x1cc)
                        ;
                        *(uint *)(local_760.ray + 0x1d0) =
                             (uint)bVar22 * iVar79 | (uint)!bVar22 * *(int *)(local_760.ray + 0x1d0)
                        ;
                        *(uint *)(local_760.ray + 0x1d4) =
                             (uint)bVar23 * iVar80 | (uint)!bVar23 * *(int *)(local_760.ray + 0x1d4)
                        ;
                        *(uint *)(local_760.ray + 0x1d8) =
                             (uint)bVar24 * iVar81 | (uint)!bVar24 * *(int *)(local_760.ray + 0x1d8)
                        ;
                        *(uint *)(local_760.ray + 0x1dc) =
                             (uint)bVar25 * iVar82 | (uint)!bVar25 * *(int *)(local_760.ray + 0x1dc)
                        ;
                        iVar1 = *(int *)(local_760.hit + 100);
                        iVar2 = *(int *)(local_760.hit + 0x68);
                        iVar78 = *(int *)(local_760.hit + 0x6c);
                        iVar79 = *(int *)(local_760.hit + 0x70);
                        iVar80 = *(int *)(local_760.hit + 0x74);
                        iVar81 = *(int *)(local_760.hit + 0x78);
                        iVar82 = *(int *)(local_760.hit + 0x7c);
                        bVar19 = (bool)((byte)(uVar27 >> 1) & 1);
                        bVar20 = (bool)((byte)(uVar27 >> 2) & 1);
                        bVar21 = (bool)((byte)(uVar27 >> 3) & 1);
                        bVar22 = (bool)((byte)(uVar27 >> 4) & 1);
                        bVar23 = (bool)((byte)(uVar27 >> 5) & 1);
                        bVar24 = (bool)((byte)(uVar27 >> 6) & 1);
                        bVar25 = SUB81(uVar27 >> 7,0);
                        *(uint *)(local_760.ray + 0x1e0) =
                             (uint)(bVar94 & 1) * *(int *)(local_760.hit + 0x60) |
                             (uint)!(bool)(bVar94 & 1) * *(int *)(local_760.ray + 0x1e0);
                        *(uint *)(local_760.ray + 0x1e4) =
                             (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_760.ray + 0x1e4);
                        *(uint *)(local_760.ray + 0x1e8) =
                             (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_760.ray + 0x1e8);
                        *(uint *)(local_760.ray + 0x1ec) =
                             (uint)bVar21 * iVar78 | (uint)!bVar21 * *(int *)(local_760.ray + 0x1ec)
                        ;
                        *(uint *)(local_760.ray + 0x1f0) =
                             (uint)bVar22 * iVar79 | (uint)!bVar22 * *(int *)(local_760.ray + 0x1f0)
                        ;
                        *(uint *)(local_760.ray + 500) =
                             (uint)bVar23 * iVar80 | (uint)!bVar23 * *(int *)(local_760.ray + 500);
                        *(uint *)(local_760.ray + 0x1f8) =
                             (uint)bVar24 * iVar81 | (uint)!bVar24 * *(int *)(local_760.ray + 0x1f8)
                        ;
                        *(uint *)(local_760.ray + 0x1fc) =
                             (uint)bVar25 * iVar82 | (uint)!bVar25 * *(int *)(local_760.ray + 0x1fc)
                        ;
                        auVar148._0_4_ =
                             (uint)(bVar94 & 1) * *(int *)(local_760.hit + 0x80) |
                             (uint)!(bool)(bVar94 & 1) * *(int *)(local_760.ray + 0x200);
                        bVar19 = (bool)((byte)(uVar27 >> 1) & 1);
                        auVar148._4_4_ =
                             (uint)bVar19 * *(int *)(local_760.hit + 0x84) |
                             (uint)!bVar19 * *(int *)(local_760.ray + 0x204);
                        bVar19 = (bool)((byte)(uVar27 >> 2) & 1);
                        auVar148._8_4_ =
                             (uint)bVar19 * *(int *)(local_760.hit + 0x88) |
                             (uint)!bVar19 * *(int *)(local_760.ray + 0x208);
                        bVar19 = (bool)((byte)(uVar27 >> 3) & 1);
                        auVar148._12_4_ =
                             (uint)bVar19 * *(int *)(local_760.hit + 0x8c) |
                             (uint)!bVar19 * *(int *)(local_760.ray + 0x20c);
                        bVar19 = (bool)((byte)(uVar27 >> 4) & 1);
                        auVar148._16_4_ =
                             (uint)bVar19 * *(int *)(local_760.hit + 0x90) |
                             (uint)!bVar19 * *(int *)(local_760.ray + 0x210);
                        bVar19 = (bool)((byte)(uVar27 >> 5) & 1);
                        auVar148._20_4_ =
                             (uint)bVar19 * *(int *)(local_760.hit + 0x94) |
                             (uint)!bVar19 * *(int *)(local_760.ray + 0x214);
                        bVar19 = (bool)((byte)(uVar27 >> 6) & 1);
                        auVar148._24_4_ =
                             (uint)bVar19 * *(int *)(local_760.hit + 0x98) |
                             (uint)!bVar19 * *(int *)(local_760.ray + 0x218);
                        bVar19 = SUB81(uVar27 >> 7,0);
                        auVar148._28_4_ =
                             (uint)bVar19 * *(int *)(local_760.hit + 0x9c) |
                             (uint)!bVar19 * *(int *)(local_760.ray + 0x21c);
                        *(undefined1 (*) [32])(local_760.ray + 0x200) = auVar148;
                        auVar114 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_760.hit + 0xa0));
                        *(undefined1 (*) [32])(local_760.ray + 0x220) = auVar114;
                        auVar114 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_760.hit + 0xc0));
                        *(undefined1 (*) [32])(local_760.ray + 0x240) = auVar114;
                        auVar114 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_760.hit + 0xe0));
                        *(undefined1 (*) [32])(local_760.ray + 0x260) = auVar114;
                        auVar114 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_760.hit + 0x100))
                        ;
                        *(undefined1 (*) [32])(local_760.ray + 0x280) = auVar114;
                      }
                      bVar94 = ~(byte)(1 << ((uint)uVar95 & 0x1f)) & bVar102;
                      uVar160 = *(undefined4 *)(ray + k * 4 + 0x100);
                      auVar39._4_4_ = uVar160;
                      auVar39._0_4_ = uVar160;
                      auVar39._8_4_ = uVar160;
                      auVar39._12_4_ = uVar160;
                      auVar39._16_4_ = uVar160;
                      auVar39._20_4_ = uVar160;
                      auVar39._24_4_ = uVar160;
                      auVar39._28_4_ = uVar160;
                      uVar161 = vcmpps_avx512vl(local_6c0,auVar39,2);
                      bVar102 = bVar94 & (byte)uVar161;
                      if ((bVar94 & (byte)uVar161) != 0) {
                        auVar172._8_4_ = 0x7f800000;
                        auVar172._0_8_ = 0x7f8000007f800000;
                        auVar172._12_4_ = 0x7f800000;
                        auVar172._16_4_ = 0x7f800000;
                        auVar172._20_4_ = 0x7f800000;
                        auVar172._24_4_ = 0x7f800000;
                        auVar172._28_4_ = 0x7f800000;
                        auVar114 = vblendmps_avx512vl(auVar172,local_6c0);
                        auVar149._0_4_ =
                             (uint)(bVar102 & 1) * auVar114._0_4_ |
                             (uint)!(bool)(bVar102 & 1) * 0x7f800000;
                        bVar19 = (bool)(bVar102 >> 1 & 1);
                        auVar149._4_4_ = (uint)bVar19 * auVar114._4_4_ | (uint)!bVar19 * 0x7f800000;
                        bVar19 = (bool)(bVar102 >> 2 & 1);
                        auVar149._8_4_ = (uint)bVar19 * auVar114._8_4_ | (uint)!bVar19 * 0x7f800000;
                        bVar19 = (bool)(bVar102 >> 3 & 1);
                        auVar149._12_4_ =
                             (uint)bVar19 * auVar114._12_4_ | (uint)!bVar19 * 0x7f800000;
                        bVar19 = (bool)(bVar102 >> 4 & 1);
                        auVar149._16_4_ =
                             (uint)bVar19 * auVar114._16_4_ | (uint)!bVar19 * 0x7f800000;
                        bVar19 = (bool)(bVar102 >> 5 & 1);
                        auVar149._20_4_ =
                             (uint)bVar19 * auVar114._20_4_ | (uint)!bVar19 * 0x7f800000;
                        bVar19 = (bool)(bVar102 >> 6 & 1);
                        auVar149._24_4_ =
                             (uint)bVar19 * auVar114._24_4_ | (uint)!bVar19 * 0x7f800000;
                        auVar149._28_4_ =
                             (uint)(bVar102 >> 7) * auVar114._28_4_ |
                             (uint)!(bool)(bVar102 >> 7) * 0x7f800000;
                        auVar114 = vshufps_avx(auVar149,auVar149,0xb1);
                        auVar114 = vminps_avx(auVar149,auVar114);
                        auVar113 = vshufpd_avx(auVar114,auVar114,5);
                        auVar114 = vminps_avx(auVar114,auVar113);
                        auVar113 = vpermpd_avx2(auVar114,0x4e);
                        auVar114 = vminps_avx(auVar114,auVar113);
                        uVar161 = vcmpps_avx512vl(auVar149,auVar114,0);
                        bVar93 = (byte)uVar161 & bVar102;
                        bVar94 = bVar102;
                        if (bVar93 != 0) {
                          bVar94 = bVar93;
                        }
                        uVar28 = 0;
                        for (uVar96 = (uint)bVar94; (uVar96 & 1) == 0;
                            uVar96 = uVar96 >> 1 | 0x80000000) {
                          uVar28 = uVar28 + 1;
                        }
                        uVar95 = (ulong)uVar28;
                      }
                    } while (bVar102 != 0);
                  }
                }
              }
            }
          }
          lVar98 = lVar98 + 8;
          auVar230 = auVar231;
        } while ((int)lVar98 < iVar14);
      }
      uVar160 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar34._4_4_ = uVar160;
      auVar34._0_4_ = uVar160;
      auVar34._8_4_ = uVar160;
      auVar34._12_4_ = uVar160;
      auVar34._16_4_ = uVar160;
      auVar34._20_4_ = uVar160;
      auVar34._24_4_ = uVar160;
      auVar34._28_4_ = uVar160;
      uVar161 = vcmpps_avx512vl(local_80,auVar34,2);
      uVar101 = (uint)uVar97 & (uint)uVar97 + 0xff & (uint)uVar161;
      uVar97 = (ulong)uVar101;
    } while (uVar101 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }